

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  uint uVar9;
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [28];
  undefined1 auVar102 [28];
  undefined1 auVar103 [28];
  undefined1 auVar104 [28];
  ulong uVar105;
  RTCIntersectArguments *pRVar106;
  RTCIntersectArguments *pRVar107;
  ulong uVar108;
  long lVar109;
  uint uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  long lVar114;
  long lVar115;
  undefined4 uVar116;
  undefined8 unaff_R14;
  float fVar117;
  float fVar118;
  float fVar132;
  float fVar135;
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar133;
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar149;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar134;
  float fVar137;
  float fVar140;
  float fVar143;
  float fVar146;
  float fVar148;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar150;
  float fVar165;
  vint4 bi_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar171;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar166;
  float fVar167;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar164 [64];
  vint4 ai;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  float fVar199;
  float fVar201;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar187;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar203;
  undefined1 auVar190 [16];
  float fVar200;
  float fVar202;
  float fVar204;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar205;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  float fVar209;
  float fVar221;
  float fVar222;
  vint4 bi;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar223;
  float fVar224;
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar225;
  float fVar236;
  float fVar237;
  vint4 ai_2;
  undefined1 auVar229 [16];
  undefined1 auVar226 [16];
  float fVar238;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar239;
  float fVar240;
  float fVar248;
  float fVar250;
  vint4 ai_1;
  undefined1 auVar241 [16];
  float fVar252;
  undefined1 auVar242 [16];
  float fVar249;
  float fVar251;
  float fVar253;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar254;
  undefined1 auVar247 [32];
  float fVar255;
  float fVar262;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar259 [32];
  float fVar266;
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  float fVar267;
  float fVar273;
  float fVar274;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  float fVar279;
  float fVar287;
  float fVar288;
  undefined1 auVar280 [16];
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar294;
  float fVar295;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar309;
  float fVar310;
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar311;
  float fVar316;
  float fVar317;
  undefined1 auVar312 [16];
  float fVar318;
  float fVar320;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar319;
  undefined1 auVar315 [64];
  float fVar321;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar322 [32];
  float fVar326;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar329 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined4 local_900;
  undefined4 uStack_8fc;
  ulong local_8a0;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 (*local_750) [16];
  undefined1 (*local_748) [16];
  undefined1 (*local_740) [32];
  Precalculations *local_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  long local_5d0;
  LinearSpace3fa *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  uint local_3e0;
  uint local_3dc;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_380 [32];
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [32];
  RTCHitN local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar155 [24];
  undefined1 auVar286 [64];
  undefined1 auVar308 [64];
  
  PVar10 = prim[1];
  uVar105 = (ulong)(byte)PVar10;
  auVar229 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar229 = vinsertps_avx(auVar229,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar178 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar178 = vinsertps_avx(auVar178,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar229 = vsubps_avx(auVar229,*(undefined1 (*) [16])(prim + uVar105 * 0x19 + 6));
  fVar225 = *(float *)(prim + uVar105 * 0x19 + 0x12);
  auVar151._0_4_ = fVar225 * auVar229._0_4_;
  auVar151._4_4_ = fVar225 * auVar229._4_4_;
  auVar151._8_4_ = fVar225 * auVar229._8_4_;
  auVar151._12_4_ = fVar225 * auVar229._12_4_;
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 6)));
  auVar256._0_4_ = fVar225 * auVar178._0_4_;
  auVar256._4_4_ = fVar225 * auVar178._4_4_;
  auVar256._8_4_ = fVar225 * auVar178._8_4_;
  auVar256._12_4_ = fVar225 * auVar178._12_4_;
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 5 + 6)));
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 6)));
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xb + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xc + 6)));
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar269 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xd + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x12 + 6)));
  auVar269 = vcvtdq2ps_avx(auVar269);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x13 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x14 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar119 = vshufps_avx(auVar256,auVar256,0);
  auVar152 = vshufps_avx(auVar256,auVar256,0x55);
  auVar172 = vshufps_avx(auVar256,auVar256,0xaa);
  fVar225 = auVar172._0_4_;
  fVar186 = auVar172._4_4_;
  fVar236 = auVar172._8_4_;
  fVar199 = auVar172._12_4_;
  fVar239 = auVar152._0_4_;
  fVar248 = auVar152._4_4_;
  fVar250 = auVar152._8_4_;
  fVar252 = auVar152._12_4_;
  fVar237 = auVar119._0_4_;
  fVar201 = auVar119._4_4_;
  fVar238 = auVar119._8_4_;
  fVar203 = auVar119._12_4_;
  auVar301._0_4_ = fVar237 * auVar229._0_4_ + fVar239 * auVar178._0_4_ + fVar225 * auVar191._0_4_;
  auVar301._4_4_ = fVar201 * auVar229._4_4_ + fVar248 * auVar178._4_4_ + fVar186 * auVar191._4_4_;
  auVar301._8_4_ = fVar238 * auVar229._8_4_ + fVar250 * auVar178._8_4_ + fVar236 * auVar191._8_4_;
  auVar301._12_4_ =
       fVar203 * auVar229._12_4_ + fVar252 * auVar178._12_4_ + fVar199 * auVar191._12_4_;
  auVar308 = ZEXT1664(auVar301);
  auVar312._0_4_ = fVar237 * auVar192._0_4_ + fVar239 * auVar15._0_4_ + auVar269._0_4_ * fVar225;
  auVar312._4_4_ = fVar201 * auVar192._4_4_ + fVar248 * auVar15._4_4_ + auVar269._4_4_ * fVar186;
  auVar312._8_4_ = fVar238 * auVar192._8_4_ + fVar250 * auVar15._8_4_ + auVar269._8_4_ * fVar236;
  auVar312._12_4_ = fVar203 * auVar192._12_4_ + fVar252 * auVar15._12_4_ + auVar269._12_4_ * fVar199
  ;
  auVar257._0_4_ = fVar237 * auVar120._0_4_ + fVar239 * auVar121._0_4_ + auVar153._0_4_ * fVar225;
  auVar257._4_4_ = fVar201 * auVar120._4_4_ + fVar248 * auVar121._4_4_ + auVar153._4_4_ * fVar186;
  auVar257._8_4_ = fVar238 * auVar120._8_4_ + fVar250 * auVar121._8_4_ + auVar153._8_4_ * fVar236;
  auVar257._12_4_ =
       fVar203 * auVar120._12_4_ + fVar252 * auVar121._12_4_ + auVar153._12_4_ * fVar199;
  auVar119 = vshufps_avx(auVar151,auVar151,0);
  auVar152 = vshufps_avx(auVar151,auVar151,0x55);
  auVar172 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar225 = auVar172._0_4_;
  fVar186 = auVar172._4_4_;
  fVar236 = auVar172._8_4_;
  fVar199 = auVar172._12_4_;
  fVar239 = auVar152._0_4_;
  fVar248 = auVar152._4_4_;
  fVar250 = auVar152._8_4_;
  fVar252 = auVar152._12_4_;
  fVar237 = auVar119._0_4_;
  fVar201 = auVar119._4_4_;
  fVar238 = auVar119._8_4_;
  fVar203 = auVar119._12_4_;
  auVar210._0_4_ = fVar237 * auVar229._0_4_ + fVar239 * auVar178._0_4_ + fVar225 * auVar191._0_4_;
  auVar210._4_4_ = fVar201 * auVar229._4_4_ + fVar248 * auVar178._4_4_ + fVar186 * auVar191._4_4_;
  auVar210._8_4_ = fVar238 * auVar229._8_4_ + fVar250 * auVar178._8_4_ + fVar236 * auVar191._8_4_;
  auVar210._12_4_ =
       fVar203 * auVar229._12_4_ + fVar252 * auVar178._12_4_ + fVar199 * auVar191._12_4_;
  auVar152._0_4_ = fVar237 * auVar192._0_4_ + auVar269._0_4_ * fVar225 + fVar239 * auVar15._0_4_;
  auVar152._4_4_ = fVar201 * auVar192._4_4_ + auVar269._4_4_ * fVar186 + fVar248 * auVar15._4_4_;
  auVar152._8_4_ = fVar238 * auVar192._8_4_ + auVar269._8_4_ * fVar236 + fVar250 * auVar15._8_4_;
  auVar152._12_4_ = fVar203 * auVar192._12_4_ + auVar269._12_4_ * fVar199 + fVar252 * auVar15._12_4_
  ;
  auVar119._0_4_ = fVar239 * auVar121._0_4_ + auVar153._0_4_ * fVar225 + fVar237 * auVar120._0_4_;
  auVar119._4_4_ = fVar248 * auVar121._4_4_ + auVar153._4_4_ * fVar186 + fVar201 * auVar120._4_4_;
  auVar119._8_4_ = fVar250 * auVar121._8_4_ + auVar153._8_4_ * fVar236 + fVar238 * auVar120._8_4_;
  auVar119._12_4_ =
       fVar252 * auVar121._12_4_ + auVar153._12_4_ * fVar199 + fVar203 * auVar120._12_4_;
  auVar241._8_4_ = 0x7fffffff;
  auVar241._0_8_ = 0x7fffffff7fffffff;
  auVar241._12_4_ = 0x7fffffff;
  auVar229 = vandps_avx(auVar301,auVar241);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar229 = vcmpps_avx(auVar229,auVar188,1);
  auVar178 = vblendvps_avx(auVar301,auVar188,auVar229);
  auVar229 = vandps_avx(auVar312,auVar241);
  auVar229 = vcmpps_avx(auVar229,auVar188,1);
  auVar191 = vblendvps_avx(auVar312,auVar188,auVar229);
  auVar229 = vandps_avx(auVar257,auVar241);
  auVar229 = vcmpps_avx(auVar229,auVar188,1);
  auVar229 = vblendvps_avx(auVar257,auVar188,auVar229);
  auVar192 = vrcpps_avx(auVar178);
  fVar239 = auVar192._0_4_;
  auVar172._0_4_ = fVar239 * auVar178._0_4_;
  fVar248 = auVar192._4_4_;
  auVar172._4_4_ = fVar248 * auVar178._4_4_;
  fVar250 = auVar192._8_4_;
  auVar172._8_4_ = fVar250 * auVar178._8_4_;
  fVar252 = auVar192._12_4_;
  auVar172._12_4_ = fVar252 * auVar178._12_4_;
  auVar258._8_4_ = 0x3f800000;
  auVar258._0_8_ = 0x3f8000003f800000;
  auVar258._12_4_ = 0x3f800000;
  auVar178 = vsubps_avx(auVar258,auVar172);
  fVar239 = fVar239 + fVar239 * auVar178._0_4_;
  fVar248 = fVar248 + fVar248 * auVar178._4_4_;
  fVar250 = fVar250 + fVar250 * auVar178._8_4_;
  fVar252 = fVar252 + fVar252 * auVar178._12_4_;
  auVar178 = vrcpps_avx(auVar191);
  fVar225 = auVar178._0_4_;
  auVar226._0_4_ = fVar225 * auVar191._0_4_;
  fVar236 = auVar178._4_4_;
  auVar226._4_4_ = fVar236 * auVar191._4_4_;
  fVar237 = auVar178._8_4_;
  auVar226._8_4_ = fVar237 * auVar191._8_4_;
  fVar238 = auVar178._12_4_;
  auVar226._12_4_ = fVar238 * auVar191._12_4_;
  auVar178 = vsubps_avx(auVar258,auVar226);
  fVar225 = fVar225 + fVar225 * auVar178._0_4_;
  fVar236 = fVar236 + fVar236 * auVar178._4_4_;
  fVar237 = fVar237 + fVar237 * auVar178._8_4_;
  fVar238 = fVar238 + fVar238 * auVar178._12_4_;
  auVar178 = vrcpps_avx(auVar229);
  fVar186 = auVar178._0_4_;
  auVar189._0_4_ = fVar186 * auVar229._0_4_;
  fVar199 = auVar178._4_4_;
  auVar189._4_4_ = fVar199 * auVar229._4_4_;
  fVar201 = auVar178._8_4_;
  auVar189._8_4_ = fVar201 * auVar229._8_4_;
  fVar203 = auVar178._12_4_;
  auVar189._12_4_ = fVar203 * auVar229._12_4_;
  auVar229 = vsubps_avx(auVar258,auVar189);
  fVar186 = fVar186 + fVar186 * auVar229._0_4_;
  fVar199 = fVar199 + fVar199 * auVar229._4_4_;
  fVar201 = fVar201 + fVar201 * auVar229._8_4_;
  fVar203 = fVar203 + fVar203 * auVar229._12_4_;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar105 * 7 + 6);
  auVar229 = vpmovsxwd_avx(auVar229);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar191 = vsubps_avx(auVar229,auVar210);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar105 * 9 + 6);
  auVar229 = vpmovsxwd_avx(auVar178);
  auVar173._0_4_ = fVar239 * auVar191._0_4_;
  auVar173._4_4_ = fVar248 * auVar191._4_4_;
  auVar173._8_4_ = fVar250 * auVar191._8_4_;
  auVar173._12_4_ = fVar252 * auVar191._12_4_;
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar229 = vsubps_avx(auVar229,auVar210);
  auVar211._0_4_ = fVar239 * auVar229._0_4_;
  auVar211._4_4_ = fVar248 * auVar229._4_4_;
  auVar211._8_4_ = fVar250 * auVar229._8_4_;
  auVar211._12_4_ = fVar252 * auVar229._12_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar105 * 0xe + 6);
  auVar229 = vpmovsxwd_avx(auVar191);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar178 = vsubps_avx(auVar229,auVar152);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar229 = vpmovsxwd_avx(auVar192);
  auVar242._0_4_ = auVar178._0_4_ * fVar225;
  auVar242._4_4_ = auVar178._4_4_ * fVar236;
  auVar242._8_4_ = auVar178._8_4_ * fVar237;
  auVar242._12_4_ = auVar178._12_4_ * fVar238;
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar229 = vsubps_avx(auVar229,auVar152);
  auVar153._0_4_ = fVar225 * auVar229._0_4_;
  auVar153._4_4_ = fVar236 * auVar229._4_4_;
  auVar153._8_4_ = fVar237 * auVar229._8_4_;
  auVar153._12_4_ = fVar238 * auVar229._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar105 * 0x15 + 6);
  auVar229 = vpmovsxwd_avx(auVar15);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar229 = vsubps_avx(auVar229,auVar119);
  auVar227._0_4_ = auVar229._0_4_ * fVar186;
  auVar227._4_4_ = auVar229._4_4_ * fVar199;
  auVar227._8_4_ = auVar229._8_4_ * fVar201;
  auVar227._12_4_ = auVar229._12_4_ * fVar203;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar105 * 0x17 + 6);
  auVar229 = vpmovsxwd_avx(auVar269);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar229 = vsubps_avx(auVar229,auVar119);
  auVar120._0_4_ = auVar229._0_4_ * fVar186;
  auVar120._4_4_ = auVar229._4_4_ * fVar199;
  auVar120._8_4_ = auVar229._8_4_ * fVar201;
  auVar120._12_4_ = auVar229._12_4_ * fVar203;
  auVar229 = vpminsd_avx(auVar173,auVar211);
  auVar178 = vpminsd_avx(auVar242,auVar153);
  auVar229 = vmaxps_avx(auVar229,auVar178);
  auVar178 = vpminsd_avx(auVar227,auVar120);
  uVar116 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar280._4_4_ = uVar116;
  auVar280._0_4_ = uVar116;
  auVar280._8_4_ = uVar116;
  auVar280._12_4_ = uVar116;
  auVar286 = ZEXT1664(auVar280);
  auVar178 = vmaxps_avx(auVar178,auVar280);
  auVar229 = vmaxps_avx(auVar229,auVar178);
  local_450._0_4_ = auVar229._0_4_ * 0.99999964;
  local_450._4_4_ = auVar229._4_4_ * 0.99999964;
  local_450._8_4_ = auVar229._8_4_ * 0.99999964;
  local_450._12_4_ = auVar229._12_4_ * 0.99999964;
  auVar229 = vpmaxsd_avx(auVar173,auVar211);
  auVar178 = vpmaxsd_avx(auVar242,auVar153);
  auVar229 = vminps_avx(auVar229,auVar178);
  auVar178 = vpmaxsd_avx(auVar227,auVar120);
  uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar174._4_4_ = uVar116;
  auVar174._0_4_ = uVar116;
  auVar174._8_4_ = uVar116;
  auVar174._12_4_ = uVar116;
  auVar178 = vminps_avx(auVar178,auVar174);
  auVar229 = vminps_avx(auVar229,auVar178);
  auVar121._0_4_ = auVar229._0_4_ * 1.0000004;
  auVar121._4_4_ = auVar229._4_4_ * 1.0000004;
  auVar121._8_4_ = auVar229._8_4_ * 1.0000004;
  auVar121._12_4_ = auVar229._12_4_ * 1.0000004;
  auVar229 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar178 = vpcmpgtd_avx(auVar229,_DAT_01f4ad30);
  auVar229 = vcmpps_avx(local_450,auVar121,2);
  auVar229 = vandps_avx(auVar229,auVar178);
  uVar116 = vmovmskps_avx(auVar229);
  local_5c8 = pre->ray_space + k;
  local_5c0 = mm_lookupmask_ps._16_8_;
  uStack_5b8 = mm_lookupmask_ps._24_8_;
  uStack_5b0 = mm_lookupmask_ps._16_8_;
  uStack_5a8 = mm_lookupmask_ps._24_8_;
  uVar110 = 1 << ((byte)k & 0x1f);
  local_740 = (undefined1 (*) [32])&local_180;
  local_748 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar110 & 0xf) << 4));
  local_750 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar110 >> 4) * 0x10);
  uVar113 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar116);
  local_738 = pre;
  while (uVar113 != 0) {
    auVar218 = auVar286._0_32_;
    auVar162 = auVar308._0_32_;
    lVar114 = 0;
    if (uVar113 != 0) {
      for (; (uVar113 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
      }
    }
    uVar112 = uVar113 - 1 & uVar113;
    lVar109 = lVar114 * 0x40;
    lVar115 = 0;
    if (uVar112 != 0) {
      for (; (uVar112 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
      }
    }
    uVar110 = *(uint *)(prim + 2);
    pGVar12 = (context->scene->geometries).items[uVar110].ptr;
    auVar229 = *(undefined1 (*) [16])(prim + lVar109 + uVar105 * 0x19 + 0x16);
    if (((uVar112 != 0) && (uVar111 = uVar112 - 1 & uVar112, uVar111 != 0)) &&
       (lVar115 = 0, uVar111 != 0)) {
      for (; (uVar111 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
      }
    }
    _local_760 = *(undefined1 (*) [16])(prim + lVar109 + uVar105 * 0x19 + 0x26);
    _local_690 = *(undefined1 (*) [16])(prim + lVar109 + uVar105 * 0x19 + 0x36);
    _local_6a0 = *(undefined1 (*) [16])(prim + lVar109 + uVar105 * 0x19 + 0x46);
    auVar178 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    uVar11 = (uint)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar15 = vinsertps_avx(auVar178,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar192 = vsubps_avx(auVar229,auVar15);
    auVar178 = vshufps_avx(auVar192,auVar192,0);
    auVar191 = vshufps_avx(auVar192,auVar192,0x55);
    auVar192 = vshufps_avx(auVar192,auVar192,0xaa);
    fVar225 = (local_5c8->vx).field_0.m128[0];
    fVar186 = (local_5c8->vx).field_0.m128[1];
    fVar236 = (local_5c8->vx).field_0.m128[2];
    fVar199 = (local_5c8->vx).field_0.m128[3];
    fVar237 = (local_5c8->vy).field_0.m128[0];
    fVar201 = (local_5c8->vy).field_0.m128[1];
    fVar238 = (local_5c8->vy).field_0.m128[2];
    fVar203 = (local_5c8->vy).field_0.m128[3];
    fVar239 = (local_5c8->vz).field_0.m128[0];
    fVar248 = (local_5c8->vz).field_0.m128[1];
    fVar250 = (local_5c8->vz).field_0.m128[2];
    fVar252 = (local_5c8->vz).field_0.m128[3];
    auVar212._0_8_ =
         CONCAT44(auVar178._4_4_ * fVar186 + auVar191._4_4_ * fVar201 + fVar248 * auVar192._4_4_,
                  auVar178._0_4_ * fVar225 + auVar191._0_4_ * fVar237 + fVar239 * auVar192._0_4_);
    auVar212._8_4_ = auVar178._8_4_ * fVar236 + auVar191._8_4_ * fVar238 + fVar250 * auVar192._8_4_;
    auVar212._12_4_ =
         auVar178._12_4_ * fVar199 + auVar191._12_4_ * fVar203 + fVar252 * auVar192._12_4_;
    auVar178 = vblendps_avx(auVar212,auVar229,8);
    auVar269 = vsubps_avx(_local_760,auVar15);
    auVar191 = vshufps_avx(auVar269,auVar269,0);
    auVar192 = vshufps_avx(auVar269,auVar269,0x55);
    auVar269 = vshufps_avx(auVar269,auVar269,0xaa);
    auVar228._0_4_ = auVar191._0_4_ * fVar225 + auVar192._0_4_ * fVar237 + fVar239 * auVar269._0_4_;
    auVar228._4_4_ = auVar191._4_4_ * fVar186 + auVar192._4_4_ * fVar201 + fVar248 * auVar269._4_4_;
    auVar228._8_4_ = auVar191._8_4_ * fVar236 + auVar192._8_4_ * fVar238 + fVar250 * auVar269._8_4_;
    auVar228._12_4_ =
         auVar191._12_4_ * fVar199 + auVar192._12_4_ * fVar203 + fVar252 * auVar269._12_4_;
    auVar191 = vblendps_avx(auVar228,_local_760,8);
    auVar120 = vsubps_avx(_local_690,auVar15);
    auVar192 = vshufps_avx(auVar120,auVar120,0);
    auVar269 = vshufps_avx(auVar120,auVar120,0x55);
    auVar120 = vshufps_avx(auVar120,auVar120,0xaa);
    auVar213._0_4_ = auVar192._0_4_ * fVar225 + auVar269._0_4_ * fVar237 + auVar120._0_4_ * fVar239;
    auVar213._4_4_ = auVar192._4_4_ * fVar186 + auVar269._4_4_ * fVar201 + auVar120._4_4_ * fVar248;
    auVar213._8_4_ = auVar192._8_4_ * fVar236 + auVar269._8_4_ * fVar238 + auVar120._8_4_ * fVar250;
    auVar213._12_4_ =
         auVar192._12_4_ * fVar199 + auVar269._12_4_ * fVar203 + auVar120._12_4_ * fVar252;
    auVar192 = vblendps_avx(auVar213,_local_690,8);
    auVar120 = vsubps_avx(_local_6a0,auVar15);
    auVar15 = vshufps_avx(auVar120,auVar120,0);
    auVar269 = vshufps_avx(auVar120,auVar120,0x55);
    auVar120 = vshufps_avx(auVar120,auVar120,0xaa);
    auVar268._0_4_ = auVar15._0_4_ * fVar225 + auVar269._0_4_ * fVar237 + fVar239 * auVar120._0_4_;
    auVar268._4_4_ = auVar15._4_4_ * fVar186 + auVar269._4_4_ * fVar201 + fVar248 * auVar120._4_4_;
    auVar268._8_4_ = auVar15._8_4_ * fVar236 + auVar269._8_4_ * fVar238 + fVar250 * auVar120._8_4_;
    auVar268._12_4_ =
         auVar15._12_4_ * fVar199 + auVar269._12_4_ * fVar203 + fVar252 * auVar120._12_4_;
    auVar15 = vblendps_avx(auVar268,_local_6a0,8);
    auVar190._8_4_ = 0x7fffffff;
    auVar190._0_8_ = 0x7fffffff7fffffff;
    auVar190._12_4_ = 0x7fffffff;
    auVar178 = vandps_avx(auVar178,auVar190);
    auVar191 = vandps_avx(auVar191,auVar190);
    auVar269 = vmaxps_avx(auVar178,auVar191);
    auVar178 = vandps_avx(auVar192,auVar190);
    auVar191 = vandps_avx(auVar15,auVar190);
    auVar178 = vmaxps_avx(auVar178,auVar191);
    auVar178 = vmaxps_avx(auVar269,auVar178);
    auVar191 = vmovshdup_avx(auVar178);
    auVar191 = vmaxss_avx(auVar191,auVar178);
    auVar178 = vshufpd_avx(auVar178,auVar178,1);
    auVar178 = vmaxss_avx(auVar178,auVar191);
    local_5d0 = (long)(int)uVar11;
    lVar115 = local_5d0 * 0x44;
    fVar225 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar115 + 0x908);
    fVar186 = *(float *)(bspline_basis0 + lVar115 + 0x90c);
    fVar236 = *(float *)(bspline_basis0 + lVar115 + 0x910);
    fVar199 = *(float *)(bspline_basis0 + lVar115 + 0x914);
    fVar237 = *(float *)(bspline_basis0 + lVar115 + 0x918);
    fVar201 = *(float *)(bspline_basis0 + lVar115 + 0x91c);
    fVar238 = *(float *)(bspline_basis0 + lVar115 + 0x920);
    auVar101 = *(undefined1 (*) [28])(bspline_basis0 + lVar115 + 0x908);
    auVar191 = vshufps_avx(auVar213,auVar213,0);
    register0x00001250 = auVar191;
    _local_520 = auVar191;
    auVar192 = vshufps_avx(auVar213,auVar213,0x55);
    auVar215._16_16_ = auVar192;
    auVar215._0_16_ = auVar192;
    fVar267 = *(float *)(bspline_basis0 + lVar115 + 0xd8c);
    fVar205 = *(float *)(bspline_basis0 + lVar115 + 0xd90);
    fVar263 = *(float *)(bspline_basis0 + lVar115 + 0xd94);
    fVar273 = *(float *)(bspline_basis0 + lVar115 + 0xd98);
    fVar274 = *(float *)(bspline_basis0 + lVar115 + 0xd9c);
    fVar206 = *(float *)(bspline_basis0 + lVar115 + 0xda0);
    fVar264 = *(float *)(bspline_basis0 + lVar115 + 0xda4);
    auVar15 = vshufps_avx(auVar268,auVar268,0);
    register0x00001550 = auVar15;
    _local_540 = auVar15;
    auVar269 = vshufps_avx(auVar268,auVar268,0x55);
    register0x00001390 = auVar269;
    _local_6e0 = auVar269;
    fVar311 = auVar15._0_4_;
    fVar316 = auVar15._4_4_;
    fVar317 = auVar15._8_4_;
    fVar319 = auVar15._12_4_;
    fVar150 = auVar191._0_4_;
    fVar266 = auVar191._4_4_;
    fVar165 = auVar191._8_4_;
    fVar166 = auVar191._12_4_;
    fVar240 = auVar269._0_4_;
    fVar249 = auVar269._4_4_;
    fVar251 = auVar269._8_4_;
    fVar253 = auVar269._12_4_;
    fVar209 = auVar192._0_4_;
    fVar221 = auVar192._4_4_;
    fVar222 = auVar192._8_4_;
    fVar223 = auVar192._12_4_;
    auVar191 = vshufps_avx(_local_690,_local_690,0xff);
    register0x00001510 = auVar191;
    _local_80 = auVar191;
    auVar192 = vshufps_avx(_local_6a0,_local_6a0,0xff);
    register0x000013d0 = auVar192;
    _local_2a0 = auVar192;
    fVar255 = auVar192._0_4_;
    fVar262 = auVar192._4_4_;
    fVar170 = auVar192._8_4_;
    fVar254 = auVar192._12_4_;
    fVar298 = auVar191._0_4_;
    fVar309 = auVar191._4_4_;
    fVar310 = auVar191._8_4_;
    auVar192 = vshufps_avx(auVar228,auVar228,0);
    local_280._16_16_ = auVar192;
    local_280._0_16_ = auVar192;
    pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar115 + 0x484);
    fVar203 = *(float *)*pauVar2;
    fVar239 = *(float *)(bspline_basis0 + lVar115 + 0x488);
    fVar248 = *(float *)(bspline_basis0 + lVar115 + 0x48c);
    fVar250 = *(float *)(bspline_basis0 + lVar115 + 0x490);
    fVar252 = *(float *)(bspline_basis0 + lVar115 + 0x494);
    fVar300 = *(float *)(bspline_basis0 + lVar115 + 0x498);
    fVar299 = *(float *)(bspline_basis0 + lVar115 + 0x49c);
    auVar102 = *(undefined1 (*) [28])*pauVar2;
    _auStack_670 = SUB3216(*pauVar2,0x10);
    fVar326 = auVar192._0_4_;
    fVar330 = auVar192._4_4_;
    fVar331 = auVar192._8_4_;
    fVar332 = auVar192._12_4_;
    auVar192 = vshufps_avx(auVar228,auVar228,0x55);
    register0x00001490 = auVar192;
    _local_7a0 = auVar192;
    fVar289 = auVar192._0_4_;
    fVar290 = auVar192._4_4_;
    fVar294 = auVar192._8_4_;
    fVar295 = auVar192._12_4_;
    auVar15 = vpermilps_avx(_local_760,0xff);
    register0x00001590 = auVar15;
    _local_a0 = auVar15;
    fVar318 = auVar15._0_4_;
    fVar320 = auVar15._4_4_;
    fVar321 = auVar15._8_4_;
    fVar323 = auVar15._12_4_;
    auVar96._8_4_ = auVar212._8_4_;
    auVar96._0_8_ = auVar212._0_8_;
    auVar96._12_4_ = auVar212._12_4_;
    auVar15 = vshufps_avx(auVar96,auVar96,0);
    register0x00001310 = auVar15;
    _local_4a0 = auVar15;
    fVar275 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar115);
    fVar276 = *(float *)(bspline_basis0 + lVar115 + 4);
    fVar207 = *(float *)(bspline_basis0 + lVar115 + 8);
    fVar265 = *(float *)(bspline_basis0 + lVar115 + 0xc);
    fVar277 = *(float *)(bspline_basis0 + lVar115 + 0x10);
    fVar278 = *(float *)(bspline_basis0 + lVar115 + 0x14);
    fVar208 = *(float *)(bspline_basis0 + lVar115 + 0x18);
    auVar103 = *(undefined1 (*) [28])(bspline_basis0 + lVar115);
    fVar167 = auVar15._0_4_;
    fVar168 = auVar15._4_4_;
    fVar169 = auVar15._8_4_;
    fVar224 = auVar15._12_4_;
    auVar296._0_4_ = fVar167 * fVar275 + fVar326 * fVar203 + fVar150 * fVar225 + fVar311 * fVar267;
    auVar296._4_4_ = fVar168 * fVar276 + fVar330 * fVar239 + fVar266 * fVar186 + fVar316 * fVar205;
    auVar296._8_4_ = fVar169 * fVar207 + fVar331 * fVar248 + fVar165 * fVar236 + fVar317 * fVar263;
    auVar296._12_4_ = fVar224 * fVar265 + fVar332 * fVar250 + fVar166 * fVar199 + fVar319 * fVar273;
    auVar296._16_4_ = fVar167 * fVar277 + fVar326 * fVar252 + fVar150 * fVar237 + fVar311 * fVar274;
    auVar296._20_4_ = fVar168 * fVar278 + fVar330 * fVar300 + fVar266 * fVar201 + fVar316 * fVar206;
    auVar296._24_4_ = fVar169 * fVar208 + fVar331 * fVar299 + fVar165 * fVar238 + fVar317 * fVar264;
    auVar296._28_4_ = fVar253 + fVar166 + 0.0 + 0.0;
    auVar15 = vshufps_avx(auVar96,auVar96,0x55);
    fVar187 = auVar15._0_4_;
    fVar200 = auVar15._4_4_;
    fVar202 = auVar15._8_4_;
    fVar204 = auVar15._12_4_;
    auVar270._0_4_ = fVar187 * fVar275 + fVar289 * fVar203 + fVar209 * fVar225 + fVar240 * fVar267;
    auVar270._4_4_ = fVar200 * fVar276 + fVar290 * fVar239 + fVar221 * fVar186 + fVar249 * fVar205;
    auVar270._8_4_ = fVar202 * fVar207 + fVar294 * fVar248 + fVar222 * fVar236 + fVar251 * fVar263;
    auVar270._12_4_ = fVar204 * fVar265 + fVar295 * fVar250 + fVar223 * fVar199 + fVar253 * fVar273;
    auVar270._16_4_ = fVar187 * fVar277 + fVar289 * fVar252 + fVar209 * fVar237 + fVar240 * fVar274;
    auVar270._20_4_ = fVar200 * fVar278 + fVar290 * fVar300 + fVar221 * fVar201 + fVar249 * fVar206;
    auVar270._24_4_ = fVar202 * fVar208 + fVar294 * fVar299 + fVar222 * fVar238 + fVar251 * fVar264;
    auVar270._28_4_ = fVar204 + fVar166 + 0.0 + 0.0;
    auVar15 = vpermilps_avx(auVar229,0xff);
    register0x00001450 = auVar15;
    _local_c0 = auVar15;
    fVar279 = auVar15._0_4_;
    fVar287 = auVar15._4_4_;
    fVar288 = auVar15._8_4_;
    fVar117 = fVar279 * fVar275 + fVar318 * fVar203 + fVar298 * fVar225 + fVar255 * fVar267;
    fVar132 = fVar287 * fVar276 + fVar320 * fVar239 + fVar309 * fVar186 + fVar262 * fVar205;
    fVar135 = fVar288 * fVar207 + fVar321 * fVar248 + fVar310 * fVar236 + fVar170 * fVar263;
    fVar138 = auVar15._12_4_ * fVar265 +
              fVar323 * fVar250 + auVar191._12_4_ * fVar199 + fVar254 * fVar273;
    fVar141 = fVar279 * fVar277 + fVar318 * fVar252 + fVar298 * fVar237 + fVar255 * fVar274;
    fVar144 = fVar287 * fVar278 + fVar320 * fVar300 + fVar309 * fVar201 + fVar262 * fVar206;
    fVar147 = fVar288 * fVar208 + fVar321 * fVar299 + fVar310 * fVar238 + fVar170 * fVar264;
    fVar149 = *(float *)(bspline_basis0 + lVar115 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar275 = *(float *)(bspline_basis1 + lVar115 + 0x908);
    fVar276 = *(float *)(bspline_basis1 + lVar115 + 0x90c);
    fVar207 = *(float *)(bspline_basis1 + lVar115 + 0x910);
    fVar265 = *(float *)(bspline_basis1 + lVar115 + 0x914);
    fVar277 = *(float *)(bspline_basis1 + lVar115 + 0x918);
    fVar278 = *(float *)(bspline_basis1 + lVar115 + 0x91c);
    fVar208 = *(float *)(bspline_basis1 + lVar115 + 0x920);
    fVar225 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar115 + 0xd8c);
    fVar186 = *(float *)(bspline_basis1 + lVar115 + 0xd90);
    fVar236 = *(float *)(bspline_basis1 + lVar115 + 0xd94);
    fVar199 = *(float *)(bspline_basis1 + lVar115 + 0xd98);
    fVar237 = *(float *)(bspline_basis1 + lVar115 + 0xd9c);
    fVar201 = *(float *)(bspline_basis1 + lVar115 + 0xda0);
    fVar238 = *(float *)(bspline_basis1 + lVar115 + 0xda4);
    auVar104 = *(undefined1 (*) [28])(bspline_basis1 + lVar115 + 0xd8c);
    fVar171 = *(float *)(bspline_basis1 + lVar115 + 0x484);
    fVar291 = *(float *)(bspline_basis1 + lVar115 + 0x488);
    fVar133 = *(float *)(bspline_basis1 + lVar115 + 0x48c);
    fVar136 = *(float *)(bspline_basis1 + lVar115 + 0x490);
    fVar139 = *(float *)(bspline_basis1 + lVar115 + 0x494);
    fVar142 = *(float *)(bspline_basis1 + lVar115 + 0x498);
    fVar145 = *(float *)(bspline_basis1 + lVar115 + 0x49c);
    fVar203 = fVar319 + fVar204 + fVar253;
    fVar118 = *(float *)(bspline_basis1 + lVar115);
    fVar134 = *(float *)(bspline_basis1 + lVar115 + 4);
    fVar137 = *(float *)(bspline_basis1 + lVar115 + 8);
    fVar140 = *(float *)(bspline_basis1 + lVar115 + 0xc);
    fVar143 = *(float *)(bspline_basis1 + lVar115 + 0x10);
    fVar146 = *(float *)(bspline_basis1 + lVar115 + 0x14);
    fVar148 = *(float *)(bspline_basis1 + lVar115 + 0x18);
    auVar302._0_4_ = fVar167 * fVar118 + fVar326 * fVar171 + fVar275 * fVar150 + fVar311 * fVar225;
    auVar302._4_4_ = fVar168 * fVar134 + fVar330 * fVar291 + fVar276 * fVar266 + fVar316 * fVar186;
    auVar302._8_4_ = fVar169 * fVar137 + fVar331 * fVar133 + fVar207 * fVar165 + fVar317 * fVar236;
    auVar302._12_4_ = fVar224 * fVar140 + fVar332 * fVar136 + fVar265 * fVar166 + fVar319 * fVar199;
    auVar302._16_4_ = fVar167 * fVar143 + fVar326 * fVar139 + fVar277 * fVar150 + fVar311 * fVar237;
    auVar302._20_4_ = fVar168 * fVar146 + fVar330 * fVar142 + fVar278 * fVar266 + fVar316 * fVar201;
    auVar302._24_4_ = fVar169 * fVar148 + fVar331 * fVar145 + fVar208 * fVar165 + fVar317 * fVar238;
    auVar302._28_4_ = fVar323 + fVar203;
    auVar193._0_4_ = fVar187 * fVar118 + fVar289 * fVar171 + fVar275 * fVar209 + fVar225 * fVar240;
    auVar193._4_4_ = fVar200 * fVar134 + fVar290 * fVar291 + fVar276 * fVar221 + fVar186 * fVar249;
    auVar193._8_4_ = fVar202 * fVar137 + fVar294 * fVar133 + fVar207 * fVar222 + fVar236 * fVar251;
    auVar193._12_4_ = fVar204 * fVar140 + fVar295 * fVar136 + fVar265 * fVar223 + fVar199 * fVar253;
    auVar193._16_4_ = fVar187 * fVar143 + fVar289 * fVar139 + fVar277 * fVar209 + fVar237 * fVar240;
    auVar193._20_4_ = fVar200 * fVar146 + fVar290 * fVar142 + fVar278 * fVar221 + fVar201 * fVar249;
    auVar193._24_4_ = fVar202 * fVar148 + fVar294 * fVar145 + fVar208 * fVar222 + fVar238 * fVar251;
    auVar193._28_4_ = fVar203 + fVar319 + fVar253 + fVar204;
    auVar230._0_4_ = fVar318 * fVar171 + fVar298 * fVar275 + fVar255 * fVar225 + fVar279 * fVar118;
    auVar230._4_4_ = fVar320 * fVar291 + fVar309 * fVar276 + fVar262 * fVar186 + fVar287 * fVar134;
    auVar230._8_4_ = fVar321 * fVar133 + fVar310 * fVar207 + fVar170 * fVar236 + fVar288 * fVar137;
    auVar230._12_4_ =
         fVar323 * fVar136 + auVar191._12_4_ * fVar265 + fVar254 * fVar199 +
         auVar15._12_4_ * fVar140;
    auVar230._16_4_ = fVar318 * fVar139 + fVar298 * fVar277 + fVar255 * fVar237 + fVar279 * fVar143;
    auVar230._20_4_ = fVar320 * fVar142 + fVar309 * fVar278 + fVar262 * fVar201 + fVar287 * fVar146;
    auVar230._24_4_ = fVar321 * fVar145 + fVar310 * fVar208 + fVar170 * fVar238 + fVar288 * fVar148;
    auVar230._28_4_ = fVar319 + fVar254 + fVar253 + fVar203;
    auVar16 = vsubps_avx(auVar302,auVar296);
    auVar17 = vsubps_avx(auVar193,auVar270);
    fVar225 = auVar16._0_4_;
    fVar236 = auVar16._4_4_;
    auVar283._4_4_ = auVar270._4_4_ * fVar236;
    auVar283._0_4_ = auVar270._0_4_ * fVar225;
    fVar237 = auVar16._8_4_;
    auVar283._8_4_ = auVar270._8_4_ * fVar237;
    fVar238 = auVar16._12_4_;
    auVar283._12_4_ = auVar270._12_4_ * fVar238;
    fVar239 = auVar16._16_4_;
    auVar283._16_4_ = auVar270._16_4_ * fVar239;
    fVar250 = auVar16._20_4_;
    auVar283._20_4_ = auVar270._20_4_ * fVar250;
    fVar300 = auVar16._24_4_;
    auVar283._24_4_ = auVar270._24_4_ * fVar300;
    auVar283._28_4_ = fVar203;
    fVar186 = auVar17._0_4_;
    fVar199 = auVar17._4_4_;
    auVar18._4_4_ = auVar296._4_4_ * fVar199;
    auVar18._0_4_ = auVar296._0_4_ * fVar186;
    fVar201 = auVar17._8_4_;
    auVar18._8_4_ = auVar296._8_4_ * fVar201;
    fVar203 = auVar17._12_4_;
    auVar18._12_4_ = auVar296._12_4_ * fVar203;
    fVar248 = auVar17._16_4_;
    auVar18._16_4_ = auVar296._16_4_ * fVar248;
    fVar252 = auVar17._20_4_;
    auVar18._20_4_ = auVar296._20_4_ * fVar252;
    fVar299 = auVar17._24_4_;
    auVar18._24_4_ = auVar296._24_4_ * fVar299;
    auVar18._28_4_ = auVar193._28_4_;
    auVar18 = vsubps_avx(auVar283,auVar18);
    auVar21._4_4_ = fVar132;
    auVar21._0_4_ = fVar117;
    auVar21._8_4_ = fVar135;
    auVar21._12_4_ = fVar138;
    auVar21._16_4_ = fVar141;
    auVar21._20_4_ = fVar144;
    auVar21._24_4_ = fVar147;
    auVar21._28_4_ = fVar149;
    auVar283 = vmaxps_avx(auVar21,auVar230);
    auVar23._4_4_ = auVar283._4_4_ * auVar283._4_4_ * (fVar236 * fVar236 + fVar199 * fVar199);
    auVar23._0_4_ = auVar283._0_4_ * auVar283._0_4_ * (fVar225 * fVar225 + fVar186 * fVar186);
    auVar23._8_4_ = auVar283._8_4_ * auVar283._8_4_ * (fVar237 * fVar237 + fVar201 * fVar201);
    auVar23._12_4_ = auVar283._12_4_ * auVar283._12_4_ * (fVar238 * fVar238 + fVar203 * fVar203);
    auVar23._16_4_ = auVar283._16_4_ * auVar283._16_4_ * (fVar239 * fVar239 + fVar248 * fVar248);
    auVar23._20_4_ = auVar283._20_4_ * auVar283._20_4_ * (fVar250 * fVar250 + fVar252 * fVar252);
    auVar23._24_4_ = auVar283._24_4_ * auVar283._24_4_ * (fVar300 * fVar300 + fVar299 * fVar299);
    auVar23._28_4_ = auVar17._28_4_ + auVar193._28_4_;
    auVar14._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar14._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar14._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar14._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar14._16_4_ = auVar18._16_4_ * auVar18._16_4_;
    auVar14._20_4_ = auVar18._20_4_ * auVar18._20_4_;
    auVar14._24_4_ = auVar18._24_4_ * auVar18._24_4_;
    auVar14._28_4_ = auVar18._28_4_;
    auVar214._0_4_ = (float)(int)uVar11;
    auVar214._4_12_ = auVar192._4_12_;
    auVar283 = vcmpps_avx(auVar14,auVar23,2);
    fVar225 = auVar178._0_4_ * 4.7683716e-07;
    auVar272 = ZEXT464((uint)fVar225);
    local_560._0_16_ = auVar214;
    auVar178 = vshufps_avx(auVar214,auVar214,0);
    auVar194._16_16_ = auVar178;
    auVar194._0_16_ = auVar178;
    auVar18 = vcmpps_avx(_DAT_01f7b060,auVar194,1);
    auVar198 = ZEXT3264(auVar18);
    auVar97._8_4_ = auVar212._8_4_;
    auVar97._0_8_ = auVar212._0_8_;
    auVar97._12_4_ = auVar212._12_4_;
    auVar178 = vpermilps_avx(auVar97,0xaa);
    register0x00001450 = auVar178;
    _local_2c0 = auVar178;
    auVar191 = vpermilps_avx(auVar228,0xaa);
    register0x00001550 = auVar191;
    _local_e0 = auVar191;
    auVar192 = vpermilps_avx(auVar213,0xaa);
    register0x00001590 = auVar192;
    _local_480 = auVar192;
    auVar15 = vpermilps_avx(auVar268,0xaa);
    auVar297._16_16_ = auVar15;
    auVar297._0_16_ = auVar15;
    auVar23 = auVar18 & auVar283;
    uVar9 = *(uint *)(ray + k * 4 + 0x60);
    local_700._0_16_ = ZEXT416(*(uint *)(prim + lVar114 * 4 + 6));
    auVar269 = ZEXT416((uint)fVar225);
    local_930 = auVar229._0_4_;
    fStack_92c = auVar229._4_4_;
    fStack_928 = auVar229._8_4_;
    fStack_924 = auVar229._12_4_;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0x7f,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar23 >> 0xbf,0) == '\0') &&
        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f]) {
      pRVar106 = (RTCIntersectArguments *)0x0;
      auVar308 = ZEXT3264(auVar162);
      auVar286 = ZEXT3264(auVar218);
      auVar315 = ZEXT3264(_local_7a0);
    }
    else {
      local_4c0 = vandps_avx(auVar283,auVar18);
      fVar255 = auVar178._0_4_;
      fVar262 = auVar178._4_4_;
      fVar170 = auVar178._8_4_;
      fVar254 = auVar178._12_4_;
      fVar309 = auVar191._0_4_;
      fVar310 = auVar191._4_4_;
      fVar318 = auVar191._8_4_;
      fVar320 = auVar191._12_4_;
      fVar321 = auVar192._0_4_;
      fVar323 = auVar192._4_4_;
      fVar324 = auVar192._8_4_;
      fVar325 = auVar192._12_4_;
      local_5a0._0_4_ = auVar104._0_4_;
      local_5a0._4_4_ = auVar104._4_4_;
      fStack_598 = auVar104._8_4_;
      fStack_594 = auVar104._12_4_;
      fStack_590 = auVar104._16_4_;
      fStack_58c = auVar104._20_4_;
      fStack_588 = auVar104._24_4_;
      fVar279 = auVar15._0_4_;
      fVar287 = auVar15._4_4_;
      fVar288 = auVar15._8_4_;
      fVar298 = auVar15._12_4_;
      local_5a0._0_4_ =
           fVar255 * fVar118 +
           fVar309 * fVar171 + fVar321 * fVar275 + fVar279 * (float)local_5a0._0_4_;
      local_5a0._4_4_ =
           fVar262 * fVar134 +
           fVar310 * fVar291 + fVar323 * fVar276 + fVar287 * (float)local_5a0._4_4_;
      fStack_598 = fVar170 * fVar137 + fVar318 * fVar133 + fVar324 * fVar207 + fVar288 * fStack_598;
      fStack_594 = fVar254 * fVar140 + fVar320 * fVar136 + fVar325 * fVar265 + fVar298 * fStack_594;
      fStack_590 = fVar255 * fVar143 + fVar309 * fVar139 + fVar321 * fVar277 + fVar279 * fStack_590;
      fStack_58c = fVar262 * fVar146 + fVar310 * fVar142 + fVar323 * fVar278 + fVar287 * fStack_58c;
      fStack_588 = fVar170 * fVar148 + fVar318 * fVar145 + fVar324 * fVar208 + fVar288 * fStack_588;
      fStack_584 = local_4c0._28_4_ +
                   auVar18._28_4_ + *(float *)(bspline_basis1 + lVar115 + 0x924) + 0.0;
      local_580._0_4_ = auVar103._0_4_;
      local_580._4_4_ = auVar103._4_4_;
      fStack_578 = auVar103._8_4_;
      fStack_574 = auVar103._12_4_;
      fStack_570 = auVar103._16_4_;
      fStack_56c = auVar103._20_4_;
      fStack_568 = auVar103._24_4_;
      local_680._0_4_ = auVar102._0_4_;
      local_680._4_4_ = auVar102._4_4_;
      fStack_678 = auVar102._8_4_;
      fStack_674 = auVar102._12_4_;
      auStack_670._0_4_ = auVar102._16_4_;
      auStack_670._4_4_ = auVar102._20_4_;
      fStack_668 = auVar102._24_4_;
      local_620._0_4_ = auVar101._0_4_;
      local_620._4_4_ = auVar101._4_4_;
      fStack_618 = auVar101._8_4_;
      fStack_614 = auVar101._12_4_;
      fStack_610 = auVar101._16_4_;
      fStack_60c = auVar101._20_4_;
      fStack_608 = auVar101._24_4_;
      local_640 = fVar255 * (float)local_580._0_4_ +
                  fVar309 * (float)local_680._0_4_ +
                  fVar321 * (float)local_620._0_4_ + fVar279 * fVar267;
      fStack_63c = fVar262 * (float)local_580._4_4_ +
                   fVar310 * (float)local_680._4_4_ +
                   fVar323 * (float)local_620._4_4_ + fVar287 * fVar205;
      fStack_638 = fVar170 * fStack_578 +
                   fVar318 * fStack_678 + fVar324 * fStack_618 + fVar288 * fVar263;
      fStack_634 = fVar254 * fStack_574 +
                   fVar320 * fStack_674 + fVar325 * fStack_614 + fVar298 * fVar273;
      fStack_630 = fVar255 * fStack_570 +
                   fVar309 * (float)auStack_670._0_4_ + fVar321 * fStack_610 + fVar279 * fVar274;
      fStack_62c = fVar262 * fStack_56c +
                   fVar310 * (float)auStack_670._4_4_ + fVar323 * fStack_60c + fVar287 * fVar206;
      fStack_628 = fVar170 * fStack_568 +
                   fVar318 * fStack_668 + fVar324 * fStack_608 + fVar288 * fVar264;
      fStack_624 = fVar204 + fStack_584 + local_4c0._28_4_ + auVar18._28_4_;
      fVar225 = *(float *)(bspline_basis0 + lVar115 + 0x1210);
      fVar186 = *(float *)(bspline_basis0 + lVar115 + 0x1214);
      fVar236 = *(float *)(bspline_basis0 + lVar115 + 0x1218);
      fVar199 = *(float *)(bspline_basis0 + lVar115 + 0x121c);
      fVar237 = *(float *)(bspline_basis0 + lVar115 + 0x1220);
      fVar201 = *(float *)(bspline_basis0 + lVar115 + 0x1224);
      fVar238 = *(float *)(bspline_basis0 + lVar115 + 0x1228);
      fVar203 = *(float *)(bspline_basis0 + lVar115 + 0x1694);
      fVar239 = *(float *)(bspline_basis0 + lVar115 + 0x1698);
      fVar248 = *(float *)(bspline_basis0 + lVar115 + 0x169c);
      fVar250 = *(float *)(bspline_basis0 + lVar115 + 0x16a0);
      fVar252 = *(float *)(bspline_basis0 + lVar115 + 0x16a4);
      fVar300 = *(float *)(bspline_basis0 + lVar115 + 0x16a8);
      fVar299 = *(float *)(bspline_basis0 + lVar115 + 0x16ac);
      fVar267 = *(float *)(bspline_basis0 + lVar115 + 0x1b18);
      fVar205 = *(float *)(bspline_basis0 + lVar115 + 0x1b1c);
      fVar263 = *(float *)(bspline_basis0 + lVar115 + 0x1b20);
      fVar273 = *(float *)(bspline_basis0 + lVar115 + 0x1b24);
      fVar274 = *(float *)(bspline_basis0 + lVar115 + 0x1b28);
      fVar206 = *(float *)(bspline_basis0 + lVar115 + 0x1b2c);
      fVar264 = *(float *)(bspline_basis0 + lVar115 + 0x1b30);
      fVar275 = *(float *)(bspline_basis0 + lVar115 + 0x1f9c);
      fVar276 = *(float *)(bspline_basis0 + lVar115 + 0x1fa0);
      fVar207 = *(float *)(bspline_basis0 + lVar115 + 0x1fa4);
      fVar265 = *(float *)(bspline_basis0 + lVar115 + 0x1fa8);
      fVar277 = *(float *)(bspline_basis0 + lVar115 + 0x1fac);
      fVar278 = *(float *)(bspline_basis0 + lVar115 + 0x1fb0);
      fVar208 = *(float *)(bspline_basis0 + lVar115 + 0x1fb4);
      fVar171 = *(float *)(bspline_basis0 + lVar115 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar115 + 0x1fb8);
      fVar291 = *(float *)(bspline_basis0 + lVar115 + 0x16b0) + fVar171;
      local_580._4_4_ =
           fVar168 * fVar186 + fVar330 * fVar239 + fVar266 * fVar205 + fVar316 * fVar276;
      local_580._0_4_ =
           fVar167 * fVar225 + fVar326 * fVar203 + fVar150 * fVar267 + fVar311 * fVar275;
      fStack_578 = fVar169 * fVar236 + fVar331 * fVar248 + fVar165 * fVar263 + fVar317 * fVar207;
      fStack_574 = fVar224 * fVar199 + fVar332 * fVar250 + fVar166 * fVar273 + fVar319 * fVar265;
      fStack_570 = fVar167 * fVar237 + fVar326 * fVar252 + fVar150 * fVar274 + fVar311 * fVar277;
      fStack_56c = fVar168 * fVar201 + fVar330 * fVar300 + fVar266 * fVar206 + fVar316 * fVar278;
      fStack_568 = fVar169 * fVar238 + fVar331 * fVar299 + fVar165 * fVar264 + fVar317 * fVar208;
      fStack_564 = *(float *)(bspline_basis0 + lVar115 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar115 + 0x1fb8) +
                   fVar254 + *(float *)(bspline_basis1 + lVar115 + 0x4a0);
      auVar156._0_4_ = fVar187 * fVar225 + fVar289 * fVar203 + fVar209 * fVar267 + fVar240 * fVar275
      ;
      auVar156._4_4_ = fVar200 * fVar186 + fVar290 * fVar239 + fVar221 * fVar205 + fVar249 * fVar276
      ;
      auVar156._8_4_ = fVar202 * fVar236 + fVar294 * fVar248 + fVar222 * fVar263 + fVar251 * fVar207
      ;
      auVar156._12_4_ =
           fVar204 * fVar199 + fVar295 * fVar250 + fVar223 * fVar273 + fVar253 * fVar265;
      auVar156._16_4_ =
           fVar187 * fVar237 + fVar289 * fVar252 + fVar209 * fVar274 + fVar240 * fVar277;
      auVar156._20_4_ =
           fVar200 * fVar201 + fVar290 * fVar300 + fVar221 * fVar206 + fVar249 * fVar278;
      auVar156._24_4_ =
           fVar202 * fVar238 + fVar294 * fVar299 + fVar222 * fVar264 + fVar251 * fVar208;
      auVar156._28_4_ =
           fVar171 + fVar254 + *(float *)(bspline_basis1 + lVar115 + 0x4a0) +
                     fVar254 + *(float *)(bspline_basis1 + lVar115 + 0x1c);
      auVar243._0_4_ = fVar309 * fVar203 + fVar321 * fVar267 + fVar279 * fVar275 + fVar255 * fVar225
      ;
      auVar243._4_4_ = fVar310 * fVar239 + fVar323 * fVar205 + fVar287 * fVar276 + fVar262 * fVar186
      ;
      auVar243._8_4_ = fVar318 * fVar248 + fVar324 * fVar263 + fVar288 * fVar207 + fVar170 * fVar236
      ;
      auVar243._12_4_ =
           fVar320 * fVar250 + fVar325 * fVar273 + fVar298 * fVar265 + fVar254 * fVar199;
      auVar243._16_4_ =
           fVar309 * fVar252 + fVar321 * fVar274 + fVar279 * fVar277 + fVar255 * fVar237;
      auVar243._20_4_ =
           fVar310 * fVar300 + fVar323 * fVar206 + fVar287 * fVar278 + fVar262 * fVar201;
      auVar243._24_4_ =
           fVar318 * fVar299 + fVar324 * fVar264 + fVar288 * fVar208 + fVar170 * fVar238;
      auVar243._28_4_ = fVar291 + *(float *)(bspline_basis0 + lVar115 + 0x122c);
      fVar225 = *(float *)(bspline_basis1 + lVar115 + 0x1b18);
      fVar186 = *(float *)(bspline_basis1 + lVar115 + 0x1b1c);
      fVar236 = *(float *)(bspline_basis1 + lVar115 + 0x1b20);
      fVar199 = *(float *)(bspline_basis1 + lVar115 + 0x1b24);
      fVar237 = *(float *)(bspline_basis1 + lVar115 + 0x1b28);
      fVar201 = *(float *)(bspline_basis1 + lVar115 + 0x1b2c);
      fVar238 = *(float *)(bspline_basis1 + lVar115 + 0x1b30);
      fVar203 = *(float *)(bspline_basis1 + lVar115 + 0x1f9c);
      fVar239 = *(float *)(bspline_basis1 + lVar115 + 0x1fa0);
      fVar248 = *(float *)(bspline_basis1 + lVar115 + 0x1fa4);
      fVar250 = *(float *)(bspline_basis1 + lVar115 + 0x1fa8);
      fVar252 = *(float *)(bspline_basis1 + lVar115 + 0x1fac);
      fVar300 = *(float *)(bspline_basis1 + lVar115 + 0x1fb0);
      fVar299 = *(float *)(bspline_basis1 + lVar115 + 0x1fb4);
      fVar267 = *(float *)(bspline_basis1 + lVar115 + 0x1694);
      fVar205 = *(float *)(bspline_basis1 + lVar115 + 0x1698);
      fVar263 = *(float *)(bspline_basis1 + lVar115 + 0x169c);
      fVar273 = *(float *)(bspline_basis1 + lVar115 + 0x16a0);
      fVar274 = *(float *)(bspline_basis1 + lVar115 + 0x16a4);
      fVar206 = *(float *)(bspline_basis1 + lVar115 + 0x16a8);
      fVar264 = *(float *)(bspline_basis1 + lVar115 + 0x16ac);
      fVar275 = *(float *)(bspline_basis1 + lVar115 + 0x1210);
      fVar276 = *(float *)(bspline_basis1 + lVar115 + 0x1214);
      fVar207 = *(float *)(bspline_basis1 + lVar115 + 0x1218);
      fVar265 = *(float *)(bspline_basis1 + lVar115 + 0x121c);
      fVar277 = *(float *)(bspline_basis1 + lVar115 + 0x1220);
      fVar278 = *(float *)(bspline_basis1 + lVar115 + 0x1224);
      fVar208 = *(float *)(bspline_basis1 + lVar115 + 0x1228);
      auVar259._0_4_ = fVar167 * fVar275 + fVar326 * fVar267 + fVar150 * fVar225 + fVar311 * fVar203
      ;
      auVar259._4_4_ = fVar168 * fVar276 + fVar330 * fVar205 + fVar266 * fVar186 + fVar316 * fVar239
      ;
      auVar259._8_4_ = fVar169 * fVar207 + fVar331 * fVar263 + fVar165 * fVar236 + fVar317 * fVar248
      ;
      auVar259._12_4_ =
           fVar224 * fVar265 + fVar332 * fVar273 + fVar166 * fVar199 + fVar319 * fVar250;
      auVar259._16_4_ =
           fVar167 * fVar277 + fVar326 * fVar274 + fVar150 * fVar237 + fVar311 * fVar252;
      auVar259._20_4_ =
           fVar168 * fVar278 + fVar330 * fVar206 + fVar266 * fVar201 + fVar316 * fVar300;
      auVar259._24_4_ =
           fVar169 * fVar208 + fVar331 * fVar264 + fVar165 * fVar238 + fVar317 * fVar299;
      auVar259._28_4_ = fVar223 + fVar223 + fVar291 + fVar319;
      auVar281._0_4_ = fVar187 * fVar275 + fVar289 * fVar267 + fVar209 * fVar225 + fVar240 * fVar203
      ;
      auVar281._4_4_ = fVar200 * fVar276 + fVar290 * fVar205 + fVar221 * fVar186 + fVar249 * fVar239
      ;
      auVar281._8_4_ = fVar202 * fVar207 + fVar294 * fVar263 + fVar222 * fVar236 + fVar251 * fVar248
      ;
      auVar281._12_4_ =
           fVar204 * fVar265 + fVar295 * fVar273 + fVar223 * fVar199 + fVar253 * fVar250;
      auVar281._16_4_ =
           fVar187 * fVar277 + fVar289 * fVar274 + fVar209 * fVar237 + fVar240 * fVar252;
      auVar281._20_4_ =
           fVar200 * fVar278 + fVar290 * fVar206 + fVar221 * fVar201 + fVar249 * fVar300;
      auVar281._24_4_ =
           fVar202 * fVar208 + fVar294 * fVar264 + fVar222 * fVar238 + fVar251 * fVar299;
      auVar281._28_4_ = fVar223 + fVar223 + fVar223 + fVar291;
      auVar180._0_4_ = fVar255 * fVar275 + fVar309 * fVar267 + fVar321 * fVar225 + fVar203 * fVar279
      ;
      auVar180._4_4_ = fVar262 * fVar276 + fVar310 * fVar205 + fVar323 * fVar186 + fVar239 * fVar287
      ;
      auVar180._8_4_ = fVar170 * fVar207 + fVar318 * fVar263 + fVar324 * fVar236 + fVar248 * fVar288
      ;
      auVar180._12_4_ =
           fVar254 * fVar265 + fVar320 * fVar273 + fVar325 * fVar199 + fVar250 * fVar298;
      auVar180._16_4_ =
           fVar255 * fVar277 + fVar309 * fVar274 + fVar321 * fVar237 + fVar252 * fVar279;
      auVar180._20_4_ =
           fVar262 * fVar278 + fVar310 * fVar206 + fVar323 * fVar201 + fVar300 * fVar287;
      auVar180._24_4_ =
           fVar170 * fVar208 + fVar318 * fVar264 + fVar324 * fVar238 + fVar299 * fVar288;
      auVar180._28_4_ =
           *(float *)(bspline_basis1 + lVar115 + 0x122c) +
           *(float *)(bspline_basis1 + lVar115 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar115 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar115 + 0x1fb8);
      auVar216._8_4_ = 0x7fffffff;
      auVar216._0_8_ = 0x7fffffff7fffffff;
      auVar216._12_4_ = 0x7fffffff;
      auVar216._16_4_ = 0x7fffffff;
      auVar216._20_4_ = 0x7fffffff;
      auVar216._24_4_ = 0x7fffffff;
      auVar216._28_4_ = 0x7fffffff;
      auVar283 = vandps_avx(_local_580,auVar216);
      auVar18 = vandps_avx(auVar156,auVar216);
      auVar18 = vmaxps_avx(auVar283,auVar18);
      auVar283 = vandps_avx(auVar243,auVar216);
      auVar283 = vmaxps_avx(auVar18,auVar283);
      auVar229 = vpermilps_avx(auVar269,0);
      auVar244._16_16_ = auVar229;
      auVar244._0_16_ = auVar229;
      auVar283 = vcmpps_avx(auVar283,auVar244,1);
      auVar23 = vblendvps_avx(_local_580,auVar16,auVar283);
      auVar14 = vblendvps_avx(auVar156,auVar17,auVar283);
      auVar283 = vandps_avx(auVar259,auVar216);
      auVar18 = vandps_avx(auVar281,auVar216);
      auVar21 = vmaxps_avx(auVar283,auVar18);
      auVar283 = vandps_avx(auVar180,auVar216);
      auVar283 = vmaxps_avx(auVar21,auVar283);
      auVar21 = vcmpps_avx(auVar283,auVar244,1);
      auVar283 = vblendvps_avx(auVar259,auVar16,auVar21);
      auVar16 = vblendvps_avx(auVar281,auVar17,auVar21);
      fVar291 = auVar23._0_4_;
      fVar133 = auVar23._4_4_;
      fVar136 = auVar23._8_4_;
      fVar139 = auVar23._12_4_;
      fVar142 = auVar23._16_4_;
      fVar145 = auVar23._20_4_;
      fVar118 = auVar23._24_4_;
      fVar134 = auVar283._0_4_;
      fVar137 = auVar283._4_4_;
      fVar140 = auVar283._8_4_;
      fVar143 = auVar283._12_4_;
      fVar146 = auVar283._16_4_;
      fVar148 = auVar283._20_4_;
      fVar150 = auVar283._24_4_;
      fVar266 = -auVar283._28_4_;
      fVar225 = auVar14._0_4_;
      fVar237 = auVar14._4_4_;
      fVar239 = auVar14._8_4_;
      fVar300 = auVar14._12_4_;
      fVar263 = auVar14._16_4_;
      fVar264 = auVar14._20_4_;
      fVar265 = auVar14._24_4_;
      auVar124._0_4_ = fVar225 * fVar225 + fVar291 * fVar291;
      auVar124._4_4_ = fVar237 * fVar237 + fVar133 * fVar133;
      auVar124._8_4_ = fVar239 * fVar239 + fVar136 * fVar136;
      auVar124._12_4_ = fVar300 * fVar300 + fVar139 * fVar139;
      auVar124._16_4_ = fVar263 * fVar263 + fVar142 * fVar142;
      auVar124._20_4_ = fVar264 * fVar264 + fVar145 * fVar145;
      auVar124._24_4_ = fVar265 * fVar265 + fVar118 * fVar118;
      auVar124._28_4_ = auVar281._28_4_ + auVar23._28_4_;
      auVar17 = vrsqrtps_avx(auVar124);
      fVar186 = auVar17._0_4_;
      fVar236 = auVar17._4_4_;
      auVar22._4_4_ = fVar236 * 1.5;
      auVar22._0_4_ = fVar186 * 1.5;
      fVar199 = auVar17._8_4_;
      auVar22._8_4_ = fVar199 * 1.5;
      fVar201 = auVar17._12_4_;
      auVar22._12_4_ = fVar201 * 1.5;
      fVar238 = auVar17._16_4_;
      auVar22._16_4_ = fVar238 * 1.5;
      fVar203 = auVar17._20_4_;
      auVar22._20_4_ = fVar203 * 1.5;
      fVar248 = auVar17._24_4_;
      fVar171 = auVar18._28_4_;
      auVar22._24_4_ = fVar248 * 1.5;
      auVar22._28_4_ = fVar171;
      auVar17._4_4_ = fVar236 * fVar236 * fVar236 * auVar124._4_4_ * 0.5;
      auVar17._0_4_ = fVar186 * fVar186 * fVar186 * auVar124._0_4_ * 0.5;
      auVar17._8_4_ = fVar199 * fVar199 * fVar199 * auVar124._8_4_ * 0.5;
      auVar17._12_4_ = fVar201 * fVar201 * fVar201 * auVar124._12_4_ * 0.5;
      auVar17._16_4_ = fVar238 * fVar238 * fVar238 * auVar124._16_4_ * 0.5;
      auVar17._20_4_ = fVar203 * fVar203 * fVar203 * auVar124._20_4_ * 0.5;
      auVar17._24_4_ = fVar248 * fVar248 * fVar248 * auVar124._24_4_ * 0.5;
      auVar17._28_4_ = auVar124._28_4_;
      auVar18 = vsubps_avx(auVar22,auVar17);
      fVar186 = auVar18._0_4_;
      fVar201 = auVar18._4_4_;
      fVar248 = auVar18._8_4_;
      fVar299 = auVar18._12_4_;
      fVar273 = auVar18._16_4_;
      fVar275 = auVar18._20_4_;
      fVar277 = auVar18._24_4_;
      fVar236 = auVar16._0_4_;
      fVar238 = auVar16._4_4_;
      fVar250 = auVar16._8_4_;
      fVar267 = auVar16._12_4_;
      fVar274 = auVar16._16_4_;
      fVar276 = auVar16._20_4_;
      fVar278 = auVar16._24_4_;
      auVar125._0_4_ = fVar236 * fVar236 + fVar134 * fVar134;
      auVar125._4_4_ = fVar238 * fVar238 + fVar137 * fVar137;
      auVar125._8_4_ = fVar250 * fVar250 + fVar140 * fVar140;
      auVar125._12_4_ = fVar267 * fVar267 + fVar143 * fVar143;
      auVar125._16_4_ = fVar274 * fVar274 + fVar146 * fVar146;
      auVar125._20_4_ = fVar276 * fVar276 + fVar148 * fVar148;
      auVar125._24_4_ = fVar278 * fVar278 + fVar150 * fVar150;
      auVar125._28_4_ = auVar283._28_4_ + auVar18._28_4_;
      auVar283 = vrsqrtps_avx(auVar125);
      fVar199 = auVar283._0_4_;
      fVar203 = auVar283._4_4_;
      auVar19._4_4_ = fVar203 * 1.5;
      auVar19._0_4_ = fVar199 * 1.5;
      fVar252 = auVar283._8_4_;
      auVar19._8_4_ = fVar252 * 1.5;
      fVar205 = auVar283._12_4_;
      auVar19._12_4_ = fVar205 * 1.5;
      fVar206 = auVar283._16_4_;
      auVar19._16_4_ = fVar206 * 1.5;
      fVar207 = auVar283._20_4_;
      auVar19._20_4_ = fVar207 * 1.5;
      fVar208 = auVar283._24_4_;
      auVar19._24_4_ = fVar208 * 1.5;
      auVar19._28_4_ = fVar171;
      auVar20._4_4_ = fVar203 * fVar203 * fVar203 * auVar125._4_4_ * 0.5;
      auVar20._0_4_ = fVar199 * fVar199 * fVar199 * auVar125._0_4_ * 0.5;
      auVar20._8_4_ = fVar252 * fVar252 * fVar252 * auVar125._8_4_ * 0.5;
      auVar20._12_4_ = fVar205 * fVar205 * fVar205 * auVar125._12_4_ * 0.5;
      auVar20._16_4_ = fVar206 * fVar206 * fVar206 * auVar125._16_4_ * 0.5;
      auVar20._20_4_ = fVar207 * fVar207 * fVar207 * auVar125._20_4_ * 0.5;
      auVar20._24_4_ = fVar208 * fVar208 * fVar208 * auVar125._24_4_ * 0.5;
      auVar20._28_4_ = auVar125._28_4_;
      auVar283 = vsubps_avx(auVar19,auVar20);
      fVar199 = auVar283._0_4_;
      fVar203 = auVar283._4_4_;
      fVar252 = auVar283._8_4_;
      fVar205 = auVar283._12_4_;
      fVar206 = auVar283._16_4_;
      fVar207 = auVar283._20_4_;
      fVar208 = auVar283._24_4_;
      fVar225 = fVar117 * fVar225 * fVar186;
      fVar237 = fVar132 * fVar237 * fVar201;
      auVar24._4_4_ = fVar237;
      auVar24._0_4_ = fVar225;
      fVar239 = fVar135 * fVar239 * fVar248;
      auVar24._8_4_ = fVar239;
      fVar300 = fVar138 * fVar300 * fVar299;
      auVar24._12_4_ = fVar300;
      fVar263 = fVar141 * fVar263 * fVar273;
      auVar24._16_4_ = fVar263;
      fVar264 = fVar144 * fVar264 * fVar275;
      auVar24._20_4_ = fVar264;
      fVar265 = fVar147 * fVar265 * fVar277;
      auVar24._24_4_ = fVar265;
      auVar24._28_4_ = fVar266;
      local_660._4_4_ = auVar296._4_4_ + fVar237;
      local_660._0_4_ = auVar296._0_4_ + fVar225;
      fStack_658 = auVar296._8_4_ + fVar239;
      fStack_654 = auVar296._12_4_ + fVar300;
      fStack_650 = auVar296._16_4_ + fVar263;
      fStack_64c = auVar296._20_4_ + fVar264;
      fStack_648 = auVar296._24_4_ + fVar265;
      fStack_644 = auVar296._28_4_ + fVar266;
      fVar225 = fVar117 * fVar186 * -fVar291;
      fVar237 = fVar132 * fVar201 * -fVar133;
      auVar25._4_4_ = fVar237;
      auVar25._0_4_ = fVar225;
      fVar239 = fVar135 * fVar248 * -fVar136;
      auVar25._8_4_ = fVar239;
      fVar300 = fVar138 * fVar299 * -fVar139;
      auVar25._12_4_ = fVar300;
      fVar263 = fVar141 * fVar273 * -fVar142;
      auVar25._16_4_ = fVar263;
      fVar264 = fVar144 * fVar275 * -fVar145;
      auVar25._20_4_ = fVar264;
      fVar265 = fVar147 * fVar277 * -fVar118;
      auVar25._24_4_ = fVar265;
      auVar25._28_4_ = fVar171;
      local_680._4_4_ = fVar237 + auVar270._4_4_;
      local_680._0_4_ = fVar225 + auVar270._0_4_;
      fStack_678 = fVar239 + auVar270._8_4_;
      fStack_674 = fVar300 + auVar270._12_4_;
      auStack_670._0_4_ = fVar263 + auVar270._16_4_;
      auStack_670._4_4_ = fVar264 + auVar270._20_4_;
      fStack_668 = fVar265 + auVar270._24_4_;
      fStack_664 = fVar171 + auVar270._28_4_;
      fVar225 = fVar117 * fVar186 * 0.0;
      fVar186 = fVar132 * fVar201 * 0.0;
      auVar26._4_4_ = fVar186;
      auVar26._0_4_ = fVar225;
      fVar237 = fVar135 * fVar248 * 0.0;
      auVar26._8_4_ = fVar237;
      fVar201 = fVar138 * fVar299 * 0.0;
      auVar26._12_4_ = fVar201;
      fVar239 = fVar141 * fVar273 * 0.0;
      auVar26._16_4_ = fVar239;
      fVar248 = fVar144 * fVar275 * 0.0;
      auVar26._20_4_ = fVar248;
      fVar300 = fVar147 * fVar277 * 0.0;
      auVar26._24_4_ = fVar300;
      auVar26._28_4_ = fVar295;
      auVar99._4_4_ = fStack_63c;
      auVar99._0_4_ = local_640;
      auVar99._8_4_ = fStack_638;
      auVar99._12_4_ = fStack_634;
      auVar99._16_4_ = fStack_630;
      auVar99._20_4_ = fStack_62c;
      auVar99._24_4_ = fStack_628;
      auVar99._28_4_ = fStack_624;
      auVar245._0_4_ = fVar225 + local_640;
      auVar245._4_4_ = fVar186 + fStack_63c;
      auVar245._8_4_ = fVar237 + fStack_638;
      auVar245._12_4_ = fVar201 + fStack_634;
      auVar245._16_4_ = fVar239 + fStack_630;
      auVar245._20_4_ = fVar248 + fStack_62c;
      auVar245._24_4_ = fVar300 + fStack_628;
      auVar245._28_4_ = fVar295 + fStack_624;
      fVar225 = auVar230._0_4_ * fVar236 * fVar199;
      fVar186 = auVar230._4_4_ * fVar238 * fVar203;
      auVar27._4_4_ = fVar186;
      auVar27._0_4_ = fVar225;
      fVar236 = auVar230._8_4_ * fVar250 * fVar252;
      auVar27._8_4_ = fVar236;
      fVar237 = auVar230._12_4_ * fVar267 * fVar205;
      auVar27._12_4_ = fVar237;
      fVar201 = auVar230._16_4_ * fVar274 * fVar206;
      auVar27._16_4_ = fVar201;
      fVar238 = auVar230._20_4_ * fVar276 * fVar207;
      auVar27._20_4_ = fVar238;
      fVar239 = auVar230._24_4_ * fVar278 * fVar208;
      auVar27._24_4_ = fVar239;
      auVar27._28_4_ = auVar16._28_4_;
      auVar21 = vsubps_avx(auVar296,auVar24);
      auVar282._0_4_ = auVar302._0_4_ + fVar225;
      auVar282._4_4_ = auVar302._4_4_ + fVar186;
      auVar282._8_4_ = auVar302._8_4_ + fVar236;
      auVar282._12_4_ = auVar302._12_4_ + fVar237;
      auVar282._16_4_ = auVar302._16_4_ + fVar201;
      auVar282._20_4_ = auVar302._20_4_ + fVar238;
      auVar282._24_4_ = auVar302._24_4_ + fVar239;
      auVar282._28_4_ = auVar302._28_4_ + auVar16._28_4_;
      fVar225 = auVar230._0_4_ * fVar199 * -fVar134;
      fVar186 = auVar230._4_4_ * fVar203 * -fVar137;
      auVar16._4_4_ = fVar186;
      auVar16._0_4_ = fVar225;
      fVar236 = auVar230._8_4_ * fVar252 * -fVar140;
      auVar16._8_4_ = fVar236;
      fVar237 = auVar230._12_4_ * fVar205 * -fVar143;
      auVar16._12_4_ = fVar237;
      fVar201 = auVar230._16_4_ * fVar206 * -fVar146;
      auVar16._16_4_ = fVar201;
      fVar238 = auVar230._20_4_ * fVar207 * -fVar148;
      auVar16._20_4_ = fVar238;
      fVar239 = auVar230._24_4_ * fVar208 * -fVar150;
      auVar16._24_4_ = fVar239;
      auVar16._28_4_ = fVar320;
      auVar194 = vsubps_avx(auVar270,auVar25);
      auVar292._0_4_ = fVar225 + auVar193._0_4_;
      auVar292._4_4_ = fVar186 + auVar193._4_4_;
      auVar292._8_4_ = fVar236 + auVar193._8_4_;
      auVar292._12_4_ = fVar237 + auVar193._12_4_;
      auVar292._16_4_ = fVar201 + auVar193._16_4_;
      auVar292._20_4_ = fVar238 + auVar193._20_4_;
      auVar292._24_4_ = fVar239 + auVar193._24_4_;
      auVar292._28_4_ = fVar320 + auVar193._28_4_;
      fVar225 = auVar230._0_4_ * fVar199 * 0.0;
      fVar186 = auVar230._4_4_ * fVar203 * 0.0;
      auVar28._4_4_ = fVar186;
      auVar28._0_4_ = fVar225;
      fVar236 = auVar230._8_4_ * fVar252 * 0.0;
      auVar28._8_4_ = fVar236;
      fVar199 = auVar230._12_4_ * fVar205 * 0.0;
      auVar28._12_4_ = fVar199;
      fVar237 = auVar230._16_4_ * fVar206 * 0.0;
      auVar28._16_4_ = fVar237;
      fVar201 = auVar230._20_4_ * fVar207 * 0.0;
      auVar28._20_4_ = fVar201;
      fVar238 = auVar230._24_4_ * fVar208 * 0.0;
      auVar28._24_4_ = fVar238;
      auVar28._28_4_ = 0x3f000000;
      auVar296 = vsubps_avx(auVar99,auVar26);
      auVar322._0_4_ = fVar225 + (float)local_5a0._0_4_;
      auVar322._4_4_ = fVar186 + (float)local_5a0._4_4_;
      auVar322._8_4_ = fVar236 + fStack_598;
      auVar322._12_4_ = fVar199 + fStack_594;
      auVar322._16_4_ = fVar237 + fStack_590;
      auVar322._20_4_ = fVar201 + fStack_58c;
      auVar322._24_4_ = fVar238 + fStack_588;
      auVar322._28_4_ = fStack_584 + 0.5;
      auVar283 = vsubps_avx(auVar302,auVar27);
      auVar18 = vsubps_avx(auVar193,auVar16);
      auVar22 = vsubps_avx(_local_5a0,auVar28);
      auVar16 = vsubps_avx(auVar292,auVar194);
      auVar17 = vsubps_avx(auVar322,auVar296);
      auVar29._4_4_ = auVar296._4_4_ * auVar16._4_4_;
      auVar29._0_4_ = auVar296._0_4_ * auVar16._0_4_;
      auVar29._8_4_ = auVar296._8_4_ * auVar16._8_4_;
      auVar29._12_4_ = auVar296._12_4_ * auVar16._12_4_;
      auVar29._16_4_ = auVar296._16_4_ * auVar16._16_4_;
      auVar29._20_4_ = auVar296._20_4_ * auVar16._20_4_;
      auVar29._24_4_ = auVar296._24_4_ * auVar16._24_4_;
      auVar29._28_4_ = auVar302._28_4_;
      auVar30._4_4_ = auVar194._4_4_ * auVar17._4_4_;
      auVar30._0_4_ = auVar194._0_4_ * auVar17._0_4_;
      auVar30._8_4_ = auVar194._8_4_ * auVar17._8_4_;
      auVar30._12_4_ = auVar194._12_4_ * auVar17._12_4_;
      auVar30._16_4_ = auVar194._16_4_ * auVar17._16_4_;
      auVar30._20_4_ = auVar194._20_4_ * auVar17._20_4_;
      auVar30._24_4_ = auVar194._24_4_ * auVar17._24_4_;
      auVar30._28_4_ = fStack_584;
      auVar23 = vsubps_avx(auVar30,auVar29);
      auVar31._4_4_ = auVar21._4_4_ * auVar17._4_4_;
      auVar31._0_4_ = auVar21._0_4_ * auVar17._0_4_;
      auVar31._8_4_ = auVar21._8_4_ * auVar17._8_4_;
      auVar31._12_4_ = auVar21._12_4_ * auVar17._12_4_;
      auVar31._16_4_ = auVar21._16_4_ * auVar17._16_4_;
      auVar31._20_4_ = auVar21._20_4_ * auVar17._20_4_;
      auVar31._24_4_ = auVar21._24_4_ * auVar17._24_4_;
      auVar31._28_4_ = auVar17._28_4_;
      auVar14 = vsubps_avx(auVar282,auVar21);
      auVar32._4_4_ = auVar296._4_4_ * auVar14._4_4_;
      auVar32._0_4_ = auVar296._0_4_ * auVar14._0_4_;
      auVar32._8_4_ = auVar296._8_4_ * auVar14._8_4_;
      auVar32._12_4_ = auVar296._12_4_ * auVar14._12_4_;
      auVar32._16_4_ = auVar296._16_4_ * auVar14._16_4_;
      auVar32._20_4_ = auVar296._20_4_ * auVar14._20_4_;
      auVar32._24_4_ = auVar296._24_4_ * auVar14._24_4_;
      auVar32._28_4_ = auVar193._28_4_;
      auVar193 = vsubps_avx(auVar32,auVar31);
      auVar33._4_4_ = auVar14._4_4_ * auVar194._4_4_;
      auVar33._0_4_ = auVar14._0_4_ * auVar194._0_4_;
      auVar33._8_4_ = auVar14._8_4_ * auVar194._8_4_;
      auVar33._12_4_ = auVar14._12_4_ * auVar194._12_4_;
      auVar33._16_4_ = auVar14._16_4_ * auVar194._16_4_;
      auVar33._20_4_ = auVar14._20_4_ * auVar194._20_4_;
      auVar33._24_4_ = auVar14._24_4_ * auVar194._24_4_;
      auVar33._28_4_ = auVar17._28_4_;
      auVar34._4_4_ = auVar21._4_4_ * auVar16._4_4_;
      auVar34._0_4_ = auVar21._0_4_ * auVar16._0_4_;
      auVar34._8_4_ = auVar21._8_4_ * auVar16._8_4_;
      auVar34._12_4_ = auVar21._12_4_ * auVar16._12_4_;
      auVar34._16_4_ = auVar21._16_4_ * auVar16._16_4_;
      auVar34._20_4_ = auVar21._20_4_ * auVar16._20_4_;
      auVar34._24_4_ = auVar21._24_4_ * auVar16._24_4_;
      auVar34._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(auVar34,auVar33);
      auVar126._0_4_ = auVar23._0_4_ * 0.0 + auVar16._0_4_ + auVar193._0_4_ * 0.0;
      auVar126._4_4_ = auVar23._4_4_ * 0.0 + auVar16._4_4_ + auVar193._4_4_ * 0.0;
      auVar126._8_4_ = auVar23._8_4_ * 0.0 + auVar16._8_4_ + auVar193._8_4_ * 0.0;
      auVar126._12_4_ = auVar23._12_4_ * 0.0 + auVar16._12_4_ + auVar193._12_4_ * 0.0;
      auVar126._16_4_ = auVar23._16_4_ * 0.0 + auVar16._16_4_ + auVar193._16_4_ * 0.0;
      auVar126._20_4_ = auVar23._20_4_ * 0.0 + auVar16._20_4_ + auVar193._20_4_ * 0.0;
      auVar126._24_4_ = auVar23._24_4_ * 0.0 + auVar16._24_4_ + auVar193._24_4_ * 0.0;
      auVar126._28_4_ = auVar16._28_4_ + auVar16._28_4_ + auVar193._28_4_;
      auVar270 = vcmpps_avx(auVar126,ZEXT432(0) << 0x20,2);
      auVar283 = vblendvps_avx(auVar283,_local_660,auVar270);
      auVar18 = vblendvps_avx(auVar18,_local_680,auVar270);
      auVar16 = vblendvps_avx(auVar22,auVar245,auVar270);
      auVar17 = vblendvps_avx(auVar21,auVar282,auVar270);
      auVar23 = vblendvps_avx(auVar194,auVar292,auVar270);
      auVar14 = vblendvps_avx(auVar296,auVar322,auVar270);
      auVar21 = vblendvps_avx(auVar282,auVar21,auVar270);
      auVar193 = vblendvps_avx(auVar292,auVar194,auVar270);
      auVar229 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
      auVar194 = vblendvps_avx(auVar322,auVar296,auVar270);
      auVar21 = vsubps_avx(auVar21,auVar283);
      auVar296 = vsubps_avx(auVar193,auVar18);
      auVar194 = vsubps_avx(auVar194,auVar16);
      auVar19 = vsubps_avx(auVar18,auVar23);
      fVar225 = auVar296._0_4_;
      fVar118 = auVar16._0_4_;
      fVar201 = auVar296._4_4_;
      fVar134 = auVar16._4_4_;
      auVar35._4_4_ = fVar134 * fVar201;
      auVar35._0_4_ = fVar118 * fVar225;
      fVar250 = auVar296._8_4_;
      fVar137 = auVar16._8_4_;
      auVar35._8_4_ = fVar137 * fVar250;
      fVar205 = auVar296._12_4_;
      fVar140 = auVar16._12_4_;
      auVar35._12_4_ = fVar140 * fVar205;
      fVar264 = auVar296._16_4_;
      fVar143 = auVar16._16_4_;
      auVar35._16_4_ = fVar143 * fVar264;
      fVar277 = auVar296._20_4_;
      fVar146 = auVar16._20_4_;
      auVar35._20_4_ = fVar146 * fVar277;
      fVar133 = auVar296._24_4_;
      fVar148 = auVar16._24_4_;
      auVar35._24_4_ = fVar148 * fVar133;
      auVar35._28_4_ = auVar193._28_4_;
      fVar186 = auVar18._0_4_;
      fVar224 = auVar194._0_4_;
      fVar238 = auVar18._4_4_;
      fVar240 = auVar194._4_4_;
      auVar36._4_4_ = fVar240 * fVar238;
      auVar36._0_4_ = fVar224 * fVar186;
      fVar252 = auVar18._8_4_;
      fVar249 = auVar194._8_4_;
      auVar36._8_4_ = fVar249 * fVar252;
      fVar263 = auVar18._12_4_;
      fVar251 = auVar194._12_4_;
      auVar36._12_4_ = fVar251 * fVar263;
      fVar275 = auVar18._16_4_;
      fVar253 = auVar194._16_4_;
      auVar36._16_4_ = fVar253 * fVar275;
      fVar278 = auVar18._20_4_;
      fVar255 = auVar194._20_4_;
      auVar36._20_4_ = fVar255 * fVar278;
      fVar136 = auVar18._24_4_;
      fVar262 = auVar194._24_4_;
      uVar116 = auVar22._28_4_;
      auVar36._24_4_ = fVar262 * fVar136;
      auVar36._28_4_ = uVar116;
      auVar18 = vsubps_avx(auVar36,auVar35);
      fVar236 = auVar283._0_4_;
      fVar203 = auVar283._4_4_;
      auVar37._4_4_ = fVar240 * fVar203;
      auVar37._0_4_ = fVar224 * fVar236;
      fVar300 = auVar283._8_4_;
      auVar37._8_4_ = fVar249 * fVar300;
      fVar273 = auVar283._12_4_;
      auVar37._12_4_ = fVar251 * fVar273;
      fVar276 = auVar283._16_4_;
      auVar37._16_4_ = fVar253 * fVar276;
      fVar208 = auVar283._20_4_;
      auVar37._20_4_ = fVar255 * fVar208;
      fVar139 = auVar283._24_4_;
      auVar37._24_4_ = fVar262 * fVar139;
      auVar37._28_4_ = uVar116;
      fVar199 = auVar21._0_4_;
      fVar239 = auVar21._4_4_;
      auVar38._4_4_ = fVar134 * fVar239;
      auVar38._0_4_ = fVar118 * fVar199;
      fVar299 = auVar21._8_4_;
      auVar38._8_4_ = fVar137 * fVar299;
      fVar274 = auVar21._12_4_;
      auVar38._12_4_ = fVar140 * fVar274;
      fVar207 = auVar21._16_4_;
      auVar38._16_4_ = fVar143 * fVar207;
      fVar171 = auVar21._20_4_;
      auVar38._20_4_ = fVar146 * fVar171;
      fVar142 = auVar21._24_4_;
      auVar38._24_4_ = fVar148 * fVar142;
      auVar38._28_4_ = auVar322._28_4_;
      auVar193 = vsubps_avx(auVar38,auVar37);
      auVar39._4_4_ = fVar238 * fVar239;
      auVar39._0_4_ = fVar186 * fVar199;
      auVar39._8_4_ = fVar252 * fVar299;
      auVar39._12_4_ = fVar263 * fVar274;
      auVar39._16_4_ = fVar275 * fVar207;
      auVar39._20_4_ = fVar278 * fVar171;
      auVar39._24_4_ = fVar136 * fVar142;
      auVar39._28_4_ = uVar116;
      auVar327._0_4_ = fVar236 * fVar225;
      auVar327._4_4_ = fVar203 * fVar201;
      auVar327._8_4_ = fVar300 * fVar250;
      auVar327._12_4_ = fVar273 * fVar205;
      auVar327._16_4_ = fVar276 * fVar264;
      auVar327._20_4_ = fVar208 * fVar277;
      auVar327._24_4_ = fVar139 * fVar133;
      auVar327._28_4_ = 0;
      auVar22 = vsubps_avx(auVar327,auVar39);
      auVar20 = vsubps_avx(auVar16,auVar14);
      fVar237 = auVar22._28_4_ + auVar193._28_4_;
      auVar157._0_4_ = auVar22._0_4_ + auVar193._0_4_ * 0.0 + auVar18._0_4_ * 0.0;
      auVar157._4_4_ = auVar22._4_4_ + auVar193._4_4_ * 0.0 + auVar18._4_4_ * 0.0;
      auVar157._8_4_ = auVar22._8_4_ + auVar193._8_4_ * 0.0 + auVar18._8_4_ * 0.0;
      auVar157._12_4_ = auVar22._12_4_ + auVar193._12_4_ * 0.0 + auVar18._12_4_ * 0.0;
      auVar157._16_4_ = auVar22._16_4_ + auVar193._16_4_ * 0.0 + auVar18._16_4_ * 0.0;
      auVar157._20_4_ = auVar22._20_4_ + auVar193._20_4_ * 0.0 + auVar18._20_4_ * 0.0;
      auVar157._24_4_ = auVar22._24_4_ + auVar193._24_4_ * 0.0 + auVar18._24_4_ * 0.0;
      auVar157._28_4_ = fVar237 + auVar18._28_4_;
      fVar150 = auVar19._0_4_;
      fVar266 = auVar19._4_4_;
      auVar40._4_4_ = fVar266 * auVar14._4_4_;
      auVar40._0_4_ = fVar150 * auVar14._0_4_;
      fVar165 = auVar19._8_4_;
      auVar40._8_4_ = fVar165 * auVar14._8_4_;
      fVar166 = auVar19._12_4_;
      auVar40._12_4_ = fVar166 * auVar14._12_4_;
      fVar167 = auVar19._16_4_;
      auVar40._16_4_ = fVar167 * auVar14._16_4_;
      fVar168 = auVar19._20_4_;
      auVar40._20_4_ = fVar168 * auVar14._20_4_;
      fVar169 = auVar19._24_4_;
      auVar40._24_4_ = fVar169 * auVar14._24_4_;
      auVar40._28_4_ = fVar237;
      fVar237 = auVar20._0_4_;
      fVar248 = auVar20._4_4_;
      auVar41._4_4_ = auVar23._4_4_ * fVar248;
      auVar41._0_4_ = auVar23._0_4_ * fVar237;
      fVar267 = auVar20._8_4_;
      auVar41._8_4_ = auVar23._8_4_ * fVar267;
      fVar206 = auVar20._12_4_;
      auVar41._12_4_ = auVar23._12_4_ * fVar206;
      fVar265 = auVar20._16_4_;
      auVar41._16_4_ = auVar23._16_4_ * fVar265;
      fVar291 = auVar20._20_4_;
      auVar41._20_4_ = auVar23._20_4_ * fVar291;
      fVar145 = auVar20._24_4_;
      auVar41._24_4_ = auVar23._24_4_ * fVar145;
      auVar41._28_4_ = auVar22._28_4_;
      auVar193 = vsubps_avx(auVar41,auVar40);
      auVar22 = vsubps_avx(auVar283,auVar17);
      fVar170 = auVar22._0_4_;
      fVar254 = auVar22._4_4_;
      auVar42._4_4_ = fVar254 * auVar14._4_4_;
      auVar42._0_4_ = fVar170 * auVar14._0_4_;
      fVar279 = auVar22._8_4_;
      auVar42._8_4_ = fVar279 * auVar14._8_4_;
      fVar287 = auVar22._12_4_;
      auVar42._12_4_ = fVar287 * auVar14._12_4_;
      fVar288 = auVar22._16_4_;
      auVar42._16_4_ = fVar288 * auVar14._16_4_;
      fVar289 = auVar22._20_4_;
      auVar42._20_4_ = fVar289 * auVar14._20_4_;
      fVar290 = auVar22._24_4_;
      auVar42._24_4_ = fVar290 * auVar14._24_4_;
      auVar42._28_4_ = auVar14._28_4_;
      auVar43._4_4_ = auVar17._4_4_ * fVar248;
      auVar43._0_4_ = auVar17._0_4_ * fVar237;
      auVar43._8_4_ = auVar17._8_4_ * fVar267;
      auVar43._12_4_ = auVar17._12_4_ * fVar206;
      auVar43._16_4_ = auVar17._16_4_ * fVar265;
      auVar43._20_4_ = auVar17._20_4_ * fVar291;
      auVar43._24_4_ = auVar17._24_4_ * fVar145;
      auVar43._28_4_ = auVar18._28_4_;
      auVar18 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar23._4_4_ * fVar254;
      auVar44._0_4_ = auVar23._0_4_ * fVar170;
      auVar44._8_4_ = auVar23._8_4_ * fVar279;
      auVar44._12_4_ = auVar23._12_4_ * fVar287;
      auVar44._16_4_ = auVar23._16_4_ * fVar288;
      auVar44._20_4_ = auVar23._20_4_ * fVar289;
      auVar44._24_4_ = auVar23._24_4_ * fVar290;
      auVar44._28_4_ = auVar14._28_4_;
      auVar45._4_4_ = auVar17._4_4_ * fVar266;
      auVar45._0_4_ = auVar17._0_4_ * fVar150;
      auVar45._8_4_ = auVar17._8_4_ * fVar165;
      auVar45._12_4_ = auVar17._12_4_ * fVar166;
      auVar45._16_4_ = auVar17._16_4_ * fVar167;
      auVar45._20_4_ = auVar17._20_4_ * fVar168;
      auVar45._24_4_ = auVar17._24_4_ * fVar169;
      auVar45._28_4_ = auVar17._28_4_;
      auVar17 = vsubps_avx(auVar45,auVar44);
      auVar217._0_4_ = auVar193._0_4_ * 0.0 + auVar17._0_4_ + auVar18._0_4_ * 0.0;
      auVar217._4_4_ = auVar193._4_4_ * 0.0 + auVar17._4_4_ + auVar18._4_4_ * 0.0;
      auVar217._8_4_ = auVar193._8_4_ * 0.0 + auVar17._8_4_ + auVar18._8_4_ * 0.0;
      auVar217._12_4_ = auVar193._12_4_ * 0.0 + auVar17._12_4_ + auVar18._12_4_ * 0.0;
      auVar217._16_4_ = auVar193._16_4_ * 0.0 + auVar17._16_4_ + auVar18._16_4_ * 0.0;
      auVar217._20_4_ = auVar193._20_4_ * 0.0 + auVar17._20_4_ + auVar18._20_4_ * 0.0;
      auVar217._24_4_ = auVar193._24_4_ * 0.0 + auVar17._24_4_ + auVar18._24_4_ * 0.0;
      auVar217._28_4_ = auVar17._28_4_ + auVar17._28_4_ + auVar18._28_4_;
      auVar18 = vmaxps_avx(auVar157,auVar217);
      auVar18 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,2);
      auVar178 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
      auVar229 = vpand_avx(auVar178,auVar229);
      auVar178 = vpmovsxwd_avx(auVar229);
      auVar191 = vpunpckhwd_avx(auVar229,auVar229);
      auVar195._16_16_ = auVar191;
      auVar195._0_16_ = auVar178;
      if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar195 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar195 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar195 >> 0x7f,0) == '\0') &&
            (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar191 >> 0x3f,0) == '\0') &&
          (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar191[0xf]
         ) {
LAB_007c834b:
        auVar198 = ZEXT3264(auVar195);
        auVar233._8_8_ = uStack_5b8;
        auVar233._0_8_ = local_5c0;
        auVar233._16_8_ = uStack_5b0;
        auVar233._24_8_ = uStack_5a8;
        auVar308 = ZEXT3264(auVar162);
        auVar286 = ZEXT3264(auVar218);
        auVar272 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar147,CONCAT420(fVar144,CONCAT416(fVar141,
                                                  CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(
                                                  fVar132,fVar117))))))));
      }
      else {
        auVar46._4_4_ = fVar248 * fVar201;
        auVar46._0_4_ = fVar237 * fVar225;
        auVar46._8_4_ = fVar267 * fVar250;
        auVar46._12_4_ = fVar206 * fVar205;
        auVar46._16_4_ = fVar265 * fVar264;
        auVar46._20_4_ = fVar291 * fVar277;
        auVar46._24_4_ = fVar145 * fVar133;
        auVar46._28_4_ = auVar191._12_4_;
        auVar303._0_4_ = fVar150 * fVar224;
        auVar303._4_4_ = fVar266 * fVar240;
        auVar303._8_4_ = fVar165 * fVar249;
        auVar303._12_4_ = fVar166 * fVar251;
        auVar303._16_4_ = fVar167 * fVar253;
        auVar303._20_4_ = fVar168 * fVar255;
        auVar303._24_4_ = fVar169 * fVar262;
        auVar303._28_4_ = 0;
        auVar18 = vsubps_avx(auVar303,auVar46);
        auVar47._4_4_ = fVar254 * fVar240;
        auVar47._0_4_ = fVar170 * fVar224;
        auVar47._8_4_ = fVar279 * fVar249;
        auVar47._12_4_ = fVar287 * fVar251;
        auVar47._16_4_ = fVar288 * fVar253;
        auVar47._20_4_ = fVar289 * fVar255;
        auVar47._24_4_ = fVar290 * fVar262;
        auVar47._28_4_ = auVar194._28_4_;
        auVar48._4_4_ = fVar248 * fVar239;
        auVar48._0_4_ = fVar237 * fVar199;
        auVar48._8_4_ = fVar267 * fVar299;
        auVar48._12_4_ = fVar206 * fVar274;
        auVar48._16_4_ = fVar265 * fVar207;
        auVar48._20_4_ = fVar291 * fVar171;
        auVar48._24_4_ = fVar145 * fVar142;
        auVar48._28_4_ = auVar20._28_4_;
        auVar23 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = fVar266 * fVar239;
        auVar49._0_4_ = fVar150 * fVar199;
        auVar49._8_4_ = fVar165 * fVar299;
        auVar49._12_4_ = fVar166 * fVar274;
        auVar49._16_4_ = fVar167 * fVar207;
        auVar49._20_4_ = fVar168 * fVar171;
        auVar49._24_4_ = fVar169 * fVar142;
        auVar49._28_4_ = auVar157._28_4_;
        auVar50._4_4_ = fVar254 * fVar201;
        auVar50._0_4_ = fVar170 * fVar225;
        auVar50._8_4_ = fVar279 * fVar250;
        auVar50._12_4_ = fVar287 * fVar205;
        auVar50._16_4_ = fVar288 * fVar264;
        auVar50._20_4_ = fVar289 * fVar277;
        auVar50._24_4_ = fVar290 * fVar133;
        auVar50._28_4_ = auVar296._28_4_;
        auVar14 = vsubps_avx(auVar50,auVar49);
        auVar260._0_4_ = auVar18._0_4_ * 0.0 + auVar14._0_4_ + auVar23._0_4_ * 0.0;
        auVar260._4_4_ = auVar18._4_4_ * 0.0 + auVar14._4_4_ + auVar23._4_4_ * 0.0;
        auVar260._8_4_ = auVar18._8_4_ * 0.0 + auVar14._8_4_ + auVar23._8_4_ * 0.0;
        auVar260._12_4_ = auVar18._12_4_ * 0.0 + auVar14._12_4_ + auVar23._12_4_ * 0.0;
        auVar260._16_4_ = auVar18._16_4_ * 0.0 + auVar14._16_4_ + auVar23._16_4_ * 0.0;
        auVar260._20_4_ = auVar18._20_4_ * 0.0 + auVar14._20_4_ + auVar23._20_4_ * 0.0;
        auVar260._24_4_ = auVar18._24_4_ * 0.0 + auVar14._24_4_ + auVar23._24_4_ * 0.0;
        auVar260._28_4_ = auVar296._28_4_ + auVar14._28_4_ + auVar157._28_4_;
        auVar17 = vrcpps_avx(auVar260);
        fVar225 = auVar17._0_4_;
        fVar199 = auVar17._4_4_;
        auVar51._4_4_ = auVar260._4_4_ * fVar199;
        auVar51._0_4_ = auVar260._0_4_ * fVar225;
        fVar237 = auVar17._8_4_;
        auVar51._8_4_ = auVar260._8_4_ * fVar237;
        fVar201 = auVar17._12_4_;
        auVar51._12_4_ = auVar260._12_4_ * fVar201;
        fVar239 = auVar17._16_4_;
        auVar51._16_4_ = auVar260._16_4_ * fVar239;
        fVar248 = auVar17._20_4_;
        auVar51._20_4_ = auVar260._20_4_ * fVar248;
        fVar250 = auVar17._24_4_;
        auVar51._24_4_ = auVar260._24_4_ * fVar250;
        auVar51._28_4_ = auVar20._28_4_;
        auVar304._8_4_ = 0x3f800000;
        auVar304._0_8_ = 0x3f8000003f800000;
        auVar304._12_4_ = 0x3f800000;
        auVar304._16_4_ = 0x3f800000;
        auVar304._20_4_ = 0x3f800000;
        auVar304._24_4_ = 0x3f800000;
        auVar304._28_4_ = 0x3f800000;
        auVar193 = vsubps_avx(auVar304,auVar51);
        fVar225 = auVar193._0_4_ * fVar225 + fVar225;
        fVar199 = auVar193._4_4_ * fVar199 + fVar199;
        fVar237 = auVar193._8_4_ * fVar237 + fVar237;
        fVar201 = auVar193._12_4_ * fVar201 + fVar201;
        fVar239 = auVar193._16_4_ * fVar239 + fVar239;
        fVar248 = auVar193._20_4_ * fVar248 + fVar248;
        fVar250 = auVar193._24_4_ * fVar250 + fVar250;
        auVar52._4_4_ =
             (auVar18._4_4_ * fVar203 + auVar23._4_4_ * fVar238 + auVar14._4_4_ * fVar134) * fVar199
        ;
        auVar52._0_4_ =
             (auVar18._0_4_ * fVar236 + auVar23._0_4_ * fVar186 + auVar14._0_4_ * fVar118) * fVar225
        ;
        auVar52._8_4_ =
             (auVar18._8_4_ * fVar300 + auVar23._8_4_ * fVar252 + auVar14._8_4_ * fVar137) * fVar237
        ;
        auVar52._12_4_ =
             (auVar18._12_4_ * fVar273 + auVar23._12_4_ * fVar263 + auVar14._12_4_ * fVar140) *
             fVar201;
        auVar52._16_4_ =
             (auVar18._16_4_ * fVar276 + auVar23._16_4_ * fVar275 + auVar14._16_4_ * fVar143) *
             fVar239;
        auVar52._20_4_ =
             (auVar18._20_4_ * fVar208 + auVar23._20_4_ * fVar278 + auVar14._20_4_ * fVar146) *
             fVar248;
        auVar52._24_4_ =
             (auVar18._24_4_ * fVar139 + auVar23._24_4_ * fVar136 + auVar14._24_4_ * fVar148) *
             fVar250;
        auVar52._28_4_ = auVar283._28_4_ + auVar21._28_4_ + auVar16._28_4_;
        auVar178 = vpermilps_avx(ZEXT416(uVar9),0);
        auVar196._16_16_ = auVar178;
        auVar196._0_16_ = auVar178;
        auVar283 = vcmpps_avx(auVar196,auVar52,2);
        uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar231._4_4_ = uVar116;
        auVar231._0_4_ = uVar116;
        auVar231._8_4_ = uVar116;
        auVar231._12_4_ = uVar116;
        auVar231._16_4_ = uVar116;
        auVar231._20_4_ = uVar116;
        auVar231._24_4_ = uVar116;
        auVar231._28_4_ = uVar116;
        auVar18 = vcmpps_avx(auVar52,auVar231,2);
        auVar283 = vandps_avx(auVar18,auVar283);
        auVar178 = vpackssdw_avx(auVar283._0_16_,auVar283._16_16_);
        auVar229 = vpand_avx(auVar229,auVar178);
        auVar178 = vpmovsxwd_avx(auVar229);
        auVar191 = vpshufd_avx(auVar229,0xee);
        auVar191 = vpmovsxwd_avx(auVar191);
        auVar195._16_16_ = auVar191;
        auVar195._0_16_ = auVar178;
        if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar195 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar195 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar195 >> 0x7f,0) == '\0') &&
              (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar191 >> 0x3f,0) == '\0') &&
            (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar191[0xf]) goto LAB_007c834b;
        auVar283 = vcmpps_avx(ZEXT832(0) << 0x20,auVar260,4);
        auVar178 = vpackssdw_avx(auVar283._0_16_,auVar283._16_16_);
        auVar229 = vpand_avx(auVar229,auVar178);
        auVar178 = vpmovsxwd_avx(auVar229);
        auVar229 = vpunpckhwd_avx(auVar229,auVar229);
        auVar198 = ZEXT1664(auVar229);
        auVar246._16_16_ = auVar229;
        auVar246._0_16_ = auVar178;
        auVar233._8_8_ = uStack_5b8;
        auVar233._0_8_ = local_5c0;
        auVar233._16_8_ = uStack_5b0;
        auVar233._24_8_ = uStack_5a8;
        auVar308 = ZEXT3264(auVar162);
        auVar286 = ZEXT3264(auVar218);
        auVar272 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar147,CONCAT420(fVar144,CONCAT416(fVar141,
                                                  CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(
                                                  fVar132,fVar117))))))));
        if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar246 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar246 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar246 >> 0x7f,0) != '\0') ||
              (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar229 >> 0x3f,0) != '\0') ||
            (auVar246 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar229[0xf] < '\0') {
          auVar197._0_4_ = fVar225 * auVar157._0_4_;
          auVar197._4_4_ = fVar199 * auVar157._4_4_;
          auVar197._8_4_ = fVar237 * auVar157._8_4_;
          auVar197._12_4_ = fVar201 * auVar157._12_4_;
          auVar197._16_4_ = fVar239 * auVar157._16_4_;
          auVar197._20_4_ = fVar248 * auVar157._20_4_;
          auVar197._24_4_ = fVar250 * auVar157._24_4_;
          auVar197._28_4_ = 0;
          auVar162._4_4_ = auVar217._4_4_ * fVar199;
          auVar162._0_4_ = auVar217._0_4_ * fVar225;
          auVar162._8_4_ = auVar217._8_4_ * fVar237;
          auVar162._12_4_ = auVar217._12_4_ * fVar201;
          auVar162._16_4_ = auVar217._16_4_ * fVar239;
          auVar162._20_4_ = auVar217._20_4_ * fVar248;
          auVar162._24_4_ = auVar217._24_4_ * fVar250;
          auVar162._28_4_ = auVar193._28_4_ + auVar17._28_4_;
          auVar232._8_4_ = 0x3f800000;
          auVar232._0_8_ = 0x3f8000003f800000;
          auVar232._12_4_ = 0x3f800000;
          auVar232._16_4_ = 0x3f800000;
          auVar232._20_4_ = 0x3f800000;
          auVar232._24_4_ = 0x3f800000;
          auVar232._28_4_ = 0x3f800000;
          auVar218 = vsubps_avx(auVar232,auVar197);
          auVar218 = vblendvps_avx(auVar218,auVar197,auVar270);
          auVar308 = ZEXT3264(auVar218);
          auVar218 = vsubps_avx(auVar232,auVar162);
          auVar198 = ZEXT3264(auVar218);
          _local_4e0 = vblendvps_avx(auVar218,auVar162,auVar270);
          auVar286 = ZEXT3264(auVar52);
          auVar233 = auVar246;
        }
      }
      auVar315 = ZEXT3264(_local_7a0);
      if ((((((((auVar233 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar233 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar233 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar233 >> 0x7f,0) == '\0') &&
            (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar233 >> 0xbf,0) == '\0') &&
          (auVar233 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar233[0x1f]) {
        pRVar106 = (RTCIntersectArguments *)0x0;
      }
      else {
        auVar218 = vsubps_avx(auVar230,auVar272._0_32_);
        fVar186 = auVar272._0_4_ + auVar308._0_4_ * auVar218._0_4_;
        fVar236 = auVar272._4_4_ + auVar308._4_4_ * auVar218._4_4_;
        fVar199 = auVar272._8_4_ + auVar308._8_4_ * auVar218._8_4_;
        fVar237 = auVar272._12_4_ + auVar308._12_4_ * auVar218._12_4_;
        fVar201 = auVar272._16_4_ + auVar308._16_4_ * auVar218._16_4_;
        fVar238 = auVar272._20_4_ + auVar308._20_4_ * auVar218._20_4_;
        fVar203 = auVar272._24_4_ + auVar308._24_4_ * auVar218._24_4_;
        fVar239 = auVar272._28_4_ + auVar218._28_4_;
        fVar225 = *(float *)((long)local_738->ray_space + k * 4 + -0x20);
        auVar218._4_4_ = (fVar236 + fVar236) * fVar225;
        auVar218._0_4_ = (fVar186 + fVar186) * fVar225;
        auVar218._8_4_ = (fVar199 + fVar199) * fVar225;
        auVar218._12_4_ = (fVar237 + fVar237) * fVar225;
        auVar218._16_4_ = (fVar201 + fVar201) * fVar225;
        auVar218._20_4_ = (fVar238 + fVar238) * fVar225;
        auVar218._24_4_ = (fVar203 + fVar203) * fVar225;
        auVar218._28_4_ = fVar239 + fVar239;
        auVar283 = auVar286._0_32_;
        auVar218 = vcmpps_avx(auVar283,auVar218,6);
        auVar162 = auVar233 & auVar218;
        auVar164 = ZEXT3264(auVar297);
        if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar162 >> 0x7f,0) == '\0') &&
              (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar162 >> 0xbf,0) == '\0') &&
            (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar162[0x1f]) {
          pRVar106 = (RTCIntersectArguments *)0x0;
        }
        else {
          local_380 = vandps_avx(auVar218,auVar233);
          local_420._0_4_ = (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0;
          local_420._4_4_ = (float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0;
          fStack_418 = (float)uStack_4d8 + (float)uStack_4d8 + -1.0;
          fStack_414 = uStack_4d8._4_4_ + uStack_4d8._4_4_ + -1.0;
          fStack_410 = (float)uStack_4d0 + (float)uStack_4d0 + -1.0;
          fStack_40c = uStack_4d0._4_4_ + uStack_4d0._4_4_ + -1.0;
          fStack_408 = (float)uStack_4c8 + (float)uStack_4c8 + -1.0;
          fStack_404 = uStack_4c8._4_4_ + uStack_4c8._4_4_ + -1.0;
          local_6c0 = auVar308._0_32_;
          local_3e0 = 0;
          local_3d0 = local_930;
          fStack_3cc = fStack_92c;
          fStack_3c8 = fStack_928;
          fStack_3c4 = fStack_924;
          local_3c0 = local_760;
          uStack_3b8 = uStack_758;
          local_3b0 = local_690;
          uStack_3a8 = uStack_688;
          local_3a0 = local_6a0;
          uStack_398 = uStack_698;
          local_4e0._4_4_ = local_420._4_4_;
          local_4e0._0_4_ = local_420._0_4_;
          uStack_4d8._0_4_ = fStack_418;
          uStack_4d8._4_4_ = fStack_414;
          uStack_4d0._0_4_ = fStack_410;
          uStack_4d0._4_4_ = fStack_40c;
          auVar155 = _local_4e0;
          uStack_4c8._0_4_ = fStack_408;
          uStack_4c8._4_4_ = fStack_404;
          auVar218 = _local_4e0;
          if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            pRVar106 = (RTCIntersectArguments *)0x0;
          }
          else {
            pRVar106 = context->args;
            if ((pRVar106->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar106 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar106 >> 8),1),
               pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar175._0_4_ = 1.0 / auVar214._0_4_;
              auVar175._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar229 = vshufps_avx(auVar175,auVar175,0);
              local_360[0] = auVar229._0_4_ * (auVar308._0_4_ + 0.0);
              local_360[1] = auVar229._4_4_ * (auVar308._4_4_ + 1.0);
              local_360[2] = auVar229._8_4_ * (auVar308._8_4_ + 2.0);
              local_360[3] = auVar229._12_4_ * (auVar308._12_4_ + 3.0);
              fStack_350 = auVar229._0_4_ * (auVar308._16_4_ + 4.0);
              fStack_34c = auVar229._4_4_ * (auVar308._20_4_ + 5.0);
              fStack_348 = auVar229._8_4_ * (auVar308._24_4_ + 6.0);
              fStack_344 = auVar308._28_4_ + 7.0;
              uStack_4d0 = auVar155._16_8_;
              uStack_4c8 = auVar218._24_8_;
              local_340 = local_4e0;
              uStack_338 = uStack_4d8;
              uStack_330 = uStack_4d0;
              uStack_328 = uStack_4c8;
              local_320 = auVar283;
              uStack_8fc = (undefined4)((ulong)pRVar106 >> 0x20);
              local_900 = vmovmskps_avx(local_380);
              local_8a0 = 0;
              if (CONCAT44(uStack_8fc,local_900) != 0) {
                for (; (CONCAT44(uStack_8fc,local_900) >> local_8a0 & 1) == 0;
                    local_8a0 = local_8a0 + 1) {
                }
              }
              auVar229 = vpshufd_avx(ZEXT416(uVar110),0);
              local_600._16_16_ = auVar229;
              local_600._0_16_ = auVar229;
              auVar229 = vpermilps_avx(ZEXT416(*(uint *)(prim + lVar114 * 4 + 6)),0);
              register0x00001210 = auVar229;
              _local_780 = auVar229;
              _local_7c0 = auVar297;
              _local_620 = auVar302;
              _local_4e0 = auVar218;
              local_440 = local_6c0;
              local_400 = auVar283;
              local_3dc = uVar11;
              while( true ) {
                auVar297 = auVar164._0_32_;
                if (CONCAT44(uStack_8fc,local_900) == 0) break;
                uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_200 = local_360[local_8a0];
                local_1e0 = *(undefined4 *)((long)&local_340 + local_8a0 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + local_8a0 * 4);
                fVar186 = 1.0 - local_200;
                fVar225 = local_200 * fVar186 * 4.0;
                auVar229 = ZEXT416((uint)(local_200 * local_200 * 0.5));
                auVar229 = vshufps_avx(auVar229,auVar229,0);
                auVar178 = ZEXT416((uint)((fVar186 * fVar186 + fVar225) * 0.5));
                auVar178 = vshufps_avx(auVar178,auVar178,0);
                auVar191 = ZEXT416((uint)((-local_200 * local_200 - fVar225) * 0.5));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                fVar225 = auVar191._0_4_ * (float)local_760._0_4_;
                fVar236 = auVar191._4_4_ * (float)local_760._4_4_;
                fVar199 = auVar191._8_4_ * (float)uStack_758;
                fVar237 = auVar191._12_4_ * uStack_758._4_4_;
                local_730.context = context->user;
                auVar191 = ZEXT416((uint)(fVar186 * -fVar186 * 0.5));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar176._0_4_ =
                     local_930 * auVar191._0_4_ +
                     fVar225 + auVar229._0_4_ * (float)local_6a0._0_4_ +
                               auVar178._0_4_ * (float)local_690._0_4_;
                auVar176._4_4_ =
                     fStack_92c * auVar191._4_4_ +
                     fVar236 + auVar229._4_4_ * (float)local_6a0._4_4_ +
                               auVar178._4_4_ * (float)local_690._4_4_;
                auVar176._8_4_ =
                     fStack_928 * auVar191._8_4_ +
                     fVar199 + auVar229._8_4_ * (float)uStack_698 +
                               auVar178._8_4_ * (float)uStack_688;
                auVar176._12_4_ =
                     fStack_924 * auVar191._12_4_ +
                     fVar237 + auVar229._12_4_ * uStack_698._4_4_ +
                               auVar178._12_4_ * uStack_688._4_4_;
                local_250 = vshufps_avx(auVar176,auVar176,0);
                local_260[0] = (RTCHitN)local_250[0];
                local_260[1] = (RTCHitN)local_250[1];
                local_260[2] = (RTCHitN)local_250[2];
                local_260[3] = (RTCHitN)local_250[3];
                local_260[4] = (RTCHitN)local_250[4];
                local_260[5] = (RTCHitN)local_250[5];
                local_260[6] = (RTCHitN)local_250[6];
                local_260[7] = (RTCHitN)local_250[7];
                local_260[8] = (RTCHitN)local_250[8];
                local_260[9] = (RTCHitN)local_250[9];
                local_260[10] = (RTCHitN)local_250[10];
                local_260[0xb] = (RTCHitN)local_250[0xb];
                local_260[0xc] = (RTCHitN)local_250[0xc];
                local_260[0xd] = (RTCHitN)local_250[0xd];
                local_260[0xe] = (RTCHitN)local_250[0xe];
                local_260[0xf] = (RTCHitN)local_250[0xf];
                local_230 = vshufps_avx(auVar176,auVar176,0x55);
                local_240 = local_230;
                local_210 = vshufps_avx(auVar176,auVar176,0xaa);
                local_220 = local_210;
                fStack_1fc = local_200;
                fStack_1f8 = local_200;
                fStack_1f4 = local_200;
                fStack_1f0 = local_200;
                fStack_1ec = local_200;
                fStack_1e8 = local_200;
                fStack_1e4 = local_200;
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = local_780;
                uStack_1b8 = uStack_778;
                uStack_1b0 = uStack_770;
                uStack_1a8 = uStack_768;
                local_1a0 = local_600._0_8_;
                uStack_198 = local_600._8_8_;
                uStack_190 = local_600._16_8_;
                uStack_188 = local_600._24_8_;
                auVar218 = ZEXT1632(CONCAT412(fVar237,CONCAT48(fVar199,CONCAT44(fVar236,fVar225))));
                auVar218 = vcmpps_avx(auVar218,auVar218,0xf);
                local_740[1] = auVar218;
                *local_740 = auVar218;
                local_180 = (local_730.context)->instID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = (local_730.context)->instPrimID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_7e0 = *local_748;
                local_7d0 = *local_750;
                local_730.valid = (int *)local_7e0;
                local_730.geometryUserPtr = pGVar12->userPtr;
                local_730.hit = local_260;
                local_730.N = 8;
                local_730.ray = (RTCRayN *)ray;
                if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar218 = ZEXT1632(auVar218._0_16_);
                  auVar272 = ZEXT1664(auVar272._0_16_);
                  (*pGVar12->occlusionFilterN)(&local_730);
                  auVar315 = ZEXT3264(_local_7a0);
                  auVar286 = ZEXT3264(auVar283);
                  auVar308 = ZEXT3264(local_6c0);
                  auVar218 = vcmpps_avx(auVar218,auVar218,0xf);
                }
                auVar229 = vpcmpeqd_avx(local_7e0,ZEXT816(0) << 0x40);
                auVar178 = vpcmpeqd_avx(local_7d0,ZEXT816(0) << 0x40);
                auVar198 = ZEXT1664(auVar178);
                auVar181._16_16_ = auVar178;
                auVar181._0_16_ = auVar229;
                auVar162 = auVar218 & ~auVar181;
                if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar162 >> 0x7f,0) == '\0') &&
                      (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar162 >> 0xbf,0) == '\0') &&
                    (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar162[0x1f]) {
                  auVar127._0_4_ = auVar229._0_4_ ^ auVar218._0_4_;
                  auVar127._4_4_ = auVar229._4_4_ ^ auVar218._4_4_;
                  auVar127._8_4_ = auVar229._8_4_ ^ auVar218._8_4_;
                  auVar127._12_4_ = auVar229._12_4_ ^ auVar218._12_4_;
                  auVar127._16_4_ = auVar178._0_4_ ^ auVar218._16_4_;
                  auVar127._20_4_ = auVar178._4_4_ ^ auVar218._20_4_;
                  auVar127._24_4_ = auVar178._8_4_ ^ auVar218._24_4_;
                  auVar127._28_4_ = auVar178._12_4_ ^ auVar218._28_4_;
                  auVar164 = ZEXT3264(_local_7c0);
                }
                else {
                  auVar218 = vcmpps_avx(ZEXT1632(auVar178),ZEXT1632(auVar178),0xf);
                  auVar198 = ZEXT3264(auVar218);
                  p_Var13 = context->args->filter;
                  if (p_Var13 == (RTCFilterFunctionN)0x0) {
                    auVar164 = ZEXT3264(_local_7c0);
                  }
                  else {
                    auVar164 = ZEXT3264(_local_7c0);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                      auVar218 = ZEXT1632(auVar218._0_16_);
                      auVar272 = ZEXT1664(auVar272._0_16_);
                      (*p_Var13)(&local_730);
                      auVar164 = ZEXT3264(_local_7c0);
                      auVar315 = ZEXT3264(_local_7a0);
                      auVar286 = ZEXT3264(auVar283);
                      auVar308 = ZEXT3264(local_6c0);
                      auVar218 = vcmpps_avx(auVar218,auVar218,0xf);
                      auVar198 = ZEXT3264(auVar218);
                    }
                  }
                  auVar229 = vpcmpeqd_avx(local_7e0,ZEXT816(0) << 0x40);
                  auVar178 = vpcmpeqd_avx(local_7d0,ZEXT816(0) << 0x40);
                  auVar158._16_16_ = auVar178;
                  auVar158._0_16_ = auVar229;
                  auVar127._0_4_ = auVar229._0_4_ ^ auVar198._0_4_;
                  auVar127._4_4_ = auVar229._4_4_ ^ auVar198._4_4_;
                  auVar127._8_4_ = auVar229._8_4_ ^ auVar198._8_4_;
                  auVar127._12_4_ = auVar229._12_4_ ^ auVar198._12_4_;
                  auVar127._16_4_ = auVar178._0_4_ ^ auVar198._16_4_;
                  auVar127._20_4_ = auVar178._4_4_ ^ auVar198._20_4_;
                  auVar127._24_4_ = auVar178._8_4_ ^ auVar198._24_4_;
                  auVar127._28_4_ = auVar178._12_4_ ^ auVar198._28_4_;
                  auVar182._8_4_ = 0xff800000;
                  auVar182._0_8_ = 0xff800000ff800000;
                  auVar182._12_4_ = 0xff800000;
                  auVar182._16_4_ = 0xff800000;
                  auVar182._20_4_ = 0xff800000;
                  auVar182._24_4_ = 0xff800000;
                  auVar182._28_4_ = 0xff800000;
                  auVar218 = vblendvps_avx(auVar182,*(undefined1 (*) [32])(local_730.ray + 0x100),
                                           auVar158);
                  *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar218;
                }
                auVar297 = auVar164._0_32_;
                if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar127 >> 0x7f,0) != '\0') ||
                      (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar127 >> 0xbf,0) != '\0') ||
                    (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar127[0x1f] < '\0') {
                  pRVar106 = (RTCIntersectArguments *)0x1;
                  goto LAB_007c73c3;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar116;
                uVar111 = CONCAT44(uStack_8fc,local_900) ^ 1L << (local_8a0 & 0x3f);
                local_900 = (undefined4)uVar111;
                uStack_8fc = (undefined4)(uVar111 >> 0x20);
                local_8a0 = 0;
                if (uVar111 != 0) {
                  for (; (uVar111 >> local_8a0 & 1) == 0; local_8a0 = local_8a0 + 1) {
                  }
                }
              }
              pRVar106 = (RTCIntersectArguments *)0x0;
            }
          }
        }
      }
    }
LAB_007c73c3:
    auVar329 = ZEXT3264(auVar215);
    auVar164 = ZEXT1664(auVar269);
    auVar261 = ZEXT3264(_local_6e0);
    if (8 < (int)uVar11) {
      _local_680 = vpshufd_avx(ZEXT416(uVar11),0);
      auVar229 = vshufps_avx(auVar269,auVar269,0);
      local_4c0._16_16_ = auVar229;
      local_4c0._0_16_ = auVar229;
      auVar229 = vpermilps_avx(ZEXT416(uVar9),0);
      local_100._16_16_ = auVar229;
      local_100._0_16_ = auVar229;
      auVar123._0_4_ = 1.0 / (float)local_560._0_4_;
      auVar123._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar229 = vshufps_avx(auVar123,auVar123,0);
      register0x00001210 = auVar229;
      _local_140 = auVar229;
      auVar229 = vpshufd_avx(ZEXT416(uVar110),0);
      local_560._16_16_ = auVar229;
      local_560._0_16_ = auVar229;
      auVar229 = vpermilps_avx(local_700._0_16_,0);
      local_120._16_16_ = auVar229;
      local_120._0_16_ = auVar229;
      pRVar106 = (RTCIntersectArguments *)((ulong)pRVar106 & 0xffffffff);
      local_6c0 = auVar308._0_32_;
      auVar218 = auVar286._0_32_;
      _local_7a0 = auVar315._0_32_;
      _local_7c0 = auVar297;
      for (lVar114 = 8; lVar114 < local_5d0; lVar114 = lVar114 + 8) {
        pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar114 * 4 + lVar115);
        fVar186 = *(float *)*pauVar1;
        fVar236 = *(float *)(*pauVar1 + 4);
        fVar199 = *(float *)(*pauVar1 + 8);
        fVar237 = *(float *)(*pauVar1 + 0xc);
        fVar201 = *(float *)(*pauVar1 + 0x10);
        fVar238 = *(float *)(*pauVar1 + 0x14);
        fVar203 = *(float *)(*pauVar1 + 0x18);
        auVar103 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar115 + 0x21fffac + lVar114 * 4);
        fVar239 = *(float *)*pauVar1;
        fVar248 = *(float *)(*pauVar1 + 4);
        fVar250 = *(float *)(*pauVar1 + 8);
        fVar252 = *(float *)(*pauVar1 + 0xc);
        fVar300 = *(float *)(*pauVar1 + 0x10);
        fVar299 = *(float *)(*pauVar1 + 0x14);
        fVar267 = *(float *)(*pauVar1 + 0x18);
        auVar102 = *pauVar1;
        pauVar3 = (undefined1 (*) [28])(lVar115 + 0x2200430 + lVar114 * 4);
        fVar205 = *(float *)*pauVar3;
        fVar263 = *(float *)(*pauVar3 + 4);
        fVar273 = *(float *)(*pauVar3 + 8);
        fVar274 = *(float *)(*pauVar3 + 0xc);
        fVar206 = *(float *)(*pauVar3 + 0x10);
        fVar264 = *(float *)(*pauVar3 + 0x14);
        fVar275 = *(float *)(*pauVar3 + 0x18);
        auVar101 = *pauVar3;
        pfVar4 = (float *)(lVar115 + 0x22008b4 + lVar114 * 4);
        fVar276 = *pfVar4;
        fVar207 = pfVar4[1];
        fVar265 = pfVar4[2];
        fVar277 = pfVar4[3];
        fVar278 = pfVar4[4];
        fVar208 = pfVar4[5];
        fVar171 = pfVar4[6];
        fVar225 = auVar198._28_4_;
        fVar291 = auVar272._28_4_;
        fVar224 = auVar329._0_4_;
        fVar240 = auVar329._4_4_;
        fVar249 = auVar329._8_4_;
        fVar251 = auVar329._12_4_;
        fVar253 = auVar329._16_4_;
        fVar255 = auVar329._20_4_;
        fVar262 = auVar329._24_4_;
        auVar272 = ZEXT3264(local_280);
        fVar141 = local_280._0_4_;
        fVar144 = local_280._4_4_;
        fVar147 = local_280._8_4_;
        fVar149 = local_280._12_4_;
        fVar150 = local_280._16_4_;
        fVar266 = local_280._20_4_;
        fVar165 = local_280._24_4_;
        local_600._0_4_ =
             fVar186 * (float)local_4a0._0_4_ +
             (float)local_540._0_4_ * fVar276 + (float)local_520._0_4_ * fVar205 + fVar141 * fVar239
        ;
        local_600._4_4_ =
             fVar236 * (float)local_4a0._4_4_ +
             (float)local_540._4_4_ * fVar207 + (float)local_520._4_4_ * fVar263 + fVar144 * fVar248
        ;
        local_600._8_4_ =
             fVar199 * fStack_498 + fStack_538 * fVar265 + fStack_518 * fVar273 + fVar147 * fVar250;
        local_600._12_4_ =
             fVar237 * fStack_494 + fStack_534 * fVar277 + fStack_514 * fVar274 + fVar149 * fVar252;
        local_600._16_4_ =
             fVar201 * fStack_490 + fStack_530 * fVar278 + fStack_510 * fVar206 + fVar150 * fVar300;
        local_600._20_4_ =
             fVar238 * fStack_48c + fStack_52c * fVar208 + fStack_50c * fVar264 + fVar266 * fVar299;
        local_600._24_4_ =
             fVar203 * fStack_488 + fStack_528 * fVar171 + fStack_508 * fVar275 + fVar165 * fVar267;
        local_600._28_4_ = fVar225 + pfVar4[7] + fVar291 + fVar225 + fVar225;
        auVar159._0_4_ =
             fVar186 * fVar187 +
             auVar315._0_4_ * fVar239 + fVar224 * fVar205 + auVar261._0_4_ * fVar276;
        auVar159._4_4_ =
             fVar236 * fVar200 +
             auVar315._4_4_ * fVar248 + fVar240 * fVar263 + auVar261._4_4_ * fVar207;
        auVar159._8_4_ =
             fVar199 * fVar202 +
             auVar315._8_4_ * fVar250 + fVar249 * fVar273 + auVar261._8_4_ * fVar265;
        auVar159._12_4_ =
             fVar237 * fVar204 +
             auVar315._12_4_ * fVar252 + fVar251 * fVar274 + auVar261._12_4_ * fVar277;
        auVar159._16_4_ =
             fVar201 * fVar187 +
             auVar315._16_4_ * fVar300 + fVar253 * fVar206 + auVar261._16_4_ * fVar278;
        auVar159._20_4_ =
             fVar238 * fVar200 +
             auVar315._20_4_ * fVar299 + fVar255 * fVar264 + auVar261._20_4_ * fVar208;
        auVar159._24_4_ =
             fVar203 * fVar202 +
             auVar315._24_4_ * fVar267 + fVar262 * fVar275 + auVar261._24_4_ * fVar171;
        auVar159._28_4_ = *(float *)pauVar1[1] + fVar225 + fVar225 + auVar164._28_4_;
        auVar164 = ZEXT3264(auVar159);
        fVar118 = (float)local_a0._0_4_ * fVar239 +
                  (float)local_80._0_4_ * fVar205 + fVar276 * (float)local_2a0._0_4_ +
                  fVar186 * (float)local_c0._0_4_;
        fVar134 = (float)local_a0._4_4_ * fVar248 +
                  (float)local_80._4_4_ * fVar263 + fVar207 * (float)local_2a0._4_4_ +
                  fVar236 * (float)local_c0._4_4_;
        fVar137 = fStack_98 * fVar250 + fStack_78 * fVar273 + fVar265 * fStack_298 +
                  fVar199 * fStack_b8;
        fVar140 = fStack_94 * fVar252 + fStack_74 * fVar274 + fVar277 * fStack_294 +
                  fVar237 * fStack_b4;
        fVar143 = fStack_90 * fVar300 + fStack_70 * fVar206 + fVar278 * fStack_290 +
                  fVar201 * fStack_b0;
        fVar146 = fStack_8c * fVar299 + fStack_6c * fVar264 + fVar208 * fStack_28c +
                  fVar238 * fStack_ac;
        fVar148 = fStack_88 * fVar267 + fStack_68 * fVar275 + fVar171 * fStack_288 +
                  fVar203 * fStack_a8;
        fVar117 = fVar225 + fVar225 + pfVar4[7] + *(float *)pauVar1[1];
        pfVar4 = (float *)(bspline_basis1 + lVar114 * 4 + lVar115);
        fVar203 = *pfVar4;
        fVar239 = pfVar4[1];
        fVar248 = pfVar4[2];
        fVar250 = pfVar4[3];
        fVar252 = pfVar4[4];
        fVar300 = pfVar4[5];
        fVar299 = pfVar4[6];
        pfVar5 = (float *)(lVar115 + 0x22023cc + lVar114 * 4);
        fVar267 = *pfVar5;
        fVar205 = pfVar5[1];
        fVar263 = pfVar5[2];
        fVar273 = pfVar5[3];
        fVar274 = pfVar5[4];
        fVar206 = pfVar5[5];
        fVar264 = pfVar5[6];
        pfVar6 = (float *)(lVar115 + 0x2202850 + lVar114 * 4);
        fVar275 = *pfVar6;
        fVar291 = pfVar6[1];
        fVar133 = pfVar6[2];
        fVar136 = pfVar6[3];
        fVar139 = pfVar6[4];
        fVar142 = pfVar6[5];
        fVar145 = pfVar6[6];
        pauVar1 = (undefined1 (*) [28])(lVar115 + 0x2202cd4 + lVar114 * 4);
        fVar225 = *(float *)*pauVar1;
        fVar186 = *(float *)(*pauVar1 + 4);
        fVar236 = *(float *)(*pauVar1 + 8);
        fVar199 = *(float *)(*pauVar1 + 0xc);
        fVar237 = *(float *)(*pauVar1 + 0x10);
        fVar201 = *(float *)(*pauVar1 + 0x14);
        fVar238 = *(float *)(*pauVar1 + 0x18);
        auVar104 = *pauVar1;
        fVar138 = auVar261._28_4_;
        fVar135 = fVar138 + *(float *)pauVar1[1];
        fVar132 = fVar138 + fVar138 + fStack_524;
        local_700._0_4_ =
             (float)local_4a0._0_4_ * fVar203 +
             fVar141 * fVar267 + (float)local_520._0_4_ * fVar275 + (float)local_540._0_4_ * fVar225
        ;
        local_700._4_4_ =
             (float)local_4a0._4_4_ * fVar239 +
             fVar144 * fVar205 + (float)local_520._4_4_ * fVar291 + (float)local_540._4_4_ * fVar186
        ;
        local_700._8_4_ =
             fStack_498 * fVar248 + fVar147 * fVar263 + fStack_518 * fVar133 + fStack_538 * fVar236;
        local_700._12_4_ =
             fStack_494 * fVar250 + fVar149 * fVar273 + fStack_514 * fVar136 + fStack_534 * fVar199;
        local_700._16_4_ =
             fStack_490 * fVar252 + fVar150 * fVar274 + fStack_510 * fVar139 + fStack_530 * fVar237;
        local_700._20_4_ =
             fStack_48c * fVar300 + fVar266 * fVar206 + fStack_50c * fVar142 + fStack_52c * fVar201;
        local_700._24_4_ =
             fStack_488 * fVar299 + fVar165 * fVar264 + fStack_508 * fVar145 + fStack_528 * fVar238;
        local_700._28_4_ = fVar135 + fVar132;
        auVar234._0_4_ =
             fVar187 * fVar203 +
             auVar315._0_4_ * fVar267 + fVar275 * fVar224 + auVar261._0_4_ * fVar225;
        auVar234._4_4_ =
             fVar200 * fVar239 +
             auVar315._4_4_ * fVar205 + fVar291 * fVar240 + auVar261._4_4_ * fVar186;
        auVar234._8_4_ =
             fVar202 * fVar248 +
             auVar315._8_4_ * fVar263 + fVar133 * fVar249 + auVar261._8_4_ * fVar236;
        auVar234._12_4_ =
             fVar204 * fVar250 +
             auVar315._12_4_ * fVar273 + fVar136 * fVar251 + auVar261._12_4_ * fVar199;
        auVar234._16_4_ =
             fVar187 * fVar252 +
             auVar315._16_4_ * fVar274 + fVar139 * fVar253 + auVar261._16_4_ * fVar237;
        auVar234._20_4_ =
             fVar200 * fVar300 +
             auVar315._20_4_ * fVar206 + fVar142 * fVar255 + auVar261._20_4_ * fVar201;
        auVar234._24_4_ =
             fVar202 * fVar299 +
             auVar315._24_4_ * fVar264 + fVar145 * fVar262 + auVar261._24_4_ * fVar238;
        auVar234._28_4_ = fVar132 + fVar138 + fVar138 + fVar204;
        auVar183._0_4_ =
             (float)local_a0._0_4_ * fVar267 +
             (float)local_80._0_4_ * fVar275 + fVar225 * (float)local_2a0._0_4_ +
             fVar203 * (float)local_c0._0_4_;
        auVar183._4_4_ =
             (float)local_a0._4_4_ * fVar205 +
             (float)local_80._4_4_ * fVar291 + fVar186 * (float)local_2a0._4_4_ +
             fVar239 * (float)local_c0._4_4_;
        auVar183._8_4_ =
             fStack_98 * fVar263 + fStack_78 * fVar133 + fVar236 * fStack_298 + fVar248 * fStack_b8;
        auVar183._12_4_ =
             fStack_94 * fVar273 + fStack_74 * fVar136 + fVar199 * fStack_294 + fVar250 * fStack_b4;
        auVar183._16_4_ =
             fStack_90 * fVar274 + fStack_70 * fVar139 + fVar237 * fStack_290 + fVar252 * fStack_b0;
        auVar183._20_4_ =
             fStack_8c * fVar206 + fStack_6c * fVar142 + fVar201 * fStack_28c + fVar300 * fStack_ac;
        auVar183._24_4_ =
             fStack_88 * fVar264 + fStack_68 * fVar145 + fVar238 * fStack_288 + fVar299 * fStack_a8;
        auVar183._28_4_ = fVar138 + fVar135 + fVar132;
        auVar283 = vsubps_avx(local_700,local_600);
        auVar18 = vsubps_avx(auVar234,auVar159);
        fVar225 = auVar283._0_4_;
        fVar186 = auVar283._4_4_;
        auVar53._4_4_ = auVar159._4_4_ * fVar186;
        auVar53._0_4_ = auVar159._0_4_ * fVar225;
        fVar236 = auVar283._8_4_;
        auVar53._8_4_ = auVar159._8_4_ * fVar236;
        fVar199 = auVar283._12_4_;
        auVar53._12_4_ = auVar159._12_4_ * fVar199;
        fVar237 = auVar283._16_4_;
        auVar53._16_4_ = auVar159._16_4_ * fVar237;
        fVar201 = auVar283._20_4_;
        auVar53._20_4_ = auVar159._20_4_ * fVar201;
        fVar238 = auVar283._24_4_;
        auVar53._24_4_ = auVar159._24_4_ * fVar238;
        auVar53._28_4_ = fVar132;
        fVar132 = auVar18._0_4_;
        fVar135 = auVar18._4_4_;
        auVar54._4_4_ = fVar135 * local_600._4_4_;
        auVar54._0_4_ = fVar132 * local_600._0_4_;
        fVar138 = auVar18._8_4_;
        auVar54._8_4_ = fVar138 * local_600._8_4_;
        fVar166 = auVar18._12_4_;
        auVar54._12_4_ = fVar166 * local_600._12_4_;
        fVar167 = auVar18._16_4_;
        auVar54._16_4_ = fVar167 * local_600._16_4_;
        fVar168 = auVar18._20_4_;
        auVar54._20_4_ = fVar168 * local_600._20_4_;
        fVar169 = auVar18._24_4_;
        auVar54._24_4_ = fVar169 * local_600._24_4_;
        auVar54._28_4_ = auVar234._28_4_;
        auVar16 = vsubps_avx(auVar53,auVar54);
        auVar98._4_4_ = fVar134;
        auVar98._0_4_ = fVar118;
        auVar98._8_4_ = fVar137;
        auVar98._12_4_ = fVar140;
        auVar98._16_4_ = fVar143;
        auVar98._20_4_ = fVar146;
        auVar98._24_4_ = fVar148;
        auVar98._28_4_ = fVar117;
        auVar198 = ZEXT3264(auVar98);
        auVar162 = vmaxps_avx(auVar98,auVar183);
        auVar55._4_4_ = auVar162._4_4_ * auVar162._4_4_ * (fVar186 * fVar186 + fVar135 * fVar135);
        auVar55._0_4_ = auVar162._0_4_ * auVar162._0_4_ * (fVar225 * fVar225 + fVar132 * fVar132);
        auVar55._8_4_ = auVar162._8_4_ * auVar162._8_4_ * (fVar236 * fVar236 + fVar138 * fVar138);
        auVar55._12_4_ = auVar162._12_4_ * auVar162._12_4_ * (fVar199 * fVar199 + fVar166 * fVar166)
        ;
        auVar55._16_4_ = auVar162._16_4_ * auVar162._16_4_ * (fVar237 * fVar237 + fVar167 * fVar167)
        ;
        auVar55._20_4_ = auVar162._20_4_ * auVar162._20_4_ * (fVar201 * fVar201 + fVar168 * fVar168)
        ;
        auVar55._24_4_ = auVar162._24_4_ * auVar162._24_4_ * (fVar238 * fVar238 + fVar169 * fVar169)
        ;
        auVar55._28_4_ = local_700._28_4_ + auVar234._28_4_;
        auVar56._4_4_ = auVar16._4_4_ * auVar16._4_4_;
        auVar56._0_4_ = auVar16._0_4_ * auVar16._0_4_;
        auVar56._8_4_ = auVar16._8_4_ * auVar16._8_4_;
        auVar56._12_4_ = auVar16._12_4_ * auVar16._12_4_;
        auVar56._16_4_ = auVar16._16_4_ * auVar16._16_4_;
        auVar56._20_4_ = auVar16._20_4_ * auVar16._20_4_;
        auVar56._24_4_ = auVar16._24_4_ * auVar16._24_4_;
        auVar56._28_4_ = auVar16._28_4_;
        _local_580 = vcmpps_avx(auVar56,auVar55,2);
        local_3e0 = (uint)lVar114;
        auVar178 = vpshufd_avx(ZEXT416(local_3e0),0);
        auVar229 = vpor_avx(auVar178,_DAT_01f4ad30);
        auVar178 = vpor_avx(auVar178,_DAT_01f7afa0);
        auVar229 = vpcmpgtd_avx(_local_680,auVar229);
        auVar178 = vpcmpgtd_avx(_local_680,auVar178);
        register0x00001290 = auVar178;
        _local_5a0 = auVar229;
        auVar162 = _local_5a0 & _local_580;
        if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar162 >> 0x7f,0) == '\0') &&
              (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar162 >> 0xbf,0) == '\0') &&
            (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar162[0x1f]) {
          auVar261 = ZEXT3264(_local_6e0);
          auVar329 = ZEXT3264(auVar329._0_32_);
          auVar315 = ZEXT3264(_local_7a0);
        }
        else {
          local_660._0_4_ = auVar104._0_4_;
          local_660._4_4_ = auVar104._4_4_;
          fStack_658 = auVar104._8_4_;
          fStack_654 = auVar104._12_4_;
          fStack_650 = auVar104._16_4_;
          fStack_64c = auVar104._20_4_;
          fStack_648 = auVar104._24_4_;
          local_660._0_4_ =
               fVar203 * (float)local_2c0._0_4_ +
               fVar267 * (float)local_e0._0_4_ +
               fVar275 * (float)local_480._0_4_ + (float)local_7c0._0_4_ * (float)local_660._0_4_;
          local_660._4_4_ =
               fVar239 * (float)local_2c0._4_4_ +
               fVar205 * (float)local_e0._4_4_ +
               fVar291 * (float)local_480._4_4_ + (float)local_7c0._4_4_ * (float)local_660._4_4_;
          fStack_658 = fVar248 * fStack_2b8 +
                       fVar263 * fStack_d8 + fVar133 * fStack_478 + fStack_7b8 * fStack_658;
          fStack_654 = fVar250 * fStack_2b4 +
                       fVar273 * fStack_d4 + fVar136 * fStack_474 + fStack_7b4 * fStack_654;
          fStack_650 = fVar252 * fStack_2b0 +
                       fVar274 * fStack_d0 + fVar139 * fStack_470 + fStack_7b0 * fStack_650;
          fStack_64c = fVar300 * fStack_2ac +
                       fVar206 * fStack_cc + fVar142 * fStack_46c + fStack_7ac * fStack_64c;
          fStack_648 = fVar299 * fStack_2a8 +
                       fVar264 * fStack_c8 + fVar145 * fStack_468 + fStack_7a8 * fStack_648;
          fStack_644 = pfVar4[7] + auVar329._28_4_ + auVar159._28_4_ + 0.0;
          local_780._0_4_ = auVar102._0_4_;
          local_780._4_4_ = auVar102._4_4_;
          uStack_778._0_4_ = auVar102._8_4_;
          uStack_778._4_4_ = auVar102._12_4_;
          uStack_770._0_4_ = auVar102._16_4_;
          uStack_770._4_4_ = auVar102._20_4_;
          uStack_768._0_4_ = auVar102._24_4_;
          local_620._0_4_ = auVar101._0_4_;
          local_620._4_4_ = auVar101._4_4_;
          fStack_618 = auVar101._8_4_;
          fStack_614 = auVar101._12_4_;
          fStack_610 = auVar101._16_4_;
          fStack_60c = auVar101._20_4_;
          fStack_608 = auVar101._24_4_;
          fVar135 = (float)local_480._0_4_ * (float)local_620._0_4_;
          fVar138 = (float)local_480._4_4_ * (float)local_620._4_4_;
          fVar166 = fStack_478 * fStack_618;
          fVar167 = fStack_474 * fStack_614;
          fVar168 = fStack_470 * fStack_610;
          fVar169 = fStack_46c * fStack_60c;
          fVar170 = fStack_468 * fStack_608;
          pfVar4 = (float *)(lVar115 + 0x2201640 + lVar114 * 4);
          fVar225 = *pfVar4;
          fVar186 = pfVar4[1];
          fVar236 = pfVar4[2];
          fVar199 = pfVar4[3];
          fVar237 = pfVar4[4];
          fVar201 = pfVar4[5];
          fVar238 = pfVar4[6];
          pfVar7 = (float *)(lVar115 + 0x2201ac4 + lVar114 * 4);
          fVar203 = *pfVar7;
          fVar239 = pfVar7[1];
          fVar248 = pfVar7[2];
          fVar250 = pfVar7[3];
          fVar252 = pfVar7[4];
          fVar300 = pfVar7[5];
          fVar299 = pfVar7[6];
          fVar254 = pfVar5[7] + 0.0;
          pfVar8 = (float *)(lVar115 + 0x22011bc + lVar114 * 4);
          fVar267 = *pfVar8;
          fVar205 = pfVar8[1];
          fVar263 = pfVar8[2];
          fVar273 = pfVar8[3];
          fVar274 = pfVar8[4];
          fVar206 = pfVar8[5];
          fVar264 = pfVar8[6];
          fVar132 = pfVar4[7] + pfVar7[7];
          fStack_624 = pfVar7[7] + fVar254;
          fVar254 = pfVar5[7] + pfVar6[7] + fVar254;
          pfVar4 = (float *)(lVar115 + 0x2200d38 + lVar114 * 4);
          fVar275 = *pfVar4;
          fVar291 = pfVar4[1];
          fVar133 = pfVar4[2];
          fVar136 = pfVar4[3];
          fVar139 = pfVar4[4];
          fVar142 = pfVar4[5];
          fVar145 = pfVar4[6];
          local_620._4_4_ =
               (float)local_4a0._4_4_ * fVar291 +
               fVar144 * fVar205 +
               (float)local_520._4_4_ * fVar186 + (float)local_540._4_4_ * fVar239;
          local_620._0_4_ =
               (float)local_4a0._0_4_ * fVar275 +
               fVar141 * fVar267 +
               (float)local_520._0_4_ * fVar225 + (float)local_540._0_4_ * fVar203;
          fStack_618 = fStack_498 * fVar133 +
                       fVar147 * fVar263 + fStack_518 * fVar236 + fStack_538 * fVar248;
          fStack_614 = fStack_494 * fVar136 +
                       fVar149 * fVar273 + fStack_514 * fVar199 + fStack_534 * fVar250;
          fStack_610 = fStack_490 * fVar139 +
                       fVar150 * fVar274 + fStack_510 * fVar237 + fStack_530 * fVar252;
          fStack_60c = fStack_48c * fVar142 +
                       fVar266 * fVar206 + fStack_50c * fVar201 + fStack_52c * fVar300;
          fStack_608 = fStack_488 * fVar145 +
                       fVar165 * fVar264 + fStack_508 * fVar238 + fStack_528 * fVar299;
          fStack_604 = fVar132 + fStack_624;
          local_640 = fVar187 * fVar275 +
                      fVar224 * fVar225 + fVar203 * (float)local_6e0._0_4_ +
                      fVar267 * (float)local_7a0._0_4_;
          fStack_63c = fVar200 * fVar291 +
                       fVar240 * fVar186 + fVar239 * (float)local_6e0._4_4_ +
                       fVar205 * (float)local_7a0._4_4_;
          fStack_638 = fVar202 * fVar133 +
                       fVar249 * fVar236 + fVar248 * fStack_6d8 + fVar263 * fStack_798;
          fStack_634 = fVar204 * fVar136 +
                       fVar251 * fVar199 + fVar250 * fStack_6d4 + fVar273 * fStack_794;
          fStack_630 = fVar187 * fVar139 +
                       fVar253 * fVar237 + fVar252 * fStack_6d0 + fVar274 * fStack_790;
          fStack_62c = fVar200 * fVar142 +
                       fVar255 * fVar201 + fVar300 * fStack_6cc + fVar206 * fStack_78c;
          fStack_628 = fVar202 * fVar145 +
                       fVar262 * fVar238 + fVar299 * fStack_6c8 + fVar264 * fStack_788;
          fStack_624 = fStack_624 + fVar254;
          auVar313._0_4_ =
               fVar267 * (float)local_e0._0_4_ +
               (float)local_480._0_4_ * fVar225 + (float)local_7c0._0_4_ * fVar203 +
               fVar275 * (float)local_2c0._0_4_;
          auVar313._4_4_ =
               fVar205 * (float)local_e0._4_4_ +
               (float)local_480._4_4_ * fVar186 + (float)local_7c0._4_4_ * fVar239 +
               fVar291 * (float)local_2c0._4_4_;
          auVar313._8_4_ =
               fVar263 * fStack_d8 + fStack_478 * fVar236 + fStack_7b8 * fVar248 +
               fVar133 * fStack_2b8;
          auVar313._12_4_ =
               fVar273 * fStack_d4 + fStack_474 * fVar199 + fStack_7b4 * fVar250 +
               fVar136 * fStack_2b4;
          auVar313._16_4_ =
               fVar274 * fStack_d0 + fStack_470 * fVar237 + fStack_7b0 * fVar252 +
               fVar139 * fStack_2b0;
          auVar313._20_4_ =
               fVar206 * fStack_cc + fStack_46c * fVar201 + fStack_7ac * fVar300 +
               fVar142 * fStack_2ac;
          auVar313._24_4_ =
               fVar264 * fStack_c8 + fStack_468 * fVar238 + fStack_7a8 * fVar299 +
               fVar145 * fStack_2a8;
          auVar313._28_4_ = pfVar8[7] + fVar132 + fVar254;
          pfVar4 = (float *)(lVar115 + 0x2203a60 + lVar114 * 4);
          fVar225 = *pfVar4;
          fVar186 = pfVar4[1];
          fVar236 = pfVar4[2];
          fVar199 = pfVar4[3];
          fVar237 = pfVar4[4];
          fVar201 = pfVar4[5];
          fVar238 = pfVar4[6];
          pfVar5 = (float *)(lVar115 + 0x2203ee4 + lVar114 * 4);
          fVar203 = *pfVar5;
          fVar239 = pfVar5[1];
          fVar248 = pfVar5[2];
          fVar250 = pfVar5[3];
          fVar252 = pfVar5[4];
          fVar300 = pfVar5[5];
          fVar299 = pfVar5[6];
          pfVar6 = (float *)(lVar115 + 0x22035dc + lVar114 * 4);
          fVar267 = *pfVar6;
          fVar205 = pfVar6[1];
          fVar263 = pfVar6[2];
          fVar273 = pfVar6[3];
          fVar274 = pfVar6[4];
          fVar206 = pfVar6[5];
          fVar264 = pfVar6[6];
          pfVar7 = (float *)(lVar115 + 0x2203158 + lVar114 * 4);
          fVar275 = *pfVar7;
          fVar291 = pfVar7[1];
          fVar133 = pfVar7[2];
          fVar136 = pfVar7[3];
          fVar139 = pfVar7[4];
          fVar142 = pfVar7[5];
          fVar145 = pfVar7[6];
          auVar284._0_4_ =
               fVar275 * (float)local_4a0._0_4_ +
               fVar141 * fVar267 +
               (float)local_520._0_4_ * fVar225 + (float)local_540._0_4_ * fVar203;
          auVar284._4_4_ =
               fVar291 * (float)local_4a0._4_4_ +
               fVar144 * fVar205 +
               (float)local_520._4_4_ * fVar186 + (float)local_540._4_4_ * fVar239;
          auVar284._8_4_ =
               fVar133 * fStack_498 +
               fVar147 * fVar263 + fStack_518 * fVar236 + fStack_538 * fVar248;
          auVar284._12_4_ =
               fVar136 * fStack_494 +
               fVar149 * fVar273 + fStack_514 * fVar199 + fStack_534 * fVar250;
          auVar284._16_4_ =
               fVar139 * fStack_490 +
               fVar150 * fVar274 + fStack_510 * fVar237 + fStack_530 * fVar252;
          auVar284._20_4_ =
               fVar142 * fStack_48c +
               fVar266 * fVar206 + fStack_50c * fVar201 + fStack_52c * fVar300;
          auVar284._24_4_ =
               fVar145 * fStack_488 +
               fVar165 * fVar264 + fStack_508 * fVar238 + fStack_528 * fVar299;
          auVar284._28_4_ = fStack_484 + fStack_484 + fStack_524 + fStack_484;
          auVar305._0_4_ =
               fVar187 * fVar275 +
               fVar267 * (float)local_7a0._0_4_ +
               fVar225 * fVar209 + fVar203 * (float)local_6e0._0_4_;
          auVar305._4_4_ =
               fVar200 * fVar291 +
               fVar205 * (float)local_7a0._4_4_ +
               fVar186 * fVar221 + fVar239 * (float)local_6e0._4_4_;
          auVar305._8_4_ =
               fVar202 * fVar133 + fVar263 * fStack_798 + fVar236 * fVar222 + fVar248 * fStack_6d8;
          auVar305._12_4_ =
               fVar204 * fVar136 + fVar273 * fStack_794 + fVar199 * fVar223 + fVar250 * fStack_6d4;
          auVar305._16_4_ =
               fVar187 * fVar139 + fVar274 * fStack_790 + fVar237 * fVar209 + fVar252 * fStack_6d0;
          auVar305._20_4_ =
               fVar200 * fVar142 + fVar206 * fStack_78c + fVar201 * fVar221 + fVar300 * fStack_6cc;
          auVar305._24_4_ =
               fVar202 * fVar145 + fVar264 * fStack_788 + fVar238 * fVar222 + fVar299 * fStack_6c8;
          auVar305._28_4_ = fStack_484 + fStack_484 + fStack_504 + fStack_484;
          auVar235._8_4_ = 0x7fffffff;
          auVar235._0_8_ = 0x7fffffff7fffffff;
          auVar235._12_4_ = 0x7fffffff;
          auVar235._16_4_ = 0x7fffffff;
          auVar235._20_4_ = 0x7fffffff;
          auVar235._24_4_ = 0x7fffffff;
          auVar235._28_4_ = 0x7fffffff;
          auVar162 = vandps_avx(_local_620,auVar235);
          auVar100._4_4_ = fStack_63c;
          auVar100._0_4_ = local_640;
          auVar100._8_4_ = fStack_638;
          auVar100._12_4_ = fStack_634;
          auVar100._16_4_ = fStack_630;
          auVar100._20_4_ = fStack_62c;
          auVar100._24_4_ = fStack_628;
          auVar100._28_4_ = fStack_624;
          auVar16 = vandps_avx(auVar100,auVar235);
          auVar16 = vmaxps_avx(auVar162,auVar16);
          auVar162 = vandps_avx(auVar313,auVar235);
          auVar16 = vmaxps_avx(auVar16,auVar162);
          auVar16 = vcmpps_avx(auVar16,local_4c0,1);
          auVar17 = vblendvps_avx(_local_620,auVar283,auVar16);
          auVar128._0_4_ =
               fVar275 * (float)local_2c0._0_4_ +
               fVar267 * (float)local_e0._0_4_ +
               fVar203 * (float)local_7c0._0_4_ + (float)local_480._0_4_ * fVar225;
          auVar128._4_4_ =
               fVar291 * (float)local_2c0._4_4_ +
               fVar205 * (float)local_e0._4_4_ +
               fVar239 * (float)local_7c0._4_4_ + (float)local_480._4_4_ * fVar186;
          auVar128._8_4_ =
               fVar133 * fStack_2b8 +
               fVar263 * fStack_d8 + fVar248 * fStack_7b8 + fStack_478 * fVar236;
          auVar128._12_4_ =
               fVar136 * fStack_2b4 +
               fVar273 * fStack_d4 + fVar250 * fStack_7b4 + fStack_474 * fVar199;
          auVar128._16_4_ =
               fVar139 * fStack_2b0 +
               fVar274 * fStack_d0 + fVar252 * fStack_7b0 + fStack_470 * fVar237;
          auVar128._20_4_ =
               fVar142 * fStack_2ac +
               fVar206 * fStack_cc + fVar300 * fStack_7ac + fStack_46c * fVar201;
          auVar128._24_4_ =
               fVar145 * fStack_2a8 +
               fVar264 * fStack_c8 + fVar299 * fStack_7a8 + fStack_468 * fVar238;
          auVar128._28_4_ = auVar162._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
          auVar23 = vblendvps_avx(auVar100,auVar18,auVar16);
          auVar162 = vandps_avx(auVar284,auVar235);
          auVar16 = vandps_avx(auVar305,auVar235);
          auVar14 = vmaxps_avx(auVar162,auVar16);
          auVar162 = vandps_avx(auVar128,auVar235);
          auVar162 = vmaxps_avx(auVar14,auVar162);
          local_840._0_4_ = auVar103._0_4_;
          local_840._4_4_ = auVar103._4_4_;
          fStack_838 = auVar103._8_4_;
          fStack_834 = auVar103._12_4_;
          fStack_830 = auVar103._16_4_;
          fStack_82c = auVar103._20_4_;
          fStack_828 = auVar103._24_4_;
          auVar16 = vcmpps_avx(auVar162,local_4c0,1);
          auVar162 = vblendvps_avx(auVar284,auVar283,auVar16);
          auVar129._0_4_ =
               (float)local_2c0._0_4_ * (float)local_840._0_4_ +
               (float)local_e0._0_4_ * (float)local_780._0_4_ +
               fVar135 + (float)local_7c0._0_4_ * fVar276;
          auVar129._4_4_ =
               (float)local_2c0._4_4_ * (float)local_840._4_4_ +
               (float)local_e0._4_4_ * (float)local_780._4_4_ +
               fVar138 + (float)local_7c0._4_4_ * fVar207;
          auVar129._8_4_ =
               fStack_2b8 * fStack_838 +
               fStack_d8 * (float)uStack_778 + fVar166 + fStack_7b8 * fVar265;
          auVar129._12_4_ =
               fStack_2b4 * fStack_834 +
               fStack_d4 * uStack_778._4_4_ + fVar167 + fStack_7b4 * fVar277;
          auVar129._16_4_ =
               fStack_2b0 * fStack_830 +
               fStack_d0 * (float)uStack_770 + fVar168 + fStack_7b0 * fVar278;
          auVar129._20_4_ =
               fStack_2ac * fStack_82c +
               fStack_cc * uStack_770._4_4_ + fVar169 + fStack_7ac * fVar208;
          auVar129._24_4_ =
               fStack_2a8 * fStack_828 +
               fStack_c8 * (float)uStack_768 + fVar170 + fStack_7a8 * fVar171;
          auVar129._28_4_ = auVar14._28_4_ + fStack_644 + auVar159._28_4_ + 0.0;
          auVar283 = vblendvps_avx(auVar305,auVar18,auVar16);
          fVar132 = auVar17._0_4_;
          fVar135 = auVar17._4_4_;
          fVar138 = auVar17._8_4_;
          fVar141 = auVar17._12_4_;
          fVar144 = auVar17._16_4_;
          fVar147 = auVar17._20_4_;
          fVar149 = auVar17._24_4_;
          fVar150 = auVar17._28_4_;
          fVar267 = auVar162._0_4_;
          fVar263 = auVar162._4_4_;
          fVar274 = auVar162._8_4_;
          fVar264 = auVar162._12_4_;
          fVar276 = auVar162._16_4_;
          fVar265 = auVar162._20_4_;
          fVar278 = auVar162._24_4_;
          fVar225 = auVar23._0_4_;
          fVar236 = auVar23._4_4_;
          fVar237 = auVar23._8_4_;
          fVar238 = auVar23._12_4_;
          fVar239 = auVar23._16_4_;
          fVar250 = auVar23._20_4_;
          fVar300 = auVar23._24_4_;
          auVar293._0_4_ = fVar225 * fVar225 + fVar132 * fVar132;
          auVar293._4_4_ = fVar236 * fVar236 + fVar135 * fVar135;
          auVar293._8_4_ = fVar237 * fVar237 + fVar138 * fVar138;
          auVar293._12_4_ = fVar238 * fVar238 + fVar141 * fVar141;
          auVar293._16_4_ = fVar239 * fVar239 + fVar144 * fVar144;
          auVar293._20_4_ = fVar250 * fVar250 + fVar147 * fVar147;
          auVar293._24_4_ = fVar300 * fVar300 + fVar149 * fVar149;
          auVar293._28_4_ = fVar204 + auVar18._28_4_;
          auVar18 = vrsqrtps_avx(auVar293);
          fVar186 = auVar18._0_4_;
          fVar199 = auVar18._4_4_;
          auVar57._4_4_ = fVar199 * 1.5;
          auVar57._0_4_ = fVar186 * 1.5;
          fVar201 = auVar18._8_4_;
          auVar57._8_4_ = fVar201 * 1.5;
          fVar203 = auVar18._12_4_;
          auVar57._12_4_ = fVar203 * 1.5;
          fVar248 = auVar18._16_4_;
          auVar57._16_4_ = fVar248 * 1.5;
          fVar252 = auVar18._20_4_;
          auVar57._20_4_ = fVar252 * 1.5;
          fVar299 = auVar18._24_4_;
          auVar57._24_4_ = fVar299 * 1.5;
          auVar57._28_4_ = auVar305._28_4_;
          auVar58._4_4_ = fVar199 * fVar199 * fVar199 * auVar293._4_4_ * 0.5;
          auVar58._0_4_ = fVar186 * fVar186 * fVar186 * auVar293._0_4_ * 0.5;
          auVar58._8_4_ = fVar201 * fVar201 * fVar201 * auVar293._8_4_ * 0.5;
          auVar58._12_4_ = fVar203 * fVar203 * fVar203 * auVar293._12_4_ * 0.5;
          auVar58._16_4_ = fVar248 * fVar248 * fVar248 * auVar293._16_4_ * 0.5;
          auVar58._20_4_ = fVar252 * fVar252 * fVar252 * auVar293._20_4_ * 0.5;
          auVar58._24_4_ = fVar299 * fVar299 * fVar299 * auVar293._24_4_ * 0.5;
          auVar58._28_4_ = auVar293._28_4_;
          auVar16 = vsubps_avx(auVar57,auVar58);
          fVar171 = auVar16._0_4_;
          fVar291 = auVar16._4_4_;
          fVar133 = auVar16._8_4_;
          fVar136 = auVar16._12_4_;
          fVar139 = auVar16._16_4_;
          fVar142 = auVar16._20_4_;
          fVar145 = auVar16._24_4_;
          fVar186 = auVar283._0_4_;
          fVar199 = auVar283._4_4_;
          fVar201 = auVar283._8_4_;
          fVar203 = auVar283._12_4_;
          fVar248 = auVar283._16_4_;
          fVar252 = auVar283._20_4_;
          fVar299 = auVar283._24_4_;
          auVar271._0_4_ = fVar186 * fVar186 + fVar267 * fVar267;
          auVar271._4_4_ = fVar199 * fVar199 + fVar263 * fVar263;
          auVar271._8_4_ = fVar201 * fVar201 + fVar274 * fVar274;
          auVar271._12_4_ = fVar203 * fVar203 + fVar264 * fVar264;
          auVar271._16_4_ = fVar248 * fVar248 + fVar276 * fVar276;
          auVar271._20_4_ = fVar252 * fVar252 + fVar265 * fVar265;
          auVar271._24_4_ = fVar299 * fVar299 + fVar278 * fVar278;
          auVar271._28_4_ = auVar18._28_4_ + auVar162._28_4_;
          auVar162 = vrsqrtps_avx(auVar271);
          fVar205 = auVar162._0_4_;
          fVar273 = auVar162._4_4_;
          auVar59._4_4_ = fVar273 * 1.5;
          auVar59._0_4_ = fVar205 * 1.5;
          fVar206 = auVar162._8_4_;
          auVar59._8_4_ = fVar206 * 1.5;
          fVar275 = auVar162._12_4_;
          auVar59._12_4_ = fVar275 * 1.5;
          fVar207 = auVar162._16_4_;
          auVar59._16_4_ = fVar207 * 1.5;
          fVar277 = auVar162._20_4_;
          auVar59._20_4_ = fVar277 * 1.5;
          fVar208 = auVar162._24_4_;
          auVar59._24_4_ = fVar208 * 1.5;
          auVar59._28_4_ = auVar305._28_4_;
          auVar60._4_4_ = fVar273 * fVar273 * fVar273 * auVar271._4_4_ * 0.5;
          auVar60._0_4_ = fVar205 * fVar205 * fVar205 * auVar271._0_4_ * 0.5;
          auVar60._8_4_ = fVar206 * fVar206 * fVar206 * auVar271._8_4_ * 0.5;
          auVar60._12_4_ = fVar275 * fVar275 * fVar275 * auVar271._12_4_ * 0.5;
          auVar60._16_4_ = fVar207 * fVar207 * fVar207 * auVar271._16_4_ * 0.5;
          auVar60._20_4_ = fVar277 * fVar277 * fVar277 * auVar271._20_4_ * 0.5;
          auVar60._24_4_ = fVar208 * fVar208 * fVar208 * auVar271._24_4_ * 0.5;
          auVar60._28_4_ = auVar271._28_4_;
          auVar283 = vsubps_avx(auVar59,auVar60);
          fVar205 = auVar283._0_4_;
          fVar273 = auVar283._4_4_;
          fVar206 = auVar283._8_4_;
          fVar275 = auVar283._12_4_;
          fVar207 = auVar283._16_4_;
          fVar277 = auVar283._20_4_;
          fVar208 = auVar283._24_4_;
          fVar225 = fVar118 * fVar171 * fVar225;
          fVar236 = fVar134 * fVar291 * fVar236;
          auVar61._4_4_ = fVar236;
          auVar61._0_4_ = fVar225;
          fVar237 = fVar137 * fVar133 * fVar237;
          auVar61._8_4_ = fVar237;
          fVar238 = fVar140 * fVar136 * fVar238;
          auVar61._12_4_ = fVar238;
          fVar239 = fVar143 * fVar139 * fVar239;
          auVar61._16_4_ = fVar239;
          fVar250 = fVar146 * fVar142 * fVar250;
          auVar61._20_4_ = fVar250;
          fVar300 = fVar148 * fVar145 * fVar300;
          auVar61._24_4_ = fVar300;
          auVar61._28_4_ = auVar162._28_4_;
          local_840._4_4_ = fVar236 + local_600._4_4_;
          local_840._0_4_ = fVar225 + local_600._0_4_;
          fStack_838 = fVar237 + local_600._8_4_;
          fStack_834 = fVar238 + local_600._12_4_;
          fStack_830 = fVar239 + local_600._16_4_;
          fStack_82c = fVar250 + local_600._20_4_;
          fStack_828 = fVar300 + local_600._24_4_;
          fStack_824 = auVar162._28_4_ + local_600._28_4_;
          fVar225 = fVar118 * fVar171 * -fVar132;
          fVar236 = fVar134 * fVar291 * -fVar135;
          auVar62._4_4_ = fVar236;
          auVar62._0_4_ = fVar225;
          fVar237 = fVar137 * fVar133 * -fVar138;
          auVar62._8_4_ = fVar237;
          fVar238 = fVar140 * fVar136 * -fVar141;
          auVar62._12_4_ = fVar238;
          fVar239 = fVar143 * fVar139 * -fVar144;
          auVar62._16_4_ = fVar239;
          fVar250 = fVar146 * fVar142 * -fVar147;
          auVar62._20_4_ = fVar250;
          fVar300 = fVar148 * fVar145 * -fVar149;
          auVar62._24_4_ = fVar300;
          auVar62._28_4_ = -fVar150;
          local_780._4_4_ = auVar159._4_4_ + fVar236;
          local_780._0_4_ = auVar159._0_4_ + fVar225;
          uStack_778._0_4_ = auVar159._8_4_ + fVar237;
          uStack_778._4_4_ = auVar159._12_4_ + fVar238;
          uStack_770._0_4_ = auVar159._16_4_ + fVar239;
          uStack_770._4_4_ = auVar159._20_4_ + fVar250;
          uStack_768._0_4_ = auVar159._24_4_ + fVar300;
          uStack_768._4_4_ = auVar159._28_4_ + -fVar150;
          fVar225 = fVar171 * 0.0 * fVar118;
          fVar236 = fVar291 * 0.0 * fVar134;
          auVar63._4_4_ = fVar236;
          auVar63._0_4_ = fVar225;
          fVar237 = fVar133 * 0.0 * fVar137;
          auVar63._8_4_ = fVar237;
          fVar238 = fVar136 * 0.0 * fVar140;
          auVar63._12_4_ = fVar238;
          fVar239 = fVar139 * 0.0 * fVar143;
          auVar63._16_4_ = fVar239;
          fVar250 = fVar142 * 0.0 * fVar146;
          auVar63._20_4_ = fVar250;
          fVar300 = fVar145 * 0.0 * fVar148;
          auVar63._24_4_ = fVar300;
          auVar63._28_4_ = fVar150;
          auVar162 = vsubps_avx(local_600,auVar61);
          auVar328._0_4_ = fVar225 + auVar129._0_4_;
          auVar328._4_4_ = fVar236 + auVar129._4_4_;
          auVar328._8_4_ = fVar237 + auVar129._8_4_;
          auVar328._12_4_ = fVar238 + auVar129._12_4_;
          auVar328._16_4_ = fVar239 + auVar129._16_4_;
          auVar328._20_4_ = fVar250 + auVar129._20_4_;
          auVar328._24_4_ = fVar300 + auVar129._24_4_;
          auVar328._28_4_ = fVar150 + auVar129._28_4_;
          fVar225 = auVar183._0_4_ * fVar205 * fVar186;
          fVar186 = auVar183._4_4_ * fVar273 * fVar199;
          auVar64._4_4_ = fVar186;
          auVar64._0_4_ = fVar225;
          fVar236 = auVar183._8_4_ * fVar206 * fVar201;
          auVar64._8_4_ = fVar236;
          fVar199 = auVar183._12_4_ * fVar275 * fVar203;
          auVar64._12_4_ = fVar199;
          fVar237 = auVar183._16_4_ * fVar207 * fVar248;
          auVar64._16_4_ = fVar237;
          fVar201 = auVar183._20_4_ * fVar277 * fVar252;
          auVar64._20_4_ = fVar201;
          fVar238 = auVar183._24_4_ * fVar208 * fVar299;
          auVar64._24_4_ = fVar238;
          auVar64._28_4_ = local_600._28_4_;
          auVar270 = vsubps_avx(auVar159,auVar62);
          auVar314._0_4_ = (float)local_700._0_4_ + fVar225;
          auVar314._4_4_ = local_700._4_4_ + fVar186;
          auVar314._8_4_ = local_700._8_4_ + fVar236;
          auVar314._12_4_ = local_700._12_4_ + fVar199;
          auVar314._16_4_ = local_700._16_4_ + fVar237;
          auVar314._20_4_ = local_700._20_4_ + fVar201;
          auVar314._24_4_ = local_700._24_4_ + fVar238;
          auVar314._28_4_ = local_700._28_4_ + local_600._28_4_;
          fVar225 = fVar205 * -fVar267 * auVar183._0_4_;
          fVar186 = fVar273 * -fVar263 * auVar183._4_4_;
          auVar65._4_4_ = fVar186;
          auVar65._0_4_ = fVar225;
          fVar236 = fVar206 * -fVar274 * auVar183._8_4_;
          auVar65._8_4_ = fVar236;
          fVar199 = fVar275 * -fVar264 * auVar183._12_4_;
          auVar65._12_4_ = fVar199;
          fVar237 = fVar207 * -fVar276 * auVar183._16_4_;
          auVar65._16_4_ = fVar237;
          fVar201 = fVar277 * -fVar265 * auVar183._20_4_;
          auVar65._20_4_ = fVar201;
          fVar238 = fVar208 * -fVar278 * auVar183._24_4_;
          auVar65._24_4_ = fVar238;
          auVar65._28_4_ = fVar117;
          auVar296 = vsubps_avx(auVar129,auVar63);
          auVar219._0_4_ = auVar234._0_4_ + fVar225;
          auVar219._4_4_ = auVar234._4_4_ + fVar186;
          auVar219._8_4_ = auVar234._8_4_ + fVar236;
          auVar219._12_4_ = auVar234._12_4_ + fVar199;
          auVar219._16_4_ = auVar234._16_4_ + fVar237;
          auVar219._20_4_ = auVar234._20_4_ + fVar201;
          auVar219._24_4_ = auVar234._24_4_ + fVar238;
          auVar219._28_4_ = auVar234._28_4_ + fVar117;
          fVar225 = fVar205 * 0.0 * auVar183._0_4_;
          fVar186 = fVar273 * 0.0 * auVar183._4_4_;
          auVar66._4_4_ = fVar186;
          auVar66._0_4_ = fVar225;
          fVar236 = fVar206 * 0.0 * auVar183._8_4_;
          auVar66._8_4_ = fVar236;
          fVar199 = fVar275 * 0.0 * auVar183._12_4_;
          auVar66._12_4_ = fVar199;
          fVar237 = fVar207 * 0.0 * auVar183._16_4_;
          auVar66._16_4_ = fVar237;
          fVar201 = fVar277 * 0.0 * auVar183._20_4_;
          auVar66._20_4_ = fVar201;
          fVar238 = fVar208 * 0.0 * auVar183._24_4_;
          auVar66._24_4_ = fVar238;
          auVar66._28_4_ = auVar129._28_4_;
          auVar18 = vsubps_avx(local_700,auVar64);
          auVar285._0_4_ = (float)local_660._0_4_ + fVar225;
          auVar285._4_4_ = (float)local_660._4_4_ + fVar186;
          auVar285._8_4_ = fStack_658 + fVar236;
          auVar285._12_4_ = fStack_654 + fVar199;
          auVar285._16_4_ = fStack_650 + fVar237;
          auVar285._20_4_ = fStack_64c + fVar201;
          auVar285._24_4_ = fStack_648 + fVar238;
          auVar285._28_4_ = fStack_644 + auVar129._28_4_;
          auVar16 = vsubps_avx(auVar234,auVar65);
          auVar17 = vsubps_avx(_local_660,auVar66);
          auVar23 = vsubps_avx(auVar219,auVar270);
          auVar14 = vsubps_avx(auVar285,auVar296);
          auVar67._4_4_ = auVar296._4_4_ * auVar23._4_4_;
          auVar67._0_4_ = auVar296._0_4_ * auVar23._0_4_;
          auVar67._8_4_ = auVar296._8_4_ * auVar23._8_4_;
          auVar67._12_4_ = auVar296._12_4_ * auVar23._12_4_;
          auVar67._16_4_ = auVar296._16_4_ * auVar23._16_4_;
          auVar67._20_4_ = auVar296._20_4_ * auVar23._20_4_;
          auVar67._24_4_ = auVar296._24_4_ * auVar23._24_4_;
          auVar67._28_4_ = auVar305._28_4_;
          auVar68._4_4_ = auVar270._4_4_ * auVar14._4_4_;
          auVar68._0_4_ = auVar270._0_4_ * auVar14._0_4_;
          auVar68._8_4_ = auVar270._8_4_ * auVar14._8_4_;
          auVar68._12_4_ = auVar270._12_4_ * auVar14._12_4_;
          auVar68._16_4_ = auVar270._16_4_ * auVar14._16_4_;
          auVar68._20_4_ = auVar270._20_4_ * auVar14._20_4_;
          auVar68._24_4_ = auVar270._24_4_ * auVar14._24_4_;
          auVar68._28_4_ = fStack_644;
          auVar21 = vsubps_avx(auVar68,auVar67);
          auVar69._4_4_ = auVar162._4_4_ * auVar14._4_4_;
          auVar69._0_4_ = auVar162._0_4_ * auVar14._0_4_;
          auVar69._8_4_ = auVar162._8_4_ * auVar14._8_4_;
          auVar69._12_4_ = auVar162._12_4_ * auVar14._12_4_;
          auVar69._16_4_ = auVar162._16_4_ * auVar14._16_4_;
          auVar69._20_4_ = auVar162._20_4_ * auVar14._20_4_;
          auVar69._24_4_ = auVar162._24_4_ * auVar14._24_4_;
          auVar69._28_4_ = auVar14._28_4_;
          auVar14 = vsubps_avx(auVar314,auVar162);
          auVar70._4_4_ = auVar296._4_4_ * auVar14._4_4_;
          auVar70._0_4_ = auVar296._0_4_ * auVar14._0_4_;
          auVar70._8_4_ = auVar296._8_4_ * auVar14._8_4_;
          auVar70._12_4_ = auVar296._12_4_ * auVar14._12_4_;
          auVar70._16_4_ = auVar296._16_4_ * auVar14._16_4_;
          auVar70._20_4_ = auVar296._20_4_ * auVar14._20_4_;
          auVar70._24_4_ = auVar296._24_4_ * auVar14._24_4_;
          auVar70._28_4_ = auVar283._28_4_;
          auVar193 = vsubps_avx(auVar70,auVar69);
          auVar71._4_4_ = auVar270._4_4_ * auVar14._4_4_;
          auVar71._0_4_ = auVar270._0_4_ * auVar14._0_4_;
          auVar71._8_4_ = auVar270._8_4_ * auVar14._8_4_;
          auVar71._12_4_ = auVar270._12_4_ * auVar14._12_4_;
          auVar71._16_4_ = auVar270._16_4_ * auVar14._16_4_;
          auVar71._20_4_ = auVar270._20_4_ * auVar14._20_4_;
          auVar71._24_4_ = auVar270._24_4_ * auVar14._24_4_;
          auVar71._28_4_ = auVar283._28_4_;
          auVar72._4_4_ = auVar162._4_4_ * auVar23._4_4_;
          auVar72._0_4_ = auVar162._0_4_ * auVar23._0_4_;
          auVar72._8_4_ = auVar162._8_4_ * auVar23._8_4_;
          auVar72._12_4_ = auVar162._12_4_ * auVar23._12_4_;
          auVar72._16_4_ = auVar162._16_4_ * auVar23._16_4_;
          auVar72._20_4_ = auVar162._20_4_ * auVar23._20_4_;
          auVar72._24_4_ = auVar162._24_4_ * auVar23._24_4_;
          auVar72._28_4_ = auVar23._28_4_;
          auVar283 = vsubps_avx(auVar72,auVar71);
          auVar160._0_4_ = auVar21._0_4_ * 0.0 + auVar283._0_4_ + auVar193._0_4_ * 0.0;
          auVar160._4_4_ = auVar21._4_4_ * 0.0 + auVar283._4_4_ + auVar193._4_4_ * 0.0;
          auVar160._8_4_ = auVar21._8_4_ * 0.0 + auVar283._8_4_ + auVar193._8_4_ * 0.0;
          auVar160._12_4_ = auVar21._12_4_ * 0.0 + auVar283._12_4_ + auVar193._12_4_ * 0.0;
          auVar160._16_4_ = auVar21._16_4_ * 0.0 + auVar283._16_4_ + auVar193._16_4_ * 0.0;
          auVar160._20_4_ = auVar21._20_4_ * 0.0 + auVar283._20_4_ + auVar193._20_4_ * 0.0;
          auVar160._24_4_ = auVar21._24_4_ * 0.0 + auVar283._24_4_ + auVar193._24_4_ * 0.0;
          auVar160._28_4_ = auVar21._28_4_ + auVar283._28_4_ + auVar193._28_4_;
          auVar230 = vcmpps_avx(auVar160,ZEXT832(0) << 0x20,2);
          auVar283 = vblendvps_avx(auVar18,_local_840,auVar230);
          auVar198 = ZEXT3264(auVar283);
          auVar18 = vblendvps_avx(auVar16,_local_780,auVar230);
          auVar16 = vblendvps_avx(auVar17,auVar328,auVar230);
          auVar17 = vblendvps_avx(auVar162,auVar314,auVar230);
          auVar23 = vblendvps_avx(auVar270,auVar219,auVar230);
          auVar14 = vblendvps_avx(auVar296,auVar285,auVar230);
          auVar21 = vblendvps_avx(auVar314,auVar162,auVar230);
          auVar193 = vblendvps_avx(auVar219,auVar270,auVar230);
          auVar194 = vblendvps_avx(auVar285,auVar296,auVar230);
          auVar162 = vandps_avx(_local_5a0,_local_580);
          auVar21 = vsubps_avx(auVar21,auVar283);
          auVar297 = vsubps_avx(auVar193,auVar18);
          auVar194 = vsubps_avx(auVar194,auVar16);
          auVar302 = vsubps_avx(auVar18,auVar23);
          auVar272 = ZEXT3264(auVar302);
          fVar225 = auVar297._0_4_;
          fVar224 = auVar16._0_4_;
          fVar203 = auVar297._4_4_;
          fVar240 = auVar16._4_4_;
          auVar73._4_4_ = fVar240 * fVar203;
          auVar73._0_4_ = fVar224 * fVar225;
          fVar267 = auVar297._8_4_;
          fVar249 = auVar16._8_4_;
          auVar73._8_4_ = fVar249 * fVar267;
          fVar275 = auVar297._12_4_;
          fVar251 = auVar16._12_4_;
          auVar73._12_4_ = fVar251 * fVar275;
          fVar171 = auVar297._16_4_;
          fVar253 = auVar16._16_4_;
          auVar73._16_4_ = fVar253 * fVar171;
          fVar132 = auVar297._20_4_;
          fVar255 = auVar16._20_4_;
          auVar73._20_4_ = fVar255 * fVar132;
          fVar150 = auVar297._24_4_;
          fVar262 = auVar16._24_4_;
          auVar73._24_4_ = fVar262 * fVar150;
          auVar73._28_4_ = auVar193._28_4_;
          fVar186 = auVar18._0_4_;
          fVar170 = auVar194._0_4_;
          fVar239 = auVar18._4_4_;
          fVar254 = auVar194._4_4_;
          auVar74._4_4_ = fVar254 * fVar239;
          auVar74._0_4_ = fVar170 * fVar186;
          fVar205 = auVar18._8_4_;
          fVar279 = auVar194._8_4_;
          auVar74._8_4_ = fVar279 * fVar205;
          fVar276 = auVar18._12_4_;
          fVar287 = auVar194._12_4_;
          auVar74._12_4_ = fVar287 * fVar276;
          fVar291 = auVar18._16_4_;
          fVar288 = auVar194._16_4_;
          auVar74._16_4_ = fVar288 * fVar291;
          fVar135 = auVar18._20_4_;
          fVar289 = auVar194._20_4_;
          auVar74._20_4_ = fVar289 * fVar135;
          fVar266 = auVar18._24_4_;
          fVar290 = auVar194._24_4_;
          uVar116 = auVar270._28_4_;
          auVar74._24_4_ = fVar290 * fVar266;
          auVar74._28_4_ = uVar116;
          auVar193 = vsubps_avx(auVar74,auVar73);
          fVar236 = auVar283._0_4_;
          fVar248 = auVar283._4_4_;
          auVar75._4_4_ = fVar254 * fVar248;
          auVar75._0_4_ = fVar170 * fVar236;
          fVar263 = auVar283._8_4_;
          auVar75._8_4_ = fVar279 * fVar263;
          fVar207 = auVar283._12_4_;
          auVar75._12_4_ = fVar287 * fVar207;
          fVar133 = auVar283._16_4_;
          auVar75._16_4_ = fVar288 * fVar133;
          fVar138 = auVar283._20_4_;
          auVar75._20_4_ = fVar289 * fVar138;
          fVar165 = auVar283._24_4_;
          auVar75._24_4_ = fVar290 * fVar165;
          auVar75._28_4_ = uVar116;
          fVar199 = auVar21._0_4_;
          fVar250 = auVar21._4_4_;
          auVar76._4_4_ = fVar240 * fVar250;
          auVar76._0_4_ = fVar224 * fVar199;
          fVar273 = auVar21._8_4_;
          auVar76._8_4_ = fVar249 * fVar273;
          fVar265 = auVar21._12_4_;
          auVar76._12_4_ = fVar251 * fVar265;
          fVar136 = auVar21._16_4_;
          auVar76._16_4_ = fVar253 * fVar136;
          fVar141 = auVar21._20_4_;
          auVar76._20_4_ = fVar255 * fVar141;
          fVar166 = auVar21._24_4_;
          auVar76._24_4_ = fVar262 * fVar166;
          auVar76._28_4_ = auVar314._28_4_;
          auVar270 = vsubps_avx(auVar76,auVar75);
          auVar77._4_4_ = fVar239 * fVar250;
          auVar77._0_4_ = fVar186 * fVar199;
          auVar77._8_4_ = fVar205 * fVar273;
          auVar77._12_4_ = fVar276 * fVar265;
          auVar77._16_4_ = fVar291 * fVar136;
          auVar77._20_4_ = fVar135 * fVar141;
          auVar77._24_4_ = fVar266 * fVar166;
          auVar77._28_4_ = uVar116;
          auVar78._4_4_ = fVar248 * fVar203;
          auVar78._0_4_ = fVar236 * fVar225;
          auVar78._8_4_ = fVar263 * fVar267;
          auVar78._12_4_ = fVar207 * fVar275;
          auVar78._16_4_ = fVar133 * fVar171;
          auVar78._20_4_ = fVar138 * fVar132;
          auVar78._24_4_ = fVar165 * fVar150;
          auVar78._28_4_ = auVar296._28_4_;
          auVar296 = vsubps_avx(auVar78,auVar77);
          auVar22 = vsubps_avx(auVar16,auVar14);
          fVar201 = auVar296._28_4_ + auVar270._28_4_;
          local_700._0_4_ = auVar296._0_4_ + auVar270._0_4_ * 0.0 + auVar193._0_4_ * 0.0;
          local_700._4_4_ = auVar296._4_4_ + auVar270._4_4_ * 0.0 + auVar193._4_4_ * 0.0;
          local_700._8_4_ = auVar296._8_4_ + auVar270._8_4_ * 0.0 + auVar193._8_4_ * 0.0;
          local_700._12_4_ = auVar296._12_4_ + auVar270._12_4_ * 0.0 + auVar193._12_4_ * 0.0;
          local_700._16_4_ = auVar296._16_4_ + auVar270._16_4_ * 0.0 + auVar193._16_4_ * 0.0;
          local_700._20_4_ = auVar296._20_4_ + auVar270._20_4_ * 0.0 + auVar193._20_4_ * 0.0;
          local_700._24_4_ = auVar296._24_4_ + auVar270._24_4_ * 0.0 + auVar193._24_4_ * 0.0;
          local_700._28_4_ = fVar201 + auVar193._28_4_;
          fVar237 = auVar302._0_4_;
          fVar252 = auVar302._4_4_;
          auVar79._4_4_ = auVar14._4_4_ * fVar252;
          auVar79._0_4_ = auVar14._0_4_ * fVar237;
          fVar274 = auVar302._8_4_;
          auVar79._8_4_ = auVar14._8_4_ * fVar274;
          fVar277 = auVar302._12_4_;
          auVar79._12_4_ = auVar14._12_4_ * fVar277;
          fVar139 = auVar302._16_4_;
          auVar79._16_4_ = auVar14._16_4_ * fVar139;
          fVar144 = auVar302._20_4_;
          auVar79._20_4_ = auVar14._20_4_ * fVar144;
          fVar167 = auVar302._24_4_;
          auVar79._24_4_ = auVar14._24_4_ * fVar167;
          auVar79._28_4_ = fVar201;
          fVar201 = auVar22._0_4_;
          fVar300 = auVar22._4_4_;
          auVar80._4_4_ = auVar23._4_4_ * fVar300;
          auVar80._0_4_ = auVar23._0_4_ * fVar201;
          fVar206 = auVar22._8_4_;
          auVar80._8_4_ = auVar23._8_4_ * fVar206;
          fVar278 = auVar22._12_4_;
          auVar80._12_4_ = auVar23._12_4_ * fVar278;
          fVar142 = auVar22._16_4_;
          auVar80._16_4_ = auVar23._16_4_ * fVar142;
          fVar147 = auVar22._20_4_;
          auVar80._20_4_ = auVar23._20_4_ * fVar147;
          fVar168 = auVar22._24_4_;
          auVar80._24_4_ = auVar23._24_4_ * fVar168;
          auVar80._28_4_ = auVar296._28_4_;
          auVar270 = vsubps_avx(auVar80,auVar79);
          auVar296 = vsubps_avx(auVar283,auVar17);
          fVar238 = auVar296._0_4_;
          fVar299 = auVar296._4_4_;
          auVar81._4_4_ = auVar14._4_4_ * fVar299;
          auVar81._0_4_ = auVar14._0_4_ * fVar238;
          fVar264 = auVar296._8_4_;
          auVar81._8_4_ = auVar14._8_4_ * fVar264;
          fVar208 = auVar296._12_4_;
          auVar81._12_4_ = auVar14._12_4_ * fVar208;
          fVar145 = auVar296._16_4_;
          auVar81._16_4_ = auVar14._16_4_ * fVar145;
          fVar149 = auVar296._20_4_;
          auVar81._20_4_ = auVar14._20_4_ * fVar149;
          fVar169 = auVar296._24_4_;
          auVar81._24_4_ = auVar14._24_4_ * fVar169;
          auVar81._28_4_ = auVar14._28_4_;
          auVar82._4_4_ = fVar300 * auVar17._4_4_;
          auVar82._0_4_ = fVar201 * auVar17._0_4_;
          auVar82._8_4_ = fVar206 * auVar17._8_4_;
          auVar82._12_4_ = fVar278 * auVar17._12_4_;
          auVar82._16_4_ = fVar142 * auVar17._16_4_;
          auVar82._20_4_ = fVar147 * auVar17._20_4_;
          auVar82._24_4_ = fVar168 * auVar17._24_4_;
          auVar82._28_4_ = auVar193._28_4_;
          auVar14 = vsubps_avx(auVar81,auVar82);
          auVar83._4_4_ = auVar23._4_4_ * fVar299;
          auVar83._0_4_ = auVar23._0_4_ * fVar238;
          auVar83._8_4_ = auVar23._8_4_ * fVar264;
          auVar83._12_4_ = auVar23._12_4_ * fVar208;
          auVar83._16_4_ = auVar23._16_4_ * fVar145;
          auVar83._20_4_ = auVar23._20_4_ * fVar149;
          auVar83._24_4_ = auVar23._24_4_ * fVar169;
          auVar83._28_4_ = auVar23._28_4_;
          auVar84._4_4_ = fVar252 * auVar17._4_4_;
          auVar84._0_4_ = fVar237 * auVar17._0_4_;
          auVar84._8_4_ = fVar274 * auVar17._8_4_;
          auVar84._12_4_ = fVar277 * auVar17._12_4_;
          auVar84._16_4_ = fVar139 * auVar17._16_4_;
          auVar84._20_4_ = fVar144 * auVar17._20_4_;
          auVar84._24_4_ = fVar167 * auVar17._24_4_;
          auVar84._28_4_ = auVar17._28_4_;
          auVar17 = vsubps_avx(auVar84,auVar83);
          auVar130._0_4_ = auVar270._0_4_ * 0.0 + auVar17._0_4_ + auVar14._0_4_ * 0.0;
          auVar130._4_4_ = auVar270._4_4_ * 0.0 + auVar17._4_4_ + auVar14._4_4_ * 0.0;
          auVar130._8_4_ = auVar270._8_4_ * 0.0 + auVar17._8_4_ + auVar14._8_4_ * 0.0;
          auVar130._12_4_ = auVar270._12_4_ * 0.0 + auVar17._12_4_ + auVar14._12_4_ * 0.0;
          auVar130._16_4_ = auVar270._16_4_ * 0.0 + auVar17._16_4_ + auVar14._16_4_ * 0.0;
          auVar130._20_4_ = auVar270._20_4_ * 0.0 + auVar17._20_4_ + auVar14._20_4_ * 0.0;
          auVar130._24_4_ = auVar270._24_4_ * 0.0 + auVar17._24_4_ + auVar14._24_4_ * 0.0;
          auVar130._28_4_ = auVar14._28_4_ + auVar17._28_4_ + auVar14._28_4_;
          auVar17 = vmaxps_avx(local_700,auVar130);
          auVar17 = vcmpps_avx(auVar17,ZEXT432(0) << 0x20,2);
          auVar23 = auVar162 & auVar17;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) {
LAB_007c82d5:
            auVar164 = ZEXT3264(CONCAT824(uStack_5a8,
                                          CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            auVar307._4_4_ = fVar134;
            auVar307._0_4_ = fVar118;
            auVar307._8_4_ = fVar137;
            auVar307._12_4_ = fVar140;
            auVar307._16_4_ = fVar143;
            auVar307._20_4_ = fVar146;
            auVar307._24_4_ = fVar148;
            auVar307._28_4_ = fVar117;
          }
          else {
            auVar23 = vandps_avx(auVar17,auVar162);
            auVar85._4_4_ = fVar300 * fVar203;
            auVar85._0_4_ = fVar201 * fVar225;
            auVar85._8_4_ = fVar206 * fVar267;
            auVar85._12_4_ = fVar278 * fVar275;
            auVar85._16_4_ = fVar142 * fVar171;
            auVar85._20_4_ = fVar147 * fVar132;
            auVar85._24_4_ = fVar168 * fVar150;
            auVar85._28_4_ = auVar162._28_4_;
            auVar86._4_4_ = fVar252 * fVar254;
            auVar86._0_4_ = fVar237 * fVar170;
            auVar86._8_4_ = fVar274 * fVar279;
            auVar86._12_4_ = fVar277 * fVar287;
            auVar86._16_4_ = fVar139 * fVar288;
            auVar86._20_4_ = fVar144 * fVar289;
            auVar86._24_4_ = fVar167 * fVar290;
            auVar86._28_4_ = auVar17._28_4_;
            auVar17 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = fVar299 * fVar254;
            auVar87._0_4_ = fVar238 * fVar170;
            auVar87._8_4_ = fVar264 * fVar279;
            auVar87._12_4_ = fVar208 * fVar287;
            auVar87._16_4_ = fVar145 * fVar288;
            auVar87._20_4_ = fVar149 * fVar289;
            auVar87._24_4_ = fVar169 * fVar290;
            auVar87._28_4_ = auVar194._28_4_;
            auVar88._4_4_ = fVar300 * fVar250;
            auVar88._0_4_ = fVar201 * fVar199;
            auVar88._8_4_ = fVar206 * fVar273;
            auVar88._12_4_ = fVar278 * fVar265;
            auVar88._16_4_ = fVar142 * fVar136;
            auVar88._20_4_ = fVar147 * fVar141;
            auVar88._24_4_ = fVar168 * fVar166;
            auVar88._28_4_ = auVar22._28_4_;
            auVar14 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = fVar252 * fVar250;
            auVar89._0_4_ = fVar237 * fVar199;
            auVar89._8_4_ = fVar274 * fVar273;
            auVar89._12_4_ = fVar277 * fVar265;
            auVar89._16_4_ = fVar139 * fVar136;
            auVar89._20_4_ = fVar144 * fVar141;
            auVar89._24_4_ = fVar167 * fVar166;
            auVar89._28_4_ = auVar21._28_4_;
            auVar90._4_4_ = fVar299 * fVar203;
            auVar90._0_4_ = fVar238 * fVar225;
            auVar90._8_4_ = fVar264 * fVar267;
            auVar90._12_4_ = fVar208 * fVar275;
            auVar90._16_4_ = fVar145 * fVar171;
            auVar90._20_4_ = fVar149 * fVar132;
            auVar90._24_4_ = fVar169 * fVar150;
            auVar90._28_4_ = auVar297._28_4_;
            auVar193 = vsubps_avx(auVar90,auVar89);
            auVar272 = ZEXT3264(auVar193);
            auVar161._0_4_ = auVar17._0_4_ * 0.0 + auVar193._0_4_ + auVar14._0_4_ * 0.0;
            auVar161._4_4_ = auVar17._4_4_ * 0.0 + auVar193._4_4_ + auVar14._4_4_ * 0.0;
            auVar161._8_4_ = auVar17._8_4_ * 0.0 + auVar193._8_4_ + auVar14._8_4_ * 0.0;
            auVar161._12_4_ = auVar17._12_4_ * 0.0 + auVar193._12_4_ + auVar14._12_4_ * 0.0;
            auVar161._16_4_ = auVar17._16_4_ * 0.0 + auVar193._16_4_ + auVar14._16_4_ * 0.0;
            auVar161._20_4_ = auVar17._20_4_ * 0.0 + auVar193._20_4_ + auVar14._20_4_ * 0.0;
            auVar161._24_4_ = auVar17._24_4_ * 0.0 + auVar193._24_4_ + auVar14._24_4_ * 0.0;
            auVar161._28_4_ = auVar297._28_4_ + auVar193._28_4_ + auVar21._28_4_;
            auVar162 = vrcpps_avx(auVar161);
            fVar225 = auVar162._0_4_;
            fVar199 = auVar162._4_4_;
            auVar91._4_4_ = auVar161._4_4_ * fVar199;
            auVar91._0_4_ = auVar161._0_4_ * fVar225;
            fVar237 = auVar162._8_4_;
            auVar91._8_4_ = auVar161._8_4_ * fVar237;
            fVar201 = auVar162._12_4_;
            auVar91._12_4_ = auVar161._12_4_ * fVar201;
            fVar238 = auVar162._16_4_;
            auVar91._16_4_ = auVar161._16_4_ * fVar238;
            fVar203 = auVar162._20_4_;
            auVar91._20_4_ = auVar161._20_4_ * fVar203;
            fVar250 = auVar162._24_4_;
            auVar91._24_4_ = auVar161._24_4_ * fVar250;
            auVar91._28_4_ = auVar22._28_4_;
            auVar306._8_4_ = 0x3f800000;
            auVar306._0_8_ = 0x3f8000003f800000;
            auVar306._12_4_ = 0x3f800000;
            auVar306._16_4_ = 0x3f800000;
            auVar306._20_4_ = 0x3f800000;
            auVar306._24_4_ = 0x3f800000;
            auVar306._28_4_ = 0x3f800000;
            auVar162 = vsubps_avx(auVar306,auVar91);
            fVar225 = auVar162._0_4_ * fVar225 + fVar225;
            fVar199 = auVar162._4_4_ * fVar199 + fVar199;
            fVar237 = auVar162._8_4_ * fVar237 + fVar237;
            fVar201 = auVar162._12_4_ * fVar201 + fVar201;
            fVar238 = auVar162._16_4_ * fVar238 + fVar238;
            fVar203 = auVar162._20_4_ * fVar203 + fVar203;
            fVar250 = auVar162._24_4_ * fVar250 + fVar250;
            auVar92._4_4_ =
                 (fVar248 * auVar17._4_4_ + auVar14._4_4_ * fVar239 + auVar193._4_4_ * fVar240) *
                 fVar199;
            auVar92._0_4_ =
                 (fVar236 * auVar17._0_4_ + auVar14._0_4_ * fVar186 + auVar193._0_4_ * fVar224) *
                 fVar225;
            auVar92._8_4_ =
                 (fVar263 * auVar17._8_4_ + auVar14._8_4_ * fVar205 + auVar193._8_4_ * fVar249) *
                 fVar237;
            auVar92._12_4_ =
                 (fVar207 * auVar17._12_4_ + auVar14._12_4_ * fVar276 + auVar193._12_4_ * fVar251) *
                 fVar201;
            auVar92._16_4_ =
                 (fVar133 * auVar17._16_4_ + auVar14._16_4_ * fVar291 + auVar193._16_4_ * fVar253) *
                 fVar238;
            auVar92._20_4_ =
                 (fVar138 * auVar17._20_4_ + auVar14._20_4_ * fVar135 + auVar193._20_4_ * fVar255) *
                 fVar203;
            auVar92._24_4_ =
                 (fVar165 * auVar17._24_4_ + auVar14._24_4_ * fVar266 + auVar193._24_4_ * fVar262) *
                 fVar250;
            auVar92._28_4_ = auVar283._28_4_ + auVar18._28_4_ + auVar16._28_4_;
            auVar198 = ZEXT3264(auVar92);
            uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar220._4_4_ = uVar116;
            auVar220._0_4_ = uVar116;
            auVar220._8_4_ = uVar116;
            auVar220._12_4_ = uVar116;
            auVar220._16_4_ = uVar116;
            auVar220._20_4_ = uVar116;
            auVar220._24_4_ = uVar116;
            auVar220._28_4_ = uVar116;
            auVar162 = vcmpps_avx(local_100,auVar92,2);
            auVar283 = vcmpps_avx(auVar92,auVar220,2);
            auVar162 = vandps_avx(auVar162,auVar283);
            auVar18 = auVar23 & auVar162;
            if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar18 >> 0x7f,0) == '\0') &&
                  (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar18 >> 0xbf,0) == '\0') &&
                (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar18[0x1f]) goto LAB_007c82d5;
            auVar162 = vandps_avx(auVar23,auVar162);
            auVar18 = vcmpps_avx(ZEXT432(0) << 0x20,auVar161,4);
            auVar16 = auVar162 & auVar18;
            auVar164 = ZEXT3264(CONCAT824(uStack_5a8,
                                          CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            auVar307._4_4_ = fVar134;
            auVar307._0_4_ = fVar118;
            auVar307._8_4_ = fVar137;
            auVar307._12_4_ = fVar140;
            auVar307._16_4_ = fVar143;
            auVar307._20_4_ = fVar146;
            auVar307._24_4_ = fVar148;
            auVar307._28_4_ = fVar117;
            if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0x7f,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0xbf,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar16[0x1f] < '\0') {
              auVar162 = vandps_avx(auVar18,auVar162);
              auVar164 = ZEXT3264(auVar162);
              auVar93._4_4_ = fVar199 * local_700._4_4_;
              auVar93._0_4_ = fVar225 * (float)local_700._0_4_;
              auVar93._8_4_ = fVar237 * local_700._8_4_;
              auVar93._12_4_ = fVar201 * local_700._12_4_;
              auVar93._16_4_ = fVar238 * local_700._16_4_;
              auVar93._20_4_ = fVar203 * local_700._20_4_;
              auVar93._24_4_ = fVar250 * local_700._24_4_;
              auVar93._28_4_ = auVar283._28_4_;
              auVar94._4_4_ = auVar130._4_4_ * fVar199;
              auVar94._0_4_ = auVar130._0_4_ * fVar225;
              auVar94._8_4_ = auVar130._8_4_ * fVar237;
              auVar94._12_4_ = auVar130._12_4_ * fVar201;
              auVar94._16_4_ = auVar130._16_4_ * fVar238;
              auVar94._20_4_ = auVar130._20_4_ * fVar203;
              auVar94._24_4_ = auVar130._24_4_ * fVar250;
              auVar94._28_4_ = auVar130._28_4_;
              auVar247._8_4_ = 0x3f800000;
              auVar247._0_8_ = 0x3f8000003f800000;
              auVar247._12_4_ = 0x3f800000;
              auVar247._16_4_ = 0x3f800000;
              auVar247._20_4_ = 0x3f800000;
              auVar247._24_4_ = 0x3f800000;
              auVar247._28_4_ = 0x3f800000;
              auVar162 = vsubps_avx(auVar247,auVar93);
              local_2e0 = vblendvps_avx(auVar162,auVar93,auVar230);
              auVar162 = vsubps_avx(auVar247,auVar94);
              _local_500 = vblendvps_avx(auVar162,auVar94,auVar230);
              local_300 = auVar92;
            }
          }
          auVar329 = ZEXT3264(auVar215);
          auVar162 = auVar164._0_32_;
          auVar315 = ZEXT3264(_local_7a0);
          if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar162 >> 0x7f,0) == '\0') &&
                (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar162 >> 0xbf,0) == '\0') &&
              (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar164[0x1f]) {
            auVar261 = ZEXT3264(_local_6e0);
          }
          else {
            auVar283 = vsubps_avx(auVar183,auVar307);
            auVar198 = ZEXT3264(local_2e0);
            fVar186 = auVar307._0_4_ + auVar283._0_4_ * local_2e0._0_4_;
            fVar236 = auVar307._4_4_ + auVar283._4_4_ * local_2e0._4_4_;
            fVar199 = auVar307._8_4_ + auVar283._8_4_ * local_2e0._8_4_;
            fVar237 = auVar307._12_4_ + auVar283._12_4_ * local_2e0._12_4_;
            fVar201 = auVar307._16_4_ + auVar283._16_4_ * local_2e0._16_4_;
            fVar238 = auVar307._20_4_ + auVar283._20_4_ * local_2e0._20_4_;
            fVar203 = auVar307._24_4_ + auVar283._24_4_ * local_2e0._24_4_;
            fVar239 = auVar307._28_4_ + auVar283._28_4_;
            fVar225 = *(float *)((long)local_738->ray_space + k * 4 + -0x20);
            auVar95._4_4_ = (fVar236 + fVar236) * fVar225;
            auVar95._0_4_ = (fVar186 + fVar186) * fVar225;
            auVar95._8_4_ = (fVar199 + fVar199) * fVar225;
            auVar95._12_4_ = (fVar237 + fVar237) * fVar225;
            auVar95._16_4_ = (fVar201 + fVar201) * fVar225;
            auVar95._20_4_ = (fVar238 + fVar238) * fVar225;
            auVar95._24_4_ = (fVar203 + fVar203) * fVar225;
            auVar95._28_4_ = fVar239 + fVar239;
            auVar283 = vcmpps_avx(local_300,auVar95,6);
            auVar18 = auVar162 & auVar283;
            auVar261 = ZEXT3264(_local_6e0);
            if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0x7f,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0xbf,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar18[0x1f] < '\0') {
              local_380 = vandps_avx(auVar283,auVar162);
              auVar154._0_8_ =
                   CONCAT44((float)local_500._4_4_ + (float)local_500._4_4_ + -1.0,
                            (float)local_500._0_4_ + (float)local_500._0_4_ + -1.0);
              auVar154._8_4_ = (float)uStack_4f8 + (float)uStack_4f8 + -1.0;
              auVar154._12_4_ = uStack_4f8._4_4_ + uStack_4f8._4_4_ + -1.0;
              auVar155._16_4_ = (float)uStack_4f0 + (float)uStack_4f0 + -1.0;
              auVar155._0_16_ = auVar154;
              auVar155._20_4_ = uStack_4f0._4_4_ + uStack_4f0._4_4_ + -1.0;
              fStack_408 = (float)uStack_4e8 + (float)uStack_4e8 + -1.0;
              _local_420 = auVar155;
              fStack_404 = uStack_4e8._4_4_ + uStack_4e8._4_4_ + -1.0;
              auVar164 = ZEXT3264(_local_420);
              local_440 = local_2e0;
              local_400 = local_300;
              local_3d0 = local_930;
              fStack_3cc = fStack_92c;
              fStack_3c8 = fStack_928;
              fStack_3c4 = fStack_924;
              local_3c0 = local_760;
              uStack_3b8 = uStack_758;
              local_3b0 = local_690;
              uStack_3a8 = uStack_688;
              local_3a0 = local_6a0;
              uStack_398 = uStack_698;
              pGVar12 = (context->scene->geometries).items[uVar110].ptr;
              _local_500 = _local_420;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar107 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar107 = context->args;
                if ((pRVar107->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar107 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar107 >> 8),1),
                   pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar177._0_4_ = (float)(int)local_3e0;
                  auVar177._4_12_ = auVar272._4_12_;
                  auVar229 = vshufps_avx(auVar177,auVar177,0);
                  local_360[0] = (auVar229._0_4_ + local_2e0._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_360[1] = (auVar229._4_4_ + local_2e0._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_360[2] = (auVar229._8_4_ + local_2e0._8_4_ + 2.0) * fStack_138;
                  local_360[3] = (auVar229._12_4_ + local_2e0._12_4_ + 3.0) * fStack_134;
                  fStack_350 = (auVar229._0_4_ + local_2e0._16_4_ + 4.0) * fStack_130;
                  fStack_34c = (auVar229._4_4_ + local_2e0._20_4_ + 5.0) * fStack_12c;
                  fStack_348 = (auVar229._8_4_ + local_2e0._24_4_ + 6.0) * fStack_128;
                  fStack_344 = auVar229._12_4_ + (float)local_2e0._28_4_ + 7.0;
                  uStack_4f8 = auVar154._8_8_;
                  uStack_4f0 = auVar155._16_8_;
                  uStack_4e8 = local_420._24_8_;
                  local_340 = auVar154._0_8_;
                  uStack_338 = uStack_4f8;
                  uStack_330 = uStack_4f0;
                  uStack_328 = uStack_4e8;
                  auVar164 = ZEXT3264(local_300);
                  local_320 = local_300;
                  uVar116 = vmovmskps_avx(local_380);
                  uVar108 = CONCAT44((int)((ulong)pRVar107 >> 0x20),uVar116);
                  uVar111 = 0;
                  if (uVar108 != 0) {
                    for (; (uVar108 >> uVar111 & 1) == 0; uVar111 = uVar111 + 1) {
                    }
                  }
                  auVar162 = vcmpps_avx(_local_6e0,_local_6e0,0xf);
                  local_3dc = uVar11;
                  while (uVar108 != 0) {
                    local_700._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_200 = local_360[uVar111];
                    local_1e0 = *(undefined4 *)((long)&local_340 + uVar111 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar111 * 4);
                    fVar186 = 1.0 - local_200;
                    fVar225 = local_200 * fVar186 * 4.0;
                    auVar229 = ZEXT416((uint)(local_200 * local_200 * 0.5));
                    auVar229 = vshufps_avx(auVar229,auVar229,0);
                    auVar178 = ZEXT416((uint)((fVar186 * fVar186 + fVar225) * 0.5));
                    auVar178 = vshufps_avx(auVar178,auVar178,0);
                    auVar191 = ZEXT416((uint)((-local_200 * local_200 - fVar225) * 0.5));
                    auVar191 = vshufps_avx(auVar191,auVar191,0);
                    local_730.context = context->user;
                    auVar192 = ZEXT416((uint)(fVar186 * -fVar186 * 0.5));
                    auVar192 = vshufps_avx(auVar192,auVar192,0);
                    auVar179._0_4_ =
                         local_930 * auVar192._0_4_ +
                         auVar191._0_4_ * (float)local_760._0_4_ +
                         auVar229._0_4_ * (float)local_6a0._0_4_ +
                         auVar178._0_4_ * (float)local_690._0_4_;
                    auVar179._4_4_ =
                         fStack_92c * auVar192._4_4_ +
                         auVar191._4_4_ * (float)local_760._4_4_ +
                         auVar229._4_4_ * (float)local_6a0._4_4_ +
                         auVar178._4_4_ * (float)local_690._4_4_;
                    auVar179._8_4_ =
                         fStack_928 * auVar192._8_4_ +
                         auVar191._8_4_ * (float)uStack_758 +
                         auVar229._8_4_ * (float)uStack_698 + auVar178._8_4_ * (float)uStack_688;
                    auVar179._12_4_ =
                         fStack_924 * auVar192._12_4_ +
                         auVar191._12_4_ * uStack_758._4_4_ +
                         auVar229._12_4_ * uStack_698._4_4_ + auVar178._12_4_ * uStack_688._4_4_;
                    local_250 = vshufps_avx(auVar179,auVar179,0);
                    local_260[0] = (RTCHitN)local_250[0];
                    local_260[1] = (RTCHitN)local_250[1];
                    local_260[2] = (RTCHitN)local_250[2];
                    local_260[3] = (RTCHitN)local_250[3];
                    local_260[4] = (RTCHitN)local_250[4];
                    local_260[5] = (RTCHitN)local_250[5];
                    local_260[6] = (RTCHitN)local_250[6];
                    local_260[7] = (RTCHitN)local_250[7];
                    local_260[8] = (RTCHitN)local_250[8];
                    local_260[9] = (RTCHitN)local_250[9];
                    local_260[10] = (RTCHitN)local_250[10];
                    local_260[0xb] = (RTCHitN)local_250[0xb];
                    local_260[0xc] = (RTCHitN)local_250[0xc];
                    local_260[0xd] = (RTCHitN)local_250[0xd];
                    local_260[0xe] = (RTCHitN)local_250[0xe];
                    local_260[0xf] = (RTCHitN)local_250[0xf];
                    local_230 = vshufps_avx(auVar179,auVar179,0x55);
                    local_240 = local_230;
                    local_210 = vshufps_avx(auVar179,auVar179,0xaa);
                    local_220 = local_210;
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_120._0_8_;
                    uStack_1b8 = local_120._8_8_;
                    uStack_1b0 = local_120._16_8_;
                    uStack_1a8 = local_120._24_8_;
                    local_1a0 = local_560._0_8_;
                    uStack_198 = local_560._8_8_;
                    uStack_190 = local_560._16_8_;
                    uStack_188 = local_560._24_8_;
                    local_740[1] = auVar162;
                    *local_740 = auVar162;
                    local_180 = (local_730.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_730.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_7e0 = *local_748;
                    local_7d0 = *local_750;
                    local_730.valid = (int *)local_7e0;
                    local_730.geometryUserPtr = pGVar12->userPtr;
                    local_730.hit = local_260;
                    local_730.N = 8;
                    local_730.ray = (RTCRayN *)ray;
                    if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar162 = ZEXT1632(auVar162._0_16_);
                      auVar272 = ZEXT1664(auVar272._0_16_);
                      (*pGVar12->occlusionFilterN)(&local_730);
                    }
                    auVar164 = ZEXT1664(local_7d0);
                    auVar229 = vpcmpeqd_avx(local_7e0,ZEXT816(0) << 0x40);
                    auVar178 = vpcmpeqd_avx(local_7d0,ZEXT816(0) << 0x40);
                    auVar198 = ZEXT1664(auVar178);
                    auVar184._16_16_ = auVar178;
                    auVar184._0_16_ = auVar229;
                    auVar162 = vcmpps_avx(auVar162,auVar162,0xf);
                    auVar283 = auVar162 & ~auVar184;
                    if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar283 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar283 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar283 >> 0x7f,0) == '\0') &&
                          (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar283 >> 0xbf,0) == '\0') &&
                        (auVar283 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar283[0x1f]) {
                      auVar131._0_4_ = auVar229._0_4_ ^ auVar162._0_4_;
                      auVar131._4_4_ = auVar229._4_4_ ^ auVar162._4_4_;
                      auVar131._8_4_ = auVar229._8_4_ ^ auVar162._8_4_;
                      auVar131._12_4_ = auVar229._12_4_ ^ auVar162._12_4_;
                      auVar131._16_4_ = auVar178._0_4_ ^ auVar162._16_4_;
                      auVar131._20_4_ = auVar178._4_4_ ^ auVar162._20_4_;
                      auVar131._24_4_ = auVar178._8_4_ ^ auVar162._24_4_;
                      auVar131._28_4_ = auVar178._12_4_ ^ auVar162._28_4_;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar198 = ZEXT1664(auVar178);
                        auVar162 = ZEXT1632(auVar162._0_16_);
                        auVar272 = ZEXT1664(auVar272._0_16_);
                        (*p_Var13)(&local_730);
                      }
                      auVar229 = vpcmpeqd_avx(local_7e0,ZEXT816(0) << 0x40);
                      auVar178 = vpcmpeqd_avx(local_7d0,ZEXT816(0) << 0x40);
                      auVar163._16_16_ = auVar178;
                      auVar163._0_16_ = auVar229;
                      auVar162 = vcmpps_avx(auVar162,auVar162,0xf);
                      auVar131._0_4_ = auVar229._0_4_ ^ auVar162._0_4_;
                      auVar131._4_4_ = auVar229._4_4_ ^ auVar162._4_4_;
                      auVar131._8_4_ = auVar229._8_4_ ^ auVar162._8_4_;
                      auVar131._12_4_ = auVar229._12_4_ ^ auVar162._12_4_;
                      auVar131._16_4_ = auVar178._0_4_ ^ auVar162._16_4_;
                      auVar131._20_4_ = auVar178._4_4_ ^ auVar162._20_4_;
                      auVar131._24_4_ = auVar178._8_4_ ^ auVar162._24_4_;
                      auVar131._28_4_ = auVar178._12_4_ ^ auVar162._28_4_;
                      auVar185._8_4_ = 0xff800000;
                      auVar185._0_8_ = 0xff800000ff800000;
                      auVar185._12_4_ = 0xff800000;
                      auVar185._16_4_ = 0xff800000;
                      auVar185._20_4_ = 0xff800000;
                      auVar185._24_4_ = 0xff800000;
                      auVar185._28_4_ = 0xff800000;
                      auVar283 = vblendvps_avx(auVar185,*(undefined1 (*) [32])
                                                         (local_730.ray + 0x100),auVar163);
                      auVar164 = ZEXT3264(auVar283);
                      *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar283;
                    }
                    if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar131 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar131 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar131 >> 0x7f,0) != '\0') ||
                          (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar131 >> 0xbf,0) != '\0') ||
                        (auVar131 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar131[0x1f] < '\0') {
                      pRVar107 = (RTCIntersectArguments *)0x1;
                      goto LAB_007c82fc;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_700._0_4_;
                    uVar108 = uVar108 ^ 1L << (uVar111 & 0x3f);
                    uVar111 = 0;
                    if (uVar108 != 0) {
                      for (; (uVar108 >> uVar111 & 1) == 0; uVar111 = uVar111 + 1) {
                      }
                    }
                  }
                  pRVar107 = (RTCIntersectArguments *)0x0;
LAB_007c82fc:
                  auVar261 = ZEXT3264(_local_6e0);
                  auVar315 = ZEXT3264(_local_7a0);
                }
              }
              pRVar106 = (RTCIntersectArguments *)(ulong)(byte)((byte)pRVar106 | (byte)pRVar107);
            }
            auVar329 = ZEXT3264(auVar215);
          }
        }
        auVar286 = ZEXT3264(auVar218);
        auVar308 = ZEXT3264(local_6c0);
      }
    }
    if (((ulong)pRVar106 & 1) != 0) break;
    uVar116 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar122._4_4_ = uVar116;
    auVar122._0_4_ = uVar116;
    auVar122._8_4_ = uVar116;
    auVar122._12_4_ = uVar116;
    auVar229 = vcmpps_avx(local_450,auVar122,2);
    uVar110 = vmovmskps_avx(auVar229);
    uVar113 = (ulong)((uint)uVar112 & uVar110);
  }
  return uVar113 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }